

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  undefined8 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  Primitive PVar14;
  uint uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  uint uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  uint uVar121;
  uint uVar122;
  uint uVar123;
  ulong uVar124;
  uint uVar125;
  ulong uVar126;
  long lVar127;
  long lVar128;
  Geometry *pGVar129;
  float fVar130;
  float fVar131;
  float fVar150;
  float fVar151;
  vint4 bi_1;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar155;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar156;
  float fVar157;
  float fVar170;
  float fVar171;
  vint4 bi;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar178;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar174;
  float fVar176;
  undefined1 auVar165 [32];
  float fVar177;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  vint4 bi_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar190 [32];
  float fVar194;
  float fVar206;
  float fVar209;
  vint4 ai_1;
  undefined1 auVar196 [16];
  float fVar212;
  undefined1 auVar197 [16];
  float fVar195;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar207;
  float fVar208;
  float fVar210;
  float fVar211;
  float fVar213;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar217;
  float fVar227;
  float fVar228;
  vint4 ai_2;
  undefined1 auVar218 [16];
  float fVar229;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar230;
  float fVar231;
  undefined1 auVar226 [32];
  float fVar232;
  float fVar238;
  float fVar240;
  undefined1 auVar234 [16];
  float fVar242;
  undefined1 auVar235 [16];
  float fVar233;
  undefined1 auVar236 [16];
  float fVar239;
  float fVar241;
  undefined1 auVar237 [32];
  float fVar243;
  float fVar251;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar252;
  float fVar256;
  float fVar257;
  undefined1 auVar250 [32];
  float fVar258;
  float fVar268;
  vint4 ai;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  float fVar269;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar270;
  float fVar271;
  float fVar279;
  float fVar281;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar280;
  float fVar283;
  undefined1 auVar276 [32];
  float fVar282;
  float fVar284;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar292;
  undefined1 auVar285 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar286 [32];
  float fVar296;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  float fVar303;
  undefined1 auVar302 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar317;
  undefined1 auVar310 [16];
  float fVar319;
  float fVar320;
  undefined1 auVar311 [32];
  float fVar318;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  float fVar321;
  float fVar322;
  float fVar326;
  float fVar328;
  undefined1 auVar323 [16];
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar332;
  float fVar333;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar335 [32];
  float fVar340;
  float fVar341;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7d4;
  ulong local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  Primitive *local_780;
  Precalculations *local_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined8 local_670;
  undefined4 local_668;
  float local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  uint local_654;
  uint local_650;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [2] [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [16];
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar275 [16];
  undefined1 auVar334 [16];
  undefined1 auVar342 [16];
  
  local_778 = pre;
  PVar14 = prim[1];
  uVar124 = (ulong)(byte)PVar14;
  lVar21 = uVar124 * 0x25;
  fVar258 = *(float *)(prim + lVar21 + 0x12);
  auVar236 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar158._0_4_ = fVar258 * auVar236._0_4_;
  auVar158._4_4_ = fVar258 * auVar236._4_4_;
  auVar158._8_4_ = fVar258 * auVar236._8_4_;
  auVar158._12_4_ = fVar258 * auVar236._12_4_;
  auVar259._0_4_ = fVar258 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar259._4_4_ = fVar258 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar259._8_4_ = fVar258 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar259._12_4_ = fVar258 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar236 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 6)));
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 5 + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 6)));
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar124 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vshufps_avx(auVar259,auVar259,0);
  auVar28 = vshufps_avx(auVar259,auVar259,0x55);
  auVar29 = vshufps_avx(auVar259,auVar259,0xaa);
  fVar258 = auVar29._0_4_;
  fVar243 = auVar29._4_4_;
  fVar251 = auVar29._8_4_;
  fVar317 = auVar29._12_4_;
  fVar217 = auVar28._0_4_;
  fVar227 = auVar28._4_4_;
  fVar228 = auVar28._8_4_;
  fVar229 = auVar28._12_4_;
  fVar194 = auVar27._0_4_;
  fVar206 = auVar27._4_4_;
  fVar209 = auVar27._8_4_;
  fVar212 = auVar27._12_4_;
  auVar310._0_4_ = fVar194 * auVar236._0_4_ + fVar217 * auVar186._0_4_ + fVar258 * auVar222._0_4_;
  auVar310._4_4_ = fVar206 * auVar236._4_4_ + fVar227 * auVar186._4_4_ + fVar243 * auVar222._4_4_;
  auVar310._8_4_ = fVar209 * auVar236._8_4_ + fVar228 * auVar186._8_4_ + fVar251 * auVar222._8_4_;
  auVar310._12_4_ =
       fVar212 * auVar236._12_4_ + fVar229 * auVar186._12_4_ + fVar317 * auVar222._12_4_;
  auVar323._0_4_ = fVar194 * auVar198._0_4_ + fVar217 * auVar22._0_4_ + auVar23._0_4_ * fVar258;
  auVar323._4_4_ = fVar206 * auVar198._4_4_ + fVar227 * auVar22._4_4_ + auVar23._4_4_ * fVar243;
  auVar323._8_4_ = fVar209 * auVar198._8_4_ + fVar228 * auVar22._8_4_ + auVar23._8_4_ * fVar251;
  auVar323._12_4_ = fVar212 * auVar198._12_4_ + fVar229 * auVar22._12_4_ + auVar23._12_4_ * fVar317;
  auVar260._0_4_ = fVar194 * auVar24._0_4_ + fVar217 * auVar25._0_4_ + auVar26._0_4_ * fVar258;
  auVar260._4_4_ = fVar206 * auVar24._4_4_ + fVar227 * auVar25._4_4_ + auVar26._4_4_ * fVar243;
  auVar260._8_4_ = fVar209 * auVar24._8_4_ + fVar228 * auVar25._8_4_ + auVar26._8_4_ * fVar251;
  auVar260._12_4_ = fVar212 * auVar24._12_4_ + fVar229 * auVar25._12_4_ + auVar26._12_4_ * fVar317;
  auVar27 = vshufps_avx(auVar158,auVar158,0);
  auVar28 = vshufps_avx(auVar158,auVar158,0x55);
  auVar29 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar258 = auVar29._0_4_;
  fVar243 = auVar29._4_4_;
  fVar251 = auVar29._8_4_;
  fVar317 = auVar29._12_4_;
  fVar217 = auVar28._0_4_;
  fVar227 = auVar28._4_4_;
  fVar228 = auVar28._8_4_;
  fVar229 = auVar28._12_4_;
  fVar194 = auVar27._0_4_;
  fVar206 = auVar27._4_4_;
  fVar209 = auVar27._8_4_;
  fVar212 = auVar27._12_4_;
  auVar159._0_4_ = fVar194 * auVar236._0_4_ + fVar217 * auVar186._0_4_ + fVar258 * auVar222._0_4_;
  auVar159._4_4_ = fVar206 * auVar236._4_4_ + fVar227 * auVar186._4_4_ + fVar243 * auVar222._4_4_;
  auVar159._8_4_ = fVar209 * auVar236._8_4_ + fVar228 * auVar186._8_4_ + fVar251 * auVar222._8_4_;
  auVar159._12_4_ =
       fVar212 * auVar236._12_4_ + fVar229 * auVar186._12_4_ + fVar317 * auVar222._12_4_;
  auVar132._0_4_ = fVar194 * auVar198._0_4_ + auVar23._0_4_ * fVar258 + fVar217 * auVar22._0_4_;
  auVar132._4_4_ = fVar206 * auVar198._4_4_ + auVar23._4_4_ * fVar243 + fVar227 * auVar22._4_4_;
  auVar132._8_4_ = fVar209 * auVar198._8_4_ + auVar23._8_4_ * fVar251 + fVar228 * auVar22._8_4_;
  auVar132._12_4_ = fVar212 * auVar198._12_4_ + auVar23._12_4_ * fVar317 + fVar229 * auVar22._12_4_;
  auVar272._8_4_ = 0x7fffffff;
  auVar272._0_8_ = 0x7fffffff7fffffff;
  auVar272._12_4_ = 0x7fffffff;
  auVar236 = vandps_avx(auVar310,auVar272);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar236 = vcmpps_avx(auVar236,auVar218,1);
  auVar186 = vblendvps_avx(auVar310,auVar218,auVar236);
  auVar236 = vandps_avx(auVar323,auVar272);
  auVar236 = vcmpps_avx(auVar236,auVar218,1);
  auVar222 = vblendvps_avx(auVar323,auVar218,auVar236);
  auVar236 = vandps_avx(auVar272,auVar260);
  auVar236 = vcmpps_avx(auVar236,auVar218,1);
  auVar236 = vblendvps_avx(auVar260,auVar218,auVar236);
  auVar179._0_4_ = fVar194 * auVar24._0_4_ + fVar217 * auVar25._0_4_ + auVar26._0_4_ * fVar258;
  auVar179._4_4_ = fVar206 * auVar24._4_4_ + fVar227 * auVar25._4_4_ + auVar26._4_4_ * fVar243;
  auVar179._8_4_ = fVar209 * auVar24._8_4_ + fVar228 * auVar25._8_4_ + auVar26._8_4_ * fVar251;
  auVar179._12_4_ = fVar212 * auVar24._12_4_ + fVar229 * auVar25._12_4_ + auVar26._12_4_ * fVar317;
  auVar198 = vrcpps_avx(auVar186);
  fVar194 = auVar198._0_4_;
  auVar196._0_4_ = fVar194 * auVar186._0_4_;
  fVar206 = auVar198._4_4_;
  auVar196._4_4_ = fVar206 * auVar186._4_4_;
  fVar209 = auVar198._8_4_;
  auVar196._8_4_ = fVar209 * auVar186._8_4_;
  fVar212 = auVar198._12_4_;
  auVar196._12_4_ = fVar212 * auVar186._12_4_;
  auVar244._8_4_ = 0x3f800000;
  auVar244._0_8_ = 0x3f8000003f800000;
  auVar244._12_4_ = 0x3f800000;
  auVar186 = vsubps_avx(auVar244,auVar196);
  fVar194 = fVar194 + fVar194 * auVar186._0_4_;
  fVar206 = fVar206 + fVar206 * auVar186._4_4_;
  fVar209 = fVar209 + fVar209 * auVar186._8_4_;
  fVar212 = fVar212 + fVar212 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar222);
  fVar217 = auVar186._0_4_;
  auVar234._0_4_ = fVar217 * auVar222._0_4_;
  fVar227 = auVar186._4_4_;
  auVar234._4_4_ = fVar227 * auVar222._4_4_;
  fVar228 = auVar186._8_4_;
  auVar234._8_4_ = fVar228 * auVar222._8_4_;
  fVar229 = auVar186._12_4_;
  auVar234._12_4_ = fVar229 * auVar222._12_4_;
  auVar186 = vsubps_avx(auVar244,auVar234);
  fVar217 = fVar217 + fVar217 * auVar186._0_4_;
  fVar227 = fVar227 + fVar227 * auVar186._4_4_;
  fVar228 = fVar228 + fVar228 * auVar186._8_4_;
  fVar229 = fVar229 + fVar229 * auVar186._12_4_;
  auVar186 = vrcpps_avx(auVar236);
  fVar232 = auVar186._0_4_;
  auVar261._0_4_ = fVar232 * auVar236._0_4_;
  fVar238 = auVar186._4_4_;
  auVar261._4_4_ = fVar238 * auVar236._4_4_;
  fVar240 = auVar186._8_4_;
  auVar261._8_4_ = fVar240 * auVar236._8_4_;
  fVar242 = auVar186._12_4_;
  auVar261._12_4_ = fVar242 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar244,auVar261);
  fVar232 = fVar232 + fVar232 * auVar236._0_4_;
  fVar238 = fVar238 + fVar238 * auVar236._4_4_;
  fVar240 = fVar240 + fVar240 * auVar236._8_4_;
  fVar242 = fVar242 + fVar242 * auVar236._12_4_;
  auVar236 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar21 + 0x16)) * *(float *)(prim + lVar21 + 0x1a)));
  auVar222 = vshufps_avx(auVar236,auVar236,0);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar124 * 7 + 6);
  auVar236 = vpmovsxwd_avx(auVar236);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 6);
  auVar186 = vpmovsxwd_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar198 = vsubps_avx(auVar186,auVar236);
  fVar258 = auVar222._0_4_;
  fVar243 = auVar222._4_4_;
  fVar251 = auVar222._8_4_;
  fVar317 = auVar222._12_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar124 * 9 + 6);
  auVar186 = vpmovsxwd_avx(auVar222);
  auVar262._0_4_ = auVar198._0_4_ * fVar258 + auVar236._0_4_;
  auVar262._4_4_ = auVar198._4_4_ * fVar243 + auVar236._4_4_;
  auVar262._8_4_ = auVar198._8_4_ * fVar251 + auVar236._8_4_;
  auVar262._12_4_ = auVar198._12_4_ * fVar317 + auVar236._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 6);
  auVar222 = vpmovsxwd_avx(auVar198);
  auVar236 = vcvtdq2ps_avx(auVar186);
  auVar186 = vcvtdq2ps_avx(auVar222);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar273._0_4_ = auVar186._0_4_ * fVar258 + auVar236._0_4_;
  auVar273._4_4_ = auVar186._4_4_ * fVar243 + auVar236._4_4_;
  auVar273._8_4_ = auVar186._8_4_ * fVar251 + auVar236._8_4_;
  auVar273._12_4_ = auVar186._12_4_ * fVar317 + auVar236._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 6);
  auVar236 = vpmovsxwd_avx(auVar22);
  uVar126 = (ulong)(uint)((int)(uVar124 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar124 * 2 + uVar126 + 6);
  auVar186 = vpmovsxwd_avx(auVar23);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar285._0_4_ = auVar186._0_4_ * fVar258 + auVar236._0_4_;
  auVar285._4_4_ = auVar186._4_4_ * fVar243 + auVar236._4_4_;
  auVar285._8_4_ = auVar186._8_4_ * fVar251 + auVar236._8_4_;
  auVar285._12_4_ = auVar186._12_4_ * fVar317 + auVar236._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar126 + 6);
  auVar236 = vpmovsxwd_avx(auVar24);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 6);
  auVar186 = vpmovsxwd_avx(auVar25);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar222 = vsubps_avx(auVar186,auVar236);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 6);
  auVar186 = vpmovsxwd_avx(auVar26);
  auVar297._0_4_ = auVar222._0_4_ * fVar258 + auVar236._0_4_;
  auVar297._4_4_ = auVar222._4_4_ * fVar243 + auVar236._4_4_;
  auVar297._8_4_ = auVar222._8_4_ * fVar251 + auVar236._8_4_;
  auVar297._12_4_ = auVar222._12_4_ * fVar317 + auVar236._12_4_;
  auVar236 = vcvtdq2ps_avx(auVar186);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar124 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar186 = vpmovsxwd_avx(auVar27);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar302._0_4_ = auVar186._0_4_ * fVar258 + auVar236._0_4_;
  auVar302._4_4_ = auVar186._4_4_ * fVar243 + auVar236._4_4_;
  auVar302._8_4_ = auVar186._8_4_ * fVar251 + auVar236._8_4_;
  auVar302._12_4_ = auVar186._12_4_ * fVar317 + auVar236._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar124) + 6);
  auVar236 = vpmovsxwd_avx(auVar28);
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 6);
  auVar186 = vpmovsxwd_avx(auVar29);
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar186 = vsubps_avx(auVar186,auVar236);
  auVar245._0_4_ = auVar236._0_4_ + auVar186._0_4_ * fVar258;
  auVar245._4_4_ = auVar236._4_4_ + auVar186._4_4_ * fVar243;
  auVar245._8_4_ = auVar236._8_4_ + auVar186._8_4_ * fVar251;
  auVar245._12_4_ = auVar236._12_4_ + auVar186._12_4_ * fVar317;
  auVar236 = vsubps_avx(auVar262,auVar159);
  auVar263._0_4_ = fVar194 * auVar236._0_4_;
  auVar263._4_4_ = fVar206 * auVar236._4_4_;
  auVar263._8_4_ = fVar209 * auVar236._8_4_;
  auVar263._12_4_ = fVar212 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar273,auVar159);
  auVar160._0_4_ = fVar194 * auVar236._0_4_;
  auVar160._4_4_ = fVar206 * auVar236._4_4_;
  auVar160._8_4_ = fVar209 * auVar236._8_4_;
  auVar160._12_4_ = fVar212 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar285,auVar132);
  auVar197._0_4_ = fVar217 * auVar236._0_4_;
  auVar197._4_4_ = fVar227 * auVar236._4_4_;
  auVar197._8_4_ = fVar228 * auVar236._8_4_;
  auVar197._12_4_ = fVar229 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar297,auVar132);
  auVar133._0_4_ = fVar217 * auVar236._0_4_;
  auVar133._4_4_ = fVar227 * auVar236._4_4_;
  auVar133._8_4_ = fVar228 * auVar236._8_4_;
  auVar133._12_4_ = fVar229 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar302,auVar179);
  auVar219._0_4_ = fVar232 * auVar236._0_4_;
  auVar219._4_4_ = fVar238 * auVar236._4_4_;
  auVar219._8_4_ = fVar240 * auVar236._8_4_;
  auVar219._12_4_ = fVar242 * auVar236._12_4_;
  auVar236 = vsubps_avx(auVar245,auVar179);
  auVar180._0_4_ = fVar232 * auVar236._0_4_;
  auVar180._4_4_ = fVar238 * auVar236._4_4_;
  auVar180._8_4_ = fVar240 * auVar236._8_4_;
  auVar180._12_4_ = fVar242 * auVar236._12_4_;
  auVar236 = vpminsd_avx(auVar263,auVar160);
  auVar186 = vpminsd_avx(auVar197,auVar133);
  auVar236 = vmaxps_avx(auVar236,auVar186);
  auVar186 = vpminsd_avx(auVar219,auVar180);
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar274._4_4_ = uVar11;
  auVar274._0_4_ = uVar11;
  auVar274._8_4_ = uVar11;
  auVar274._12_4_ = uVar11;
  auVar186 = vmaxps_avx(auVar186,auVar274);
  auVar236 = vmaxps_avx(auVar236,auVar186);
  local_290._0_4_ = auVar236._0_4_ * 0.99999964;
  local_290._4_4_ = auVar236._4_4_ * 0.99999964;
  local_290._8_4_ = auVar236._8_4_ * 0.99999964;
  local_290._12_4_ = auVar236._12_4_ * 0.99999964;
  auVar236 = vpmaxsd_avx(auVar263,auVar160);
  auVar186 = vpmaxsd_avx(auVar197,auVar133);
  auVar236 = vminps_avx(auVar236,auVar186);
  auVar186 = vpmaxsd_avx(auVar219,auVar180);
  fVar258 = (ray->super_RayK<1>).tfar;
  auVar181._4_4_ = fVar258;
  auVar181._0_4_ = fVar258;
  auVar181._8_4_ = fVar258;
  auVar181._12_4_ = fVar258;
  auVar186 = vminps_avx(auVar186,auVar181);
  auVar236 = vminps_avx(auVar236,auVar186);
  auVar134._0_4_ = auVar236._0_4_ * 1.0000004;
  auVar134._4_4_ = auVar236._4_4_ * 1.0000004;
  auVar134._8_4_ = auVar236._8_4_ * 1.0000004;
  auVar134._12_4_ = auVar236._12_4_ * 1.0000004;
  auVar236 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar186 = vpcmpgtd_avx(auVar236,_DAT_01f7fcf0);
  auVar236 = vcmpps_avx(local_290,auVar134,2);
  auVar236 = vandps_avx(auVar236,auVar186);
  uVar121 = vmovmskps_avx(auVar236);
  if (uVar121 != 0) {
    uVar121 = uVar121 & 0xff;
    local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_780 = prim;
    do {
      lVar21 = 0;
      if (uVar121 != 0) {
        for (; (uVar121 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar125 = *(uint *)(prim + 2);
      uVar123 = *(uint *)(prim + lVar21 * 4 + 6);
      local_7d0 = (ulong)uVar125;
      pGVar129 = (context->scene->geometries).items[uVar125].ptr;
      local_7c8 = (ulong)uVar123;
      uVar124 = (ulong)*(uint *)(*(long *)&pGVar129->field_0x58 +
                                (ulong)uVar123 *
                                pGVar129[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar258 = (pGVar129->time_range).lower;
      fVar258 = pGVar129->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar258) /
                ((pGVar129->time_range).upper - fVar258));
      auVar236 = vroundss_avx(ZEXT416((uint)fVar258),ZEXT416((uint)fVar258),9);
      auVar236 = vminss_avx(auVar236,ZEXT416((uint)(pGVar129->fnumTimeSegments + -1.0)));
      auVar236 = vmaxss_avx(ZEXT816(0) << 0x20,auVar236);
      fVar258 = fVar258 - auVar236._0_4_;
      _Var16 = pGVar129[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar127 = (long)(int)auVar236._0_4_ * 0x38;
      lVar128 = *(long *)(_Var16 + 0x10 + lVar127);
      lVar17 = *(long *)(_Var16 + 0x38 + lVar127);
      lVar18 = *(long *)(_Var16 + 0x48 + lVar127);
      auVar236 = vshufps_avx(ZEXT416((uint)fVar258),ZEXT416((uint)fVar258),0);
      pfVar1 = (float *)(lVar17 + lVar18 * uVar124);
      fVar243 = auVar236._0_4_;
      fVar251 = auVar236._4_4_;
      fVar317 = auVar236._8_4_;
      fVar194 = auVar236._12_4_;
      lVar21 = uVar124 + 1;
      pfVar2 = (float *)(lVar17 + lVar18 * lVar21);
      p_Var19 = pGVar129[4].occlusionFilterN;
      auVar236 = vshufps_avx(ZEXT416((uint)(1.0 - fVar258)),ZEXT416((uint)(1.0 - fVar258)),0);
      pfVar3 = (float *)(*(long *)(_Var16 + lVar127) + lVar128 * uVar124);
      fVar258 = auVar236._0_4_;
      fVar206 = auVar236._4_4_;
      fVar209 = auVar236._8_4_;
      fVar212 = auVar236._12_4_;
      pfVar4 = (float *)(*(long *)(_Var16 + lVar127) + lVar128 * lVar21);
      pfVar5 = (float *)(*(long *)(p_Var19 + lVar127 + 0x38) +
                        uVar124 * *(long *)(p_Var19 + lVar127 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var19 + lVar127 + 0x38) +
                        *(long *)(p_Var19 + lVar127 + 0x48) * lVar21);
      pfVar7 = (float *)(*(long *)(p_Var19 + lVar127) +
                        *(long *)(p_Var19 + lVar127 + 0x10) * uVar124);
      pfVar8 = (float *)(*(long *)(p_Var19 + lVar127) + *(long *)(p_Var19 + lVar127 + 0x10) * lVar21
                        );
      uVar15 = (uint)pGVar129[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar15 * 0x44;
      fVar270 = fVar258 * *pfVar3 + fVar243 * *pfVar1;
      fVar279 = fVar206 * pfVar3[1] + fVar251 * pfVar1[1];
      auVar275._0_8_ = CONCAT44(fVar279,fVar270);
      auVar275._8_4_ = fVar209 * pfVar3[2] + fVar317 * pfVar1[2];
      auVar275._12_4_ = fVar212 * pfVar3[3] + fVar194 * pfVar1[3];
      fVar340 = fVar258 * *pfVar4 + fVar243 * *pfVar2;
      fVar345 = fVar206 * pfVar4[1] + fVar251 * pfVar2[1];
      auVar342._0_8_ = CONCAT44(fVar345,fVar340);
      auVar342._8_4_ = fVar209 * pfVar4[2] + fVar317 * pfVar2[2];
      auVar342._12_4_ = fVar212 * pfVar4[3] + fVar194 * pfVar2[3];
      fVar332 = fVar270 + (fVar258 * *pfVar7 + fVar243 * *pfVar5) * 0.33333334;
      fVar336 = fVar279 + (fVar206 * pfVar7[1] + fVar251 * pfVar5[1]) * 0.33333334;
      auVar334._0_8_ = CONCAT44(fVar336,fVar332);
      auVar334._8_4_ = auVar275._8_4_ + (fVar209 * pfVar7[2] + fVar317 * pfVar5[2]) * 0.33333334;
      auVar334._12_4_ = auVar275._12_4_ + (fVar212 * pfVar7[3] + fVar194 * pfVar5[3]) * 0.33333334;
      auVar135._0_4_ = (fVar258 * *pfVar8 + fVar243 * *pfVar6) * 0.33333334;
      auVar135._4_4_ = (fVar206 * pfVar8[1] + fVar251 * pfVar6[1]) * 0.33333334;
      auVar135._8_4_ = (fVar209 * pfVar8[2] + fVar317 * pfVar6[2]) * 0.33333334;
      auVar135._12_4_ = (fVar212 * pfVar8[3] + fVar194 * pfVar6[3]) * 0.33333334;
      _local_710 = vsubps_avx(auVar342,auVar135);
      aVar13 = (ray->super_RayK<1>).org.field_0;
      auVar222 = vsubps_avx(auVar275,(undefined1  [16])aVar13);
      _local_790 = auVar275;
      auVar236 = vshufps_avx(auVar222,auVar222,0);
      auVar186 = vshufps_avx(auVar222,auVar222,0x55);
      auVar222 = vshufps_avx(auVar222,auVar222,0xaa);
      fVar258 = (local_778->ray_space).vx.field_0.m128[0];
      fVar243 = (local_778->ray_space).vx.field_0.m128[1];
      fVar251 = (local_778->ray_space).vx.field_0.m128[2];
      fVar317 = (local_778->ray_space).vx.field_0.m128[3];
      fVar194 = (local_778->ray_space).vy.field_0.m128[0];
      fVar206 = (local_778->ray_space).vy.field_0.m128[1];
      fVar209 = (local_778->ray_space).vy.field_0.m128[2];
      fVar212 = (local_778->ray_space).vy.field_0.m128[3];
      fVar217 = (local_778->ray_space).vz.field_0.m128[0];
      fVar227 = (local_778->ray_space).vz.field_0.m128[1];
      fVar228 = (local_778->ray_space).vz.field_0.m128[2];
      fVar229 = (local_778->ray_space).vz.field_0.m128[3];
      auVar182._0_4_ =
           auVar236._0_4_ * fVar258 + auVar222._0_4_ * fVar217 + auVar186._0_4_ * fVar194;
      auVar182._4_4_ =
           auVar236._4_4_ * fVar243 + auVar222._4_4_ * fVar227 + auVar186._4_4_ * fVar206;
      auVar182._8_4_ =
           auVar236._8_4_ * fVar251 + auVar222._8_4_ * fVar228 + auVar186._8_4_ * fVar209;
      auVar182._12_4_ =
           auVar236._12_4_ * fVar317 + auVar222._12_4_ * fVar229 + auVar186._12_4_ * fVar212;
      auVar236 = vblendps_avx(auVar182,auVar275,8);
      auVar198 = vsubps_avx(auVar334,(undefined1  [16])aVar13);
      auVar186 = vshufps_avx(auVar198,auVar198,0);
      auVar222 = vshufps_avx(auVar198,auVar198,0x55);
      auVar198 = vshufps_avx(auVar198,auVar198,0xaa);
      auVar235._0_4_ =
           auVar186._0_4_ * fVar258 + auVar222._0_4_ * fVar194 + fVar217 * auVar198._0_4_;
      auVar235._4_4_ =
           auVar186._4_4_ * fVar243 + auVar222._4_4_ * fVar206 + fVar227 * auVar198._4_4_;
      auVar235._8_4_ =
           auVar186._8_4_ * fVar251 + auVar222._8_4_ * fVar209 + fVar228 * auVar198._8_4_;
      auVar235._12_4_ =
           auVar186._12_4_ * fVar317 + auVar222._12_4_ * fVar212 + fVar229 * auVar198._12_4_;
      auVar186 = vblendps_avx(auVar235,auVar334,8);
      auVar22 = vsubps_avx(_local_710,(undefined1  [16])aVar13);
      auVar222 = vshufps_avx(auVar22,auVar22,0);
      auVar198 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar220._0_4_ = auVar222._0_4_ * fVar258 + auVar198._0_4_ * fVar194 + fVar217 * auVar22._0_4_
      ;
      auVar220._4_4_ = auVar222._4_4_ * fVar243 + auVar198._4_4_ * fVar206 + fVar227 * auVar22._4_4_
      ;
      auVar220._8_4_ = auVar222._8_4_ * fVar251 + auVar198._8_4_ * fVar209 + fVar228 * auVar22._8_4_
      ;
      auVar220._12_4_ =
           auVar222._12_4_ * fVar317 + auVar198._12_4_ * fVar212 + fVar229 * auVar22._12_4_;
      auVar222 = vblendps_avx(auVar220,_local_710,8);
      local_3c0._0_16_ = (undefined1  [16])aVar13;
      auVar23 = vsubps_avx(auVar342,(undefined1  [16])aVar13);
      auVar198 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar22 = vshufps_avx(auVar23,auVar23,0);
      auVar23 = vshufps_avx(auVar23,auVar23,0x55);
      auVar161._0_4_ = auVar22._0_4_ * fVar258 + auVar198._0_4_ * fVar217 + auVar23._0_4_ * fVar194;
      auVar161._4_4_ = auVar22._4_4_ * fVar243 + auVar198._4_4_ * fVar227 + auVar23._4_4_ * fVar206;
      auVar161._8_4_ = auVar22._8_4_ * fVar251 + auVar198._8_4_ * fVar228 + auVar23._8_4_ * fVar209;
      auVar161._12_4_ =
           auVar22._12_4_ * fVar317 + auVar198._12_4_ * fVar229 + auVar23._12_4_ * fVar212;
      auVar198 = vblendps_avx(auVar161,auVar342,8);
      auVar221._8_4_ = 0x7fffffff;
      auVar221._0_8_ = 0x7fffffff7fffffff;
      auVar221._12_4_ = 0x7fffffff;
      auVar236 = vandps_avx(auVar236,auVar221);
      auVar186 = vandps_avx(auVar186,auVar221);
      auVar22 = vmaxps_avx(auVar236,auVar186);
      auVar236 = vandps_avx(auVar222,auVar221);
      auVar186 = vandps_avx(auVar198,auVar221);
      auVar236 = vmaxps_avx(auVar236,auVar186);
      auVar236 = vmaxps_avx(auVar22,auVar236);
      auVar186 = vmovshdup_avx(auVar236);
      auVar186 = vmaxss_avx(auVar186,auVar236);
      auVar236 = vshufpd_avx(auVar236,auVar236,1);
      auVar236 = vmaxss_avx(auVar236,auVar186);
      fVar208 = *(float *)(bezier_basis0 + lVar21 + 0x908);
      fVar268 = *(float *)(bezier_basis0 + lVar21 + 0x90c);
      fVar319 = *(float *)(bezier_basis0 + lVar21 + 0x910);
      fVar173 = *(float *)(bezier_basis0 + lVar21 + 0x914);
      fVar211 = *(float *)(bezier_basis0 + lVar21 + 0x918);
      fVar269 = *(float *)(bezier_basis0 + lVar21 + 0x91c);
      fVar175 = *(float *)(bezier_basis0 + lVar21 + 0x920);
      auVar186 = vshufps_avx(auVar220,auVar220,0);
      register0x00001250 = auVar186;
      _local_5c0 = auVar186;
      fVar212 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      fVar217 = *(float *)(bezier_basis0 + lVar21 + 0xd90);
      fVar228 = *(float *)(bezier_basis0 + lVar21 + 0xd94);
      fVar229 = *(float *)(bezier_basis0 + lVar21 + 0xd98);
      fVar232 = *(float *)(bezier_basis0 + lVar21 + 0xd9c);
      fVar238 = *(float *)(bezier_basis0 + lVar21 + 0xda0);
      fVar240 = *(float *)(bezier_basis0 + lVar21 + 0xda4);
      auVar116 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      auVar222 = vshufps_avx(auVar161,auVar161,0);
      register0x00001210 = auVar222;
      _local_440 = auVar222;
      fVar258 = auVar222._0_4_;
      fVar317 = auVar222._4_4_;
      fVar209 = auVar222._8_4_;
      fVar227 = auVar222._12_4_;
      fVar156 = auVar186._0_4_;
      fVar231 = auVar186._4_4_;
      fVar230 = auVar186._8_4_;
      fVar256 = auVar186._12_4_;
      auVar186 = vshufps_avx(auVar220,auVar220,0x55);
      register0x00001410 = auVar186;
      _local_6c0 = auVar186;
      auVar222 = vshufps_avx(auVar161,auVar161,0x55);
      register0x000014d0 = auVar222;
      _local_600 = auVar222;
      fVar292 = auVar222._0_4_;
      fVar293 = auVar222._4_4_;
      fVar294 = auVar222._8_4_;
      fVar295 = auVar222._12_4_;
      fVar271 = auVar186._0_4_;
      fVar280 = auVar186._4_4_;
      fVar281 = auVar186._8_4_;
      fVar283 = auVar186._12_4_;
      auVar23 = _local_710;
      auVar186 = vshufps_avx(_local_710,_local_710,0xff);
      register0x00001310 = auVar186;
      _local_100 = auVar186;
      _local_6f0 = auVar342;
      auVar222 = vshufps_avx(auVar342,auVar342,0xff);
      register0x000013d0 = auVar222;
      _local_80 = auVar222;
      fVar243 = auVar222._0_4_;
      fVar251 = auVar222._4_4_;
      fVar194 = auVar222._8_4_;
      fVar206 = auVar222._12_4_;
      fVar152 = auVar186._0_4_;
      fVar153 = auVar186._4_4_;
      fVar154 = auVar186._8_4_;
      auVar222 = vshufps_avx(auVar235,auVar235,0);
      register0x00001550 = auVar222;
      _local_740 = auVar222;
      pauVar10 = (undefined1 (*) [32])(bezier_basis0 + lVar21 + 0x484);
      fVar242 = *(float *)*pauVar10;
      fVar318 = *(float *)(bezier_basis0 + lVar21 + 0x488);
      fVar191 = *(float *)(bezier_basis0 + lVar21 + 0x48c);
      fVar320 = *(float *)(bezier_basis0 + lVar21 + 0x490);
      fVar172 = *(float *)(bezier_basis0 + lVar21 + 0x494);
      fVar306 = *(float *)(bezier_basis0 + lVar21 + 0x498);
      fVar305 = *(float *)(bezier_basis0 + lVar21 + 0x49c);
      auVar117 = *(undefined1 (*) [28])*pauVar10;
      fVar321 = auVar222._0_4_;
      fVar326 = auVar222._4_4_;
      fVar328 = auVar222._8_4_;
      fVar330 = auVar222._12_4_;
      auVar222 = vshufps_avx(auVar235,auVar235,0x55);
      register0x00001350 = auVar222;
      _local_6a0 = auVar222;
      fVar233 = auVar222._0_4_;
      fVar239 = auVar222._4_4_;
      fVar241 = auVar222._8_4_;
      fVar131 = auVar222._12_4_;
      _local_700 = auVar334;
      auVar222 = vshufps_avx(auVar334,auVar334,0xff);
      register0x00001590 = auVar222;
      _local_a0 = auVar222;
      _local_2e0 = *pauVar10;
      auVar148 = _local_2e0;
      fVar303 = auVar222._0_4_;
      fVar304 = auVar222._4_4_;
      fVar322 = auVar222._8_4_;
      fVar327 = auVar222._12_4_;
      fVar192 = *(float *)(bezier_basis0 + lVar21 + 0x924) + 0.0 + 0.0;
      auVar222 = vshufps_avx(auVar182,auVar182,0);
      register0x00001390 = auVar222;
      _local_420 = auVar222;
      local_300 = *(float *)(bezier_basis0 + lVar21);
      fStack_2fc = *(float *)(bezier_basis0 + lVar21 + 4);
      fStack_2f8 = *(float *)(bezier_basis0 + lVar21 + 8);
      fStack_2f4 = *(float *)(bezier_basis0 + lVar21 + 0xc);
      fStack_2f0 = *(float *)(bezier_basis0 + lVar21 + 0x10);
      fStack_2ec = *(float *)(bezier_basis0 + lVar21 + 0x14);
      fStack_2e8 = *(float *)(bezier_basis0 + lVar21 + 0x18);
      fVar155 = auVar222._0_4_;
      fVar157 = auVar222._4_4_;
      fVar170 = auVar222._8_4_;
      fVar171 = auVar222._12_4_;
      auVar286._0_4_ =
           fVar155 * local_300 + fVar321 * fVar242 + fVar156 * fVar208 + fVar212 * fVar258;
      auVar286._4_4_ =
           fVar157 * fStack_2fc + fVar326 * fVar318 + fVar231 * fVar268 + fVar217 * fVar317;
      auVar286._8_4_ =
           fVar170 * fStack_2f8 + fVar328 * fVar191 + fVar230 * fVar319 + fVar228 * fVar209;
      auVar286._12_4_ =
           fVar171 * fStack_2f4 + fVar330 * fVar320 + fVar256 * fVar173 + fVar229 * fVar227;
      auVar286._16_4_ =
           fVar155 * fStack_2f0 + fVar321 * fVar172 + fVar156 * fVar211 + fVar232 * fVar258;
      auVar286._20_4_ =
           fVar157 * fStack_2ec + fVar326 * fVar306 + fVar231 * fVar269 + fVar238 * fVar317;
      auVar286._24_4_ =
           fVar170 * fStack_2e8 + fVar328 * fVar305 + fVar230 * fVar175 + fVar240 * fVar209;
      auVar286._28_4_ = fVar171 + fVar256 + fVar227 + 0.0;
      auVar222 = vshufps_avx(auVar182,auVar182,0x55);
      register0x000015d0 = auVar222;
      _local_320 = auVar222;
      fVar341 = auVar222._0_4_;
      fVar346 = auVar222._4_4_;
      fVar347 = auVar222._8_4_;
      fVar348 = auVar222._12_4_;
      auVar311._0_4_ =
           fVar341 * local_300 + fVar233 * fVar242 + fVar271 * fVar208 + fVar292 * fVar212;
      auVar311._4_4_ =
           fVar346 * fStack_2fc + fVar239 * fVar318 + fVar280 * fVar268 + fVar293 * fVar217;
      auVar311._8_4_ =
           fVar347 * fStack_2f8 + fVar241 * fVar191 + fVar281 * fVar319 + fVar294 * fVar228;
      auVar311._12_4_ =
           fVar348 * fStack_2f4 + fVar131 * fVar320 + fVar283 * fVar173 + fVar295 * fVar229;
      auVar311._16_4_ =
           fVar341 * fStack_2f0 + fVar233 * fVar172 + fVar271 * fVar211 + fVar292 * fVar232;
      auVar311._20_4_ =
           fVar346 * fStack_2ec + fVar239 * fVar306 + fVar280 * fVar269 + fVar293 * fVar238;
      auVar311._24_4_ =
           fVar347 * fStack_2e8 + fVar241 * fVar305 + fVar281 * fVar175 + fVar294 * fVar240;
      auVar311._28_4_ = 0;
      auVar222 = vpermilps_avx(auVar275,0xff);
      register0x00001490 = auVar222;
      _local_120 = auVar222;
      fStack_2e4 = (float)*(undefined4 *)(bezier_basis0 + lVar21 + 0x1c);
      fVar174 = auVar222._0_4_;
      fVar176 = auVar222._4_4_;
      fVar257 = auVar222._8_4_;
      local_7c0._0_4_ =
           fVar174 * local_300 + fVar303 * fVar242 + fVar152 * fVar208 + fVar212 * fVar243;
      local_7c0._4_4_ =
           fVar176 * fStack_2fc + fVar304 * fVar318 + fVar153 * fVar268 + fVar217 * fVar251;
      fStack_7b8 = fVar257 * fStack_2f8 + fVar322 * fVar191 + fVar154 * fVar319 + fVar228 * fVar194;
      fStack_7b4 = auVar222._12_4_ * fStack_2f4 +
                   fVar327 * fVar320 + auVar186._12_4_ * fVar173 + fVar229 * fVar206;
      fStack_7b0 = fVar174 * fStack_2f0 + fVar303 * fVar172 + fVar152 * fVar211 + fVar232 * fVar243;
      fStack_7ac = fVar176 * fStack_2ec + fVar304 * fVar306 + fVar153 * fVar269 + fVar238 * fVar251;
      fStack_7a8 = fVar257 * fStack_2e8 + fVar322 * fVar305 + fVar154 * fVar175 + fVar240 * fVar194;
      fStack_7a4 = fVar192 + 0.0;
      fVar320 = *(float *)(bezier_basis1 + lVar21 + 0x908);
      fVar172 = *(float *)(bezier_basis1 + lVar21 + 0x90c);
      fVar306 = *(float *)(bezier_basis1 + lVar21 + 0x910);
      fVar305 = *(float *)(bezier_basis1 + lVar21 + 0x914);
      fVar307 = *(float *)(bezier_basis1 + lVar21 + 0x918);
      fVar177 = *(float *)(bezier_basis1 + lVar21 + 0x91c);
      fVar309 = *(float *)(bezier_basis1 + lVar21 + 0x920);
      fVar308 = *(float *)(bezier_basis1 + lVar21 + 0xd8c);
      fVar252 = *(float *)(bezier_basis1 + lVar21 + 0xd90);
      fVar253 = *(float *)(bezier_basis1 + lVar21 + 0xd94);
      fVar254 = *(float *)(bezier_basis1 + lVar21 + 0xd98);
      fVar255 = *(float *)(bezier_basis1 + lVar21 + 0xd9c);
      fVar282 = *(float *)(bezier_basis1 + lVar21 + 0xda0);
      fVar216 = *(float *)(bezier_basis1 + lVar21 + 0xda4);
      fVar284 = *(float *)(bezier_basis1 + lVar21 + 0x484);
      fVar130 = *(float *)(bezier_basis1 + lVar21 + 0x488);
      fVar150 = *(float *)(bezier_basis1 + lVar21 + 0x48c);
      fVar151 = *(float *)(bezier_basis1 + lVar21 + 0x490);
      fVar178 = *(float *)(bezier_basis1 + lVar21 + 0x494);
      fVar193 = *(float *)(bezier_basis1 + lVar21 + 0x498);
      fVar296 = *(float *)(bezier_basis1 + lVar21 + 0x49c);
      fVar217 = fVar330 + fVar192 + 0.0;
      fVar192 = *(float *)(bezier_basis1 + lVar21);
      fVar195 = *(float *)(bezier_basis1 + lVar21 + 4);
      fVar207 = *(float *)(bezier_basis1 + lVar21 + 8);
      fVar210 = *(float *)(bezier_basis1 + lVar21 + 0xc);
      fVar213 = *(float *)(bezier_basis1 + lVar21 + 0x10);
      fVar214 = *(float *)(bezier_basis1 + lVar21 + 0x14);
      fVar215 = *(float *)(bezier_basis1 + lVar21 + 0x18);
      auVar276._0_4_ = fVar155 * fVar192 + fVar321 * fVar284 + fVar320 * fVar156 + fVar308 * fVar258
      ;
      auVar276._4_4_ = fVar157 * fVar195 + fVar326 * fVar130 + fVar172 * fVar231 + fVar252 * fVar317
      ;
      auVar276._8_4_ = fVar170 * fVar207 + fVar328 * fVar150 + fVar306 * fVar230 + fVar253 * fVar209
      ;
      auVar276._12_4_ =
           fVar171 * fVar210 + fVar330 * fVar151 + fVar305 * fVar256 + fVar254 * fVar227;
      auVar276._16_4_ =
           fVar155 * fVar213 + fVar321 * fVar178 + fVar307 * fVar156 + fVar255 * fVar258;
      auVar276._20_4_ =
           fVar157 * fVar214 + fVar326 * fVar193 + fVar177 * fVar231 + fVar282 * fVar317;
      auVar276._24_4_ =
           fVar170 * fVar215 + fVar328 * fVar296 + fVar309 * fVar230 + fVar216 * fVar209;
      auVar276._28_4_ = fVar327 + fVar217;
      auVar200._0_4_ = fVar341 * fVar192 + fVar233 * fVar284 + fVar271 * fVar320 + fVar292 * fVar308
      ;
      auVar200._4_4_ = fVar346 * fVar195 + fVar239 * fVar130 + fVar280 * fVar172 + fVar293 * fVar252
      ;
      auVar200._8_4_ = fVar347 * fVar207 + fVar241 * fVar150 + fVar281 * fVar306 + fVar294 * fVar253
      ;
      auVar200._12_4_ =
           fVar348 * fVar210 + fVar131 * fVar151 + fVar283 * fVar305 + fVar295 * fVar254;
      auVar200._16_4_ =
           fVar341 * fVar213 + fVar233 * fVar178 + fVar271 * fVar307 + fVar292 * fVar255;
      auVar200._20_4_ =
           fVar346 * fVar214 + fVar239 * fVar193 + fVar280 * fVar177 + fVar293 * fVar282;
      auVar200._24_4_ =
           fVar347 * fVar215 + fVar241 * fVar296 + fVar281 * fVar309 + fVar294 * fVar216;
      auVar200._28_4_ = fVar217 + fVar330 + fVar171 + 0.0;
      local_580._0_4_ =
           fVar303 * fVar284 + fVar152 * fVar320 + fVar243 * fVar308 + fVar174 * fVar192;
      local_580._4_4_ =
           fVar304 * fVar130 + fVar153 * fVar172 + fVar251 * fVar252 + fVar176 * fVar195;
      local_580._8_4_ =
           fVar322 * fVar150 + fVar154 * fVar306 + fVar194 * fVar253 + fVar257 * fVar207;
      local_580._12_4_ =
           fVar327 * fVar151 + auVar186._12_4_ * fVar305 + fVar206 * fVar254 +
           auVar222._12_4_ * fVar210;
      local_580._16_4_ =
           fVar303 * fVar178 + fVar152 * fVar307 + fVar243 * fVar255 + fVar174 * fVar213;
      local_580._20_4_ =
           fVar304 * fVar193 + fVar153 * fVar177 + fVar251 * fVar282 + fVar176 * fVar214;
      local_580._24_4_ =
           fVar322 * fVar296 + fVar154 * fVar309 + fVar194 * fVar216 + fVar257 * fVar215;
      local_580._28_4_ = fVar330 + fVar206 + fVar171 + fVar217;
      auVar30 = vsubps_avx(auVar276,auVar286);
      auVar31 = vsubps_avx(auVar200,auVar311);
      _auStack_450 = auVar31._16_16_;
      fVar243 = auVar30._0_4_;
      fVar194 = auVar30._4_4_;
      auVar143._4_4_ = auVar311._4_4_ * fVar194;
      auVar143._0_4_ = auVar311._0_4_ * fVar243;
      fVar212 = auVar30._8_4_;
      auVar143._8_4_ = auVar311._8_4_ * fVar212;
      fVar228 = auVar30._12_4_;
      auVar143._12_4_ = auVar311._12_4_ * fVar228;
      fVar232 = auVar30._16_4_;
      auVar143._16_4_ = auVar311._16_4_ * fVar232;
      fVar240 = auVar30._20_4_;
      auVar143._20_4_ = auVar311._20_4_ * fVar240;
      fVar318 = auVar30._24_4_;
      auVar143._24_4_ = auVar311._24_4_ * fVar318;
      auVar143._28_4_ = fVar217;
      fVar251 = auVar31._0_4_;
      fVar206 = auVar31._4_4_;
      auVar32._4_4_ = auVar286._4_4_ * fVar206;
      auVar32._0_4_ = auVar286._0_4_ * fVar251;
      fVar217 = auVar31._8_4_;
      auVar32._8_4_ = auVar286._8_4_ * fVar217;
      fVar229 = auVar31._12_4_;
      auVar32._12_4_ = auVar286._12_4_ * fVar229;
      fVar238 = auVar31._16_4_;
      auVar32._16_4_ = auVar286._16_4_ * fVar238;
      fVar242 = auVar31._20_4_;
      auVar32._20_4_ = auVar286._20_4_ * fVar242;
      fVar191 = auVar31._24_4_;
      auVar32._24_4_ = auVar286._24_4_ * fVar191;
      auVar32._28_4_ = auVar200._28_4_;
      auVar32 = vsubps_avx(auVar143,auVar32);
      auVar143 = vmaxps_avx(_local_7c0,local_580);
      auVar35._4_4_ = auVar143._4_4_ * auVar143._4_4_ * (fVar194 * fVar194 + fVar206 * fVar206);
      auVar35._0_4_ = auVar143._0_4_ * auVar143._0_4_ * (fVar243 * fVar243 + fVar251 * fVar251);
      auVar35._8_4_ = auVar143._8_4_ * auVar143._8_4_ * (fVar212 * fVar212 + fVar217 * fVar217);
      auVar35._12_4_ = auVar143._12_4_ * auVar143._12_4_ * (fVar228 * fVar228 + fVar229 * fVar229);
      auVar35._16_4_ = auVar143._16_4_ * auVar143._16_4_ * (fVar232 * fVar232 + fVar238 * fVar238);
      auVar35._20_4_ = auVar143._20_4_ * auVar143._20_4_ * (fVar240 * fVar240 + fVar242 * fVar242);
      auVar35._24_4_ = auVar143._24_4_ * auVar143._24_4_ * (fVar318 * fVar318 + fVar191 * fVar191);
      auVar35._28_4_ = auVar30._28_4_ + auVar200._28_4_;
      auVar266._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar266._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar266._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar266._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar266._16_4_ = auVar32._16_4_ * auVar32._16_4_;
      auVar266._20_4_ = auVar32._20_4_ * auVar32._20_4_;
      auVar266._24_4_ = auVar32._24_4_ * auVar32._24_4_;
      auVar266._28_4_ = auVar32._28_4_;
      auVar143 = vcmpps_avx(auVar266,auVar35,2);
      local_3e0 = (float)(int)uVar15;
      fStack_3dc = 0.0;
      fStack_3d8 = 0.0;
      fStack_3d4 = 0.0;
      auVar186 = vshufps_avx(ZEXT416((uint)local_3e0),ZEXT416((uint)local_3e0),0);
      auVar201._16_16_ = auVar186;
      auVar201._0_16_ = auVar186;
      auVar32 = vcmpps_avx(_DAT_01faff40,auVar201,1);
      auVar205 = ZEXT3264(auVar32);
      auVar186 = vpermilps_avx(auVar182,0xaa);
      auVar298._16_16_ = auVar186;
      auVar298._0_16_ = auVar186;
      auVar222 = vpermilps_avx(auVar235,0xaa);
      register0x00001550 = auVar222;
      _local_3a0 = auVar222;
      auVar198 = vpermilps_avx(auVar220,0xaa);
      register0x00001590 = auVar198;
      _local_2c0 = auVar198;
      auVar22 = vpermilps_avx(auVar161,0xaa);
      register0x000014d0 = auVar22;
      _local_5e0 = auVar22;
      auVar35 = auVar32 & auVar143;
      auVar236 = ZEXT416((uint)(auVar236._0_4_ * 4.7683716e-07));
      local_6e0._0_16_ = auVar236;
      auVar266 = local_4e0;
      fVar243 = fVar233;
      fVar251 = fVar239;
      fVar194 = fVar241;
      fVar206 = fVar321;
      fVar212 = fVar326;
      fVar217 = fVar328;
      fVar228 = fVar330;
      fVar229 = fVar271;
      fVar232 = fVar280;
      fVar238 = fVar281;
      fVar240 = fVar283;
      _local_710 = auVar23;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        local_340 = vandps_avx(auVar143,auVar32);
        fVar152 = auVar186._0_4_;
        fVar153 = auVar186._4_4_;
        fVar154 = auVar186._8_4_;
        fVar174 = auVar186._12_4_;
        fVar322 = auVar222._0_4_;
        fVar327 = auVar222._4_4_;
        fVar329 = auVar222._8_4_;
        fVar331 = auVar222._12_4_;
        fVar333 = auVar198._0_4_;
        fVar337 = auVar198._4_4_;
        fVar338 = auVar198._8_4_;
        fVar339 = auVar198._12_4_;
        fVar176 = auVar22._0_4_;
        fVar257 = auVar22._4_4_;
        fVar303 = auVar22._8_4_;
        fVar304 = auVar22._12_4_;
        fVar242 = auVar32._28_4_ + *(float *)(bezier_basis1 + lVar21 + 0x924) + fVar131;
        local_360._0_4_ =
             fVar152 * fVar192 + fVar322 * fVar284 + fVar333 * fVar320 + fVar176 * fVar308;
        local_360._4_4_ =
             fVar153 * fVar195 + fVar327 * fVar130 + fVar337 * fVar172 + fVar257 * fVar252;
        fStack_358 = fVar154 * fVar207 + fVar329 * fVar150 + fVar338 * fVar306 + fVar303 * fVar253;
        fStack_354 = fVar174 * fVar210 + fVar331 * fVar151 + fVar339 * fVar305 + fVar304 * fVar254;
        fStack_350 = fVar152 * fVar213 + fVar322 * fVar178 + fVar333 * fVar307 + fVar176 * fVar255;
        fStack_34c = fVar153 * fVar214 + fVar327 * fVar193 + fVar337 * fVar177 + fVar257 * fVar282;
        fStack_348 = fVar154 * fVar215 + fVar329 * fVar296 + fVar338 * fVar309 + fVar303 * fVar216;
        fStack_344 = local_340._28_4_ + fVar242;
        local_2e0._0_4_ = auVar117._0_4_;
        local_2e0._4_4_ = auVar117._4_4_;
        fStack_2d8 = auVar117._8_4_;
        fStack_2d4 = auVar117._12_4_;
        fStack_2d0 = auVar117._16_4_;
        fStack_2cc = auVar117._20_4_;
        fStack_2c8 = auVar117._24_4_;
        local_5a0._0_4_ = auVar116._0_4_;
        local_5a0._4_4_ = auVar116._4_4_;
        fStack_598 = auVar116._8_4_;
        fStack_594 = auVar116._12_4_;
        fStack_590 = auVar116._16_4_;
        fStack_58c = auVar116._20_4_;
        fStack_588 = auVar116._24_4_;
        fVar193 = local_340._28_4_ + auVar32._28_4_;
        local_620 = fVar152 * local_300 +
                    fVar322 * (float)local_2e0._0_4_ +
                    fVar333 * fVar208 + fVar176 * (float)local_5a0._0_4_;
        fStack_61c = fVar153 * fStack_2fc +
                     fVar327 * (float)local_2e0._4_4_ +
                     fVar337 * fVar268 + fVar257 * (float)local_5a0._4_4_;
        fStack_618 = fVar154 * fStack_2f8 +
                     fVar329 * fStack_2d8 + fVar338 * fVar319 + fVar303 * fStack_598;
        fStack_614 = fVar174 * fStack_2f4 +
                     fVar331 * fStack_2d4 + fVar339 * fVar173 + fVar304 * fStack_594;
        fStack_610 = fVar152 * fStack_2f0 +
                     fVar322 * fStack_2d0 + fVar333 * fVar211 + fVar176 * fStack_590;
        fStack_60c = fVar153 * fStack_2ec +
                     fVar327 * fStack_2cc + fVar337 * fVar269 + fVar257 * fStack_58c;
        fStack_608 = fVar154 * fStack_2e8 +
                     fVar329 * fStack_2c8 + fVar338 * fVar175 + fVar303 * fStack_588;
        fStack_604 = fStack_344 + fVar242 + fVar193;
        fVar242 = *(float *)(bezier_basis0 + lVar21 + 0x1210);
        fVar318 = *(float *)(bezier_basis0 + lVar21 + 0x1214);
        fVar191 = *(float *)(bezier_basis0 + lVar21 + 0x1218);
        fVar208 = *(float *)(bezier_basis0 + lVar21 + 0x121c);
        fVar268 = *(float *)(bezier_basis0 + lVar21 + 0x1220);
        fVar319 = *(float *)(bezier_basis0 + lVar21 + 0x1224);
        fVar173 = *(float *)(bezier_basis0 + lVar21 + 0x1228);
        fVar211 = *(float *)(bezier_basis0 + lVar21 + 0x1694);
        fVar269 = *(float *)(bezier_basis0 + lVar21 + 0x1698);
        fVar175 = *(float *)(bezier_basis0 + lVar21 + 0x169c);
        fVar320 = *(float *)(bezier_basis0 + lVar21 + 0x16a0);
        fVar172 = *(float *)(bezier_basis0 + lVar21 + 0x16a4);
        fVar306 = *(float *)(bezier_basis0 + lVar21 + 0x16a8);
        fVar305 = *(float *)(bezier_basis0 + lVar21 + 0x16ac);
        fVar307 = *(float *)(bezier_basis0 + lVar21 + 0x1b18);
        fVar177 = *(float *)(bezier_basis0 + lVar21 + 0x1b1c);
        fVar309 = *(float *)(bezier_basis0 + lVar21 + 0x1b20);
        fVar308 = *(float *)(bezier_basis0 + lVar21 + 0x1b24);
        fVar252 = *(float *)(bezier_basis0 + lVar21 + 0x1b28);
        fVar253 = *(float *)(bezier_basis0 + lVar21 + 0x1b2c);
        fVar254 = *(float *)(bezier_basis0 + lVar21 + 0x1b30);
        fVar255 = *(float *)(bezier_basis0 + lVar21 + 0x1f9c);
        fVar282 = *(float *)(bezier_basis0 + lVar21 + 0x1fa0);
        fVar216 = *(float *)(bezier_basis0 + lVar21 + 0x1fa4);
        fVar284 = *(float *)(bezier_basis0 + lVar21 + 0x1fa8);
        fVar130 = *(float *)(bezier_basis0 + lVar21 + 0x1fac);
        fVar150 = *(float *)(bezier_basis0 + lVar21 + 0x1fb0);
        fVar151 = *(float *)(bezier_basis0 + lVar21 + 0x1fb4);
        _local_5a0 = auVar276;
        fVar178 = *(float *)(bezier_basis0 + lVar21 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar21 + 0x1fb8);
        fVar296 = *(float *)(bezier_basis0 + lVar21 + 0x16b0) + fVar178;
        auVar138._0_4_ =
             fVar242 * fVar155 + fVar211 * fVar321 + fVar156 * fVar307 + fVar258 * fVar255;
        auVar138._4_4_ =
             fVar318 * fVar157 + fVar269 * fVar326 + fVar231 * fVar177 + fVar317 * fVar282;
        auVar138._8_4_ =
             fVar191 * fVar170 + fVar175 * fVar328 + fVar230 * fVar309 + fVar209 * fVar216;
        auVar138._12_4_ =
             fVar208 * fVar171 + fVar320 * fVar330 + fVar256 * fVar308 + fVar227 * fVar284;
        auVar138._16_4_ =
             fVar268 * fVar155 + fVar172 * fVar321 + fVar156 * fVar252 + fVar258 * fVar130;
        auVar138._20_4_ =
             fVar319 * fVar157 + fVar306 * fVar326 + fVar231 * fVar253 + fVar317 * fVar150;
        auVar138._24_4_ =
             fVar173 * fVar170 + fVar305 * fVar328 + fVar230 * fVar254 + fVar209 * fVar151;
        auVar138._28_4_ =
             *(float *)(bezier_basis0 + lVar21 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar21 + 0x1fb8) +
             *(float *)(bezier_basis1 + lVar21 + 0x4a0) + 0.0;
        auVar162._0_4_ =
             fVar341 * fVar242 + fVar271 * fVar307 + fVar255 * fVar292 + fVar233 * fVar211;
        auVar162._4_4_ =
             fVar346 * fVar318 + fVar280 * fVar177 + fVar282 * fVar293 + fVar239 * fVar269;
        auVar162._8_4_ =
             fVar347 * fVar191 + fVar281 * fVar309 + fVar216 * fVar294 + fVar241 * fVar175;
        auVar162._12_4_ =
             fVar348 * fVar208 + fVar283 * fVar308 + fVar284 * fVar295 + fVar131 * fVar320;
        auVar162._16_4_ =
             fVar341 * fVar268 + fVar271 * fVar252 + fVar130 * fVar292 + fVar233 * fVar172;
        auVar162._20_4_ =
             fVar346 * fVar319 + fVar280 * fVar253 + fVar150 * fVar293 + fVar239 * fVar306;
        auVar162._24_4_ =
             fVar347 * fVar173 + fVar281 * fVar254 + fVar151 * fVar294 + fVar241 * fVar305;
        auVar162._28_4_ = fVar178 + fVar193 + 0.0 + *(float *)(bezier_basis1 + lVar21 + 0x4a0) + 0.0
        ;
        auVar246._0_4_ =
             fVar322 * fVar211 + fVar333 * fVar307 + fVar176 * fVar255 + fVar152 * fVar242;
        auVar246._4_4_ =
             fVar327 * fVar269 + fVar337 * fVar177 + fVar257 * fVar282 + fVar153 * fVar318;
        auVar246._8_4_ =
             fVar329 * fVar175 + fVar338 * fVar309 + fVar303 * fVar216 + fVar154 * fVar191;
        auVar246._12_4_ =
             fVar331 * fVar320 + fVar339 * fVar308 + fVar304 * fVar284 + fVar174 * fVar208;
        auVar246._16_4_ =
             fVar322 * fVar172 + fVar333 * fVar252 + fVar176 * fVar130 + fVar152 * fVar268;
        auVar246._20_4_ =
             fVar327 * fVar306 + fVar337 * fVar253 + fVar257 * fVar150 + fVar153 * fVar319;
        auVar246._24_4_ =
             fVar329 * fVar305 + fVar338 * fVar254 + fVar303 * fVar151 + fVar154 * fVar173;
        auVar246._28_4_ = fVar296 + fVar193;
        fVar242 = *(float *)(bezier_basis1 + lVar21 + 0x1b18);
        fVar318 = *(float *)(bezier_basis1 + lVar21 + 0x1b1c);
        fVar191 = *(float *)(bezier_basis1 + lVar21 + 0x1b20);
        fVar208 = *(float *)(bezier_basis1 + lVar21 + 0x1b24);
        fVar268 = *(float *)(bezier_basis1 + lVar21 + 0x1b28);
        fVar319 = *(float *)(bezier_basis1 + lVar21 + 0x1b2c);
        fVar173 = *(float *)(bezier_basis1 + lVar21 + 0x1b30);
        fVar211 = *(float *)(bezier_basis1 + lVar21 + 0x1f9c);
        fVar269 = *(float *)(bezier_basis1 + lVar21 + 0x1fa0);
        fVar175 = *(float *)(bezier_basis1 + lVar21 + 0x1fa4);
        fVar320 = *(float *)(bezier_basis1 + lVar21 + 0x1fa8);
        fVar172 = *(float *)(bezier_basis1 + lVar21 + 0x1fac);
        fVar306 = *(float *)(bezier_basis1 + lVar21 + 0x1fb0);
        fVar305 = *(float *)(bezier_basis1 + lVar21 + 0x1fb4);
        fVar307 = *(float *)(bezier_basis1 + lVar21 + 0x1694);
        fVar177 = *(float *)(bezier_basis1 + lVar21 + 0x1698);
        fVar309 = *(float *)(bezier_basis1 + lVar21 + 0x169c);
        fVar308 = *(float *)(bezier_basis1 + lVar21 + 0x16a0);
        fVar252 = *(float *)(bezier_basis1 + lVar21 + 0x16a4);
        fVar253 = *(float *)(bezier_basis1 + lVar21 + 0x16a8);
        fVar254 = *(float *)(bezier_basis1 + lVar21 + 0x16ac);
        fVar255 = *(float *)(bezier_basis1 + lVar21 + 0x1210);
        fVar282 = *(float *)(bezier_basis1 + lVar21 + 0x1214);
        fVar216 = *(float *)(bezier_basis1 + lVar21 + 0x1218);
        fVar284 = *(float *)(bezier_basis1 + lVar21 + 0x121c);
        fVar130 = *(float *)(bezier_basis1 + lVar21 + 0x1220);
        fVar150 = *(float *)(bezier_basis1 + lVar21 + 0x1224);
        fVar151 = *(float *)(bezier_basis1 + lVar21 + 0x1228);
        auVar264._0_4_ =
             fVar255 * fVar155 + fVar307 * fVar321 + fVar156 * fVar242 + fVar258 * fVar211;
        auVar264._4_4_ =
             fVar282 * fVar157 + fVar177 * fVar326 + fVar231 * fVar318 + fVar317 * fVar269;
        auVar264._8_4_ =
             fVar216 * fVar170 + fVar309 * fVar328 + fVar230 * fVar191 + fVar209 * fVar175;
        auVar264._12_4_ =
             fVar284 * fVar171 + fVar308 * fVar330 + fVar256 * fVar208 + fVar227 * fVar320;
        auVar264._16_4_ =
             fVar130 * fVar155 + fVar252 * fVar321 + fVar156 * fVar268 + fVar258 * fVar172;
        auVar264._20_4_ =
             fVar150 * fVar157 + fVar253 * fVar326 + fVar231 * fVar319 + fVar317 * fVar306;
        auVar264._24_4_ =
             fVar151 * fVar170 + fVar254 * fVar328 + fVar230 * fVar173 + fVar209 * fVar305;
        auVar264._28_4_ = fVar283 + fVar283 + fVar296 + fVar227;
        auVar287._0_4_ =
             fVar341 * fVar255 + fVar233 * fVar307 + fVar271 * fVar242 + fVar211 * fVar292;
        auVar287._4_4_ =
             fVar346 * fVar282 + fVar239 * fVar177 + fVar280 * fVar318 + fVar269 * fVar293;
        auVar287._8_4_ =
             fVar347 * fVar216 + fVar241 * fVar309 + fVar281 * fVar191 + fVar175 * fVar294;
        auVar287._12_4_ =
             fVar348 * fVar284 + fVar131 * fVar308 + fVar283 * fVar208 + fVar320 * fVar295;
        auVar287._16_4_ =
             fVar341 * fVar130 + fVar233 * fVar252 + fVar271 * fVar268 + fVar172 * fVar292;
        auVar287._20_4_ =
             fVar346 * fVar150 + fVar239 * fVar253 + fVar280 * fVar319 + fVar306 * fVar293;
        auVar287._24_4_ =
             fVar347 * fVar151 + fVar241 * fVar254 + fVar281 * fVar173 + fVar305 * fVar294;
        auVar287._28_4_ = fVar283 + fVar283 + fVar283 + fVar296;
        _local_640 = auVar298;
        auVar190._0_4_ =
             fVar152 * fVar255 + fVar322 * fVar307 + fVar333 * fVar242 + fVar176 * fVar211;
        auVar190._4_4_ =
             fVar153 * fVar282 + fVar327 * fVar177 + fVar337 * fVar318 + fVar257 * fVar269;
        auVar190._8_4_ =
             fVar154 * fVar216 + fVar329 * fVar309 + fVar338 * fVar191 + fVar303 * fVar175;
        auVar190._12_4_ =
             fVar174 * fVar284 + fVar331 * fVar308 + fVar339 * fVar208 + fVar304 * fVar320;
        auVar190._16_4_ =
             fVar152 * fVar130 + fVar322 * fVar252 + fVar333 * fVar268 + fVar176 * fVar172;
        auVar190._20_4_ =
             fVar153 * fVar150 + fVar327 * fVar253 + fVar337 * fVar319 + fVar257 * fVar306;
        auVar190._24_4_ =
             fVar154 * fVar151 + fVar329 * fVar254 + fVar338 * fVar173 + fVar303 * fVar305;
        auVar190._28_4_ =
             *(float *)(bezier_basis1 + lVar21 + 0x122c) +
             *(float *)(bezier_basis1 + lVar21 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar21 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar21 + 0x1fb8);
        auVar223._8_4_ = 0x7fffffff;
        auVar223._0_8_ = 0x7fffffff7fffffff;
        auVar223._12_4_ = 0x7fffffff;
        auVar223._16_4_ = 0x7fffffff;
        auVar223._20_4_ = 0x7fffffff;
        auVar223._24_4_ = 0x7fffffff;
        auVar223._28_4_ = 0x7fffffff;
        auVar143 = vandps_avx(auVar138,auVar223);
        auVar32 = vandps_avx(auVar162,auVar223);
        auVar32 = vmaxps_avx(auVar143,auVar32);
        auVar143 = vandps_avx(auVar246,auVar223);
        auVar143 = vmaxps_avx(auVar32,auVar143);
        auVar236 = vpermilps_avx(auVar236,0);
        auVar247._16_16_ = auVar236;
        auVar247._0_16_ = auVar236;
        auVar143 = vcmpps_avx(auVar143,auVar247,1);
        auVar35 = vblendvps_avx(auVar138,auVar30,auVar143);
        auVar266 = vblendvps_avx(auVar162,auVar31,auVar143);
        auVar143 = vandps_avx(auVar264,auVar223);
        auVar32 = vandps_avx(auVar287,auVar223);
        auVar201 = vmaxps_avx(auVar143,auVar32);
        auVar143 = vandps_avx(auVar190,auVar223);
        auVar143 = vmaxps_avx(auVar201,auVar143);
        auVar201 = vcmpps_avx(auVar143,auVar247,1);
        auVar143 = vblendvps_avx(auVar264,auVar30,auVar201);
        auVar30 = vblendvps_avx(auVar287,auVar31,auVar201);
        fVar130 = auVar35._0_4_;
        fVar150 = auVar35._4_4_;
        fVar151 = auVar35._8_4_;
        fVar178 = auVar35._12_4_;
        fVar193 = auVar35._16_4_;
        fVar296 = auVar35._20_4_;
        fVar192 = auVar35._24_4_;
        fVar195 = auVar143._0_4_;
        fVar207 = auVar143._4_4_;
        fVar210 = auVar143._8_4_;
        fVar213 = auVar143._12_4_;
        fVar214 = auVar143._16_4_;
        fVar215 = auVar143._20_4_;
        fVar156 = auVar143._24_4_;
        fVar231 = -auVar143._28_4_;
        fVar258 = auVar266._0_4_;
        fVar242 = auVar266._4_4_;
        fVar268 = auVar266._8_4_;
        fVar269 = auVar266._12_4_;
        fVar306 = auVar266._16_4_;
        fVar309 = auVar266._20_4_;
        fVar254 = auVar266._24_4_;
        auVar139._0_4_ = fVar258 * fVar258 + fVar130 * fVar130;
        auVar139._4_4_ = fVar242 * fVar242 + fVar150 * fVar150;
        auVar139._8_4_ = fVar268 * fVar268 + fVar151 * fVar151;
        auVar139._12_4_ = fVar269 * fVar269 + fVar178 * fVar178;
        auVar139._16_4_ = fVar306 * fVar306 + fVar193 * fVar193;
        auVar139._20_4_ = fVar309 * fVar309 + fVar296 * fVar296;
        auVar139._24_4_ = fVar254 * fVar254 + fVar192 * fVar192;
        auVar139._28_4_ = auVar287._28_4_ + auVar35._28_4_;
        auVar31 = vrsqrtps_avx(auVar139);
        fVar317 = auVar31._0_4_;
        fVar209 = auVar31._4_4_;
        auVar34._4_4_ = fVar209 * 1.5;
        auVar34._0_4_ = fVar317 * 1.5;
        fVar227 = auVar31._8_4_;
        auVar34._8_4_ = fVar227 * 1.5;
        fVar318 = auVar31._12_4_;
        auVar34._12_4_ = fVar318 * 1.5;
        fVar191 = auVar31._16_4_;
        auVar34._16_4_ = fVar191 * 1.5;
        fVar208 = auVar31._20_4_;
        auVar34._20_4_ = fVar208 * 1.5;
        fVar319 = auVar31._24_4_;
        fVar284 = auVar32._28_4_;
        auVar34._24_4_ = fVar319 * 1.5;
        auVar34._28_4_ = fVar284;
        auVar31._4_4_ = fVar209 * fVar209 * fVar209 * auVar139._4_4_ * 0.5;
        auVar31._0_4_ = fVar317 * fVar317 * fVar317 * auVar139._0_4_ * 0.5;
        auVar31._8_4_ = fVar227 * fVar227 * fVar227 * auVar139._8_4_ * 0.5;
        auVar31._12_4_ = fVar318 * fVar318 * fVar318 * auVar139._12_4_ * 0.5;
        auVar31._16_4_ = fVar191 * fVar191 * fVar191 * auVar139._16_4_ * 0.5;
        auVar31._20_4_ = fVar208 * fVar208 * fVar208 * auVar139._20_4_ * 0.5;
        auVar31._24_4_ = fVar319 * fVar319 * fVar319 * auVar139._24_4_ * 0.5;
        auVar31._28_4_ = auVar139._28_4_;
        auVar32 = vsubps_avx(auVar34,auVar31);
        fVar317 = auVar32._0_4_;
        fVar318 = auVar32._4_4_;
        fVar319 = auVar32._8_4_;
        fVar175 = auVar32._12_4_;
        fVar305 = auVar32._16_4_;
        fVar308 = auVar32._20_4_;
        fVar255 = auVar32._24_4_;
        fVar209 = auVar30._0_4_;
        fVar191 = auVar30._4_4_;
        fVar173 = auVar30._8_4_;
        fVar320 = auVar30._12_4_;
        fVar307 = auVar30._16_4_;
        fVar252 = auVar30._20_4_;
        fVar282 = auVar30._24_4_;
        auVar140._0_4_ = fVar209 * fVar209 + fVar195 * fVar195;
        auVar140._4_4_ = fVar191 * fVar191 + fVar207 * fVar207;
        auVar140._8_4_ = fVar173 * fVar173 + fVar210 * fVar210;
        auVar140._12_4_ = fVar320 * fVar320 + fVar213 * fVar213;
        auVar140._16_4_ = fVar307 * fVar307 + fVar214 * fVar214;
        auVar140._20_4_ = fVar252 * fVar252 + fVar215 * fVar215;
        auVar140._24_4_ = fVar282 * fVar282 + fVar156 * fVar156;
        auVar140._28_4_ = auVar143._28_4_ + auVar32._28_4_;
        auVar143 = vrsqrtps_avx(auVar140);
        fVar227 = auVar143._0_4_;
        fVar208 = auVar143._4_4_;
        auVar33._4_4_ = fVar208 * 1.5;
        auVar33._0_4_ = fVar227 * 1.5;
        fVar211 = auVar143._8_4_;
        auVar33._8_4_ = fVar211 * 1.5;
        fVar172 = auVar143._12_4_;
        auVar33._12_4_ = fVar172 * 1.5;
        fVar177 = auVar143._16_4_;
        auVar33._16_4_ = fVar177 * 1.5;
        fVar253 = auVar143._20_4_;
        auVar33._20_4_ = fVar253 * 1.5;
        fVar216 = auVar143._24_4_;
        auVar33._24_4_ = fVar216 * 1.5;
        auVar33._28_4_ = fVar284;
        auVar36._4_4_ = fVar208 * fVar208 * fVar208 * auVar140._4_4_ * 0.5;
        auVar36._0_4_ = fVar227 * fVar227 * fVar227 * auVar140._0_4_ * 0.5;
        auVar36._8_4_ = fVar211 * fVar211 * fVar211 * auVar140._8_4_ * 0.5;
        auVar36._12_4_ = fVar172 * fVar172 * fVar172 * auVar140._12_4_ * 0.5;
        auVar36._16_4_ = fVar177 * fVar177 * fVar177 * auVar140._16_4_ * 0.5;
        auVar36._20_4_ = fVar253 * fVar253 * fVar253 * auVar140._20_4_ * 0.5;
        auVar36._24_4_ = fVar216 * fVar216 * fVar216 * auVar140._24_4_ * 0.5;
        auVar36._28_4_ = auVar140._28_4_;
        auVar143 = vsubps_avx(auVar33,auVar36);
        fVar227 = auVar143._0_4_;
        fVar208 = auVar143._4_4_;
        fVar211 = auVar143._8_4_;
        fVar172 = auVar143._12_4_;
        fVar177 = auVar143._16_4_;
        fVar253 = auVar143._20_4_;
        fVar216 = auVar143._24_4_;
        fVar258 = (float)local_7c0._0_4_ * fVar258 * fVar317;
        fVar242 = (float)local_7c0._4_4_ * fVar242 * fVar318;
        auVar37._4_4_ = fVar242;
        auVar37._0_4_ = fVar258;
        fVar268 = fStack_7b8 * fVar268 * fVar319;
        auVar37._8_4_ = fVar268;
        fVar269 = fStack_7b4 * fVar269 * fVar175;
        auVar37._12_4_ = fVar269;
        fVar306 = fStack_7b0 * fVar306 * fVar305;
        auVar37._16_4_ = fVar306;
        fVar309 = fStack_7ac * fVar309 * fVar308;
        auVar37._20_4_ = fVar309;
        fVar254 = fStack_7a8 * fVar254 * fVar255;
        auVar37._24_4_ = fVar254;
        auVar37._28_4_ = fVar231;
        local_560._4_4_ = auVar286._4_4_ + fVar242;
        local_560._0_4_ = auVar286._0_4_ + fVar258;
        fStack_558 = auVar286._8_4_ + fVar268;
        fStack_554 = auVar286._12_4_ + fVar269;
        fStack_550 = auVar286._16_4_ + fVar306;
        fStack_54c = auVar286._20_4_ + fVar309;
        fStack_548 = auVar286._24_4_ + fVar254;
        fStack_544 = auVar286._28_4_ + fVar231;
        fVar258 = (float)local_7c0._0_4_ * fVar317 * -fVar130;
        fVar242 = (float)local_7c0._4_4_ * fVar318 * -fVar150;
        auVar38._4_4_ = fVar242;
        auVar38._0_4_ = fVar258;
        fVar268 = fStack_7b8 * fVar319 * -fVar151;
        auVar38._8_4_ = fVar268;
        fVar269 = fStack_7b4 * fVar175 * -fVar178;
        auVar38._12_4_ = fVar269;
        fVar306 = fStack_7b0 * fVar305 * -fVar193;
        auVar38._16_4_ = fVar306;
        fVar309 = fStack_7ac * fVar308 * -fVar296;
        auVar38._20_4_ = fVar309;
        fVar254 = fStack_7a8 * fVar255 * -fVar192;
        auVar38._24_4_ = fVar254;
        auVar38._28_4_ = fVar284;
        local_460._4_4_ = fVar242 + auVar311._4_4_;
        local_460._0_4_ = fVar258 + auVar311._0_4_;
        fStack_458 = fVar268 + auVar311._8_4_;
        fStack_454 = fVar269 + auVar311._12_4_;
        auStack_450._0_4_ = fVar306 + auVar311._16_4_;
        auStack_450._4_4_ = fVar309 + auVar311._20_4_;
        fStack_448 = fVar254 + auVar311._24_4_;
        fStack_444 = fVar284 + 0.0;
        fVar258 = fVar317 * 0.0 * (float)local_7c0._0_4_;
        fVar317 = fVar318 * 0.0 * (float)local_7c0._4_4_;
        auVar39._4_4_ = fVar317;
        auVar39._0_4_ = fVar258;
        fVar242 = fVar319 * 0.0 * fStack_7b8;
        auVar39._8_4_ = fVar242;
        fVar318 = fVar175 * 0.0 * fStack_7b4;
        auVar39._12_4_ = fVar318;
        fVar268 = fVar305 * 0.0 * fStack_7b0;
        auVar39._16_4_ = fVar268;
        fVar319 = fVar308 * 0.0 * fStack_7ac;
        auVar39._20_4_ = fVar319;
        fVar269 = fVar255 * 0.0 * fStack_7a8;
        auVar39._24_4_ = fVar269;
        auVar39._28_4_ = fVar131;
        auVar112._4_4_ = fStack_61c;
        auVar112._0_4_ = local_620;
        auVar112._8_4_ = fStack_618;
        auVar112._12_4_ = fStack_614;
        auVar112._16_4_ = fStack_610;
        auVar112._20_4_ = fStack_60c;
        auVar112._24_4_ = fStack_608;
        auVar112._28_4_ = fStack_604;
        auVar248._0_4_ = fVar258 + local_620;
        auVar248._4_4_ = fVar317 + fStack_61c;
        auVar248._8_4_ = fVar242 + fStack_618;
        auVar248._12_4_ = fVar318 + fStack_614;
        auVar248._16_4_ = fVar268 + fStack_610;
        auVar248._20_4_ = fVar319 + fStack_60c;
        auVar248._24_4_ = fVar269 + fStack_608;
        auVar248._28_4_ = fVar131 + fStack_604;
        fVar258 = local_580._0_4_ * fVar209 * fVar227;
        fVar317 = local_580._4_4_ * fVar191 * fVar208;
        auVar40._4_4_ = fVar317;
        auVar40._0_4_ = fVar258;
        fVar209 = local_580._8_4_ * fVar173 * fVar211;
        auVar40._8_4_ = fVar209;
        fVar242 = local_580._12_4_ * fVar320 * fVar172;
        auVar40._12_4_ = fVar242;
        fVar318 = local_580._16_4_ * fVar307 * fVar177;
        auVar40._16_4_ = fVar318;
        fVar191 = local_580._20_4_ * fVar252 * fVar253;
        auVar40._20_4_ = fVar191;
        fVar268 = local_580._24_4_ * fVar282 * fVar216;
        auVar40._24_4_ = fVar268;
        auVar40._28_4_ = auVar30._28_4_;
        auVar35 = vsubps_avx(auVar286,auVar37);
        auVar288._0_4_ = auVar276._0_4_ + fVar258;
        auVar288._4_4_ = auVar276._4_4_ + fVar317;
        auVar288._8_4_ = auVar276._8_4_ + fVar209;
        auVar288._12_4_ = auVar276._12_4_ + fVar242;
        auVar288._16_4_ = auVar276._16_4_ + fVar318;
        auVar288._20_4_ = auVar276._20_4_ + fVar191;
        auVar288._24_4_ = auVar276._24_4_ + fVar268;
        auVar288._28_4_ = auVar276._28_4_ + auVar30._28_4_;
        fVar258 = local_580._0_4_ * fVar227 * -fVar195;
        fVar317 = local_580._4_4_ * fVar208 * -fVar207;
        auVar30._4_4_ = fVar317;
        auVar30._0_4_ = fVar258;
        fVar209 = local_580._8_4_ * fVar211 * -fVar210;
        auVar30._8_4_ = fVar209;
        fVar242 = local_580._12_4_ * fVar172 * -fVar213;
        auVar30._12_4_ = fVar242;
        fVar318 = local_580._16_4_ * fVar177 * -fVar214;
        auVar30._16_4_ = fVar318;
        fVar191 = local_580._20_4_ * fVar253 * -fVar215;
        auVar30._20_4_ = fVar191;
        fVar268 = local_580._24_4_ * fVar216 * -fVar156;
        auVar30._24_4_ = fVar268;
        auVar30._28_4_ = fVar331;
        auVar266 = vsubps_avx(auVar311,auVar38);
        auVar299._0_4_ = fVar258 + auVar200._0_4_;
        auVar299._4_4_ = fVar317 + auVar200._4_4_;
        auVar299._8_4_ = fVar209 + auVar200._8_4_;
        auVar299._12_4_ = fVar242 + auVar200._12_4_;
        auVar299._16_4_ = fVar318 + auVar200._16_4_;
        auVar299._20_4_ = fVar191 + auVar200._20_4_;
        auVar299._24_4_ = fVar268 + auVar200._24_4_;
        auVar299._28_4_ = fVar331 + auVar200._28_4_;
        fVar258 = local_580._0_4_ * fVar227 * 0.0;
        fVar317 = local_580._4_4_ * fVar208 * 0.0;
        auVar41._4_4_ = fVar317;
        auVar41._0_4_ = fVar258;
        fVar209 = local_580._8_4_ * fVar211 * 0.0;
        auVar41._8_4_ = fVar209;
        fVar227 = local_580._12_4_ * fVar172 * 0.0;
        auVar41._12_4_ = fVar227;
        fVar242 = local_580._16_4_ * fVar177 * 0.0;
        auVar41._16_4_ = fVar242;
        fVar318 = local_580._20_4_ * fVar253 * 0.0;
        auVar41._20_4_ = fVar318;
        fVar191 = local_580._24_4_ * fVar216 * 0.0;
        auVar41._24_4_ = fVar191;
        auVar41._28_4_ = 0x3f000000;
        auVar311 = vsubps_avx(auVar112,auVar39);
        auVar335._0_4_ = fVar258 + (float)local_360._0_4_;
        auVar335._4_4_ = fVar317 + (float)local_360._4_4_;
        auVar335._8_4_ = fVar209 + fStack_358;
        auVar335._12_4_ = fVar227 + fStack_354;
        auVar335._16_4_ = fVar242 + fStack_350;
        auVar335._20_4_ = fVar318 + fStack_34c;
        auVar335._24_4_ = fVar191 + fStack_348;
        auVar335._28_4_ = fStack_344 + 0.5;
        auVar143 = vsubps_avx(auVar276,auVar40);
        auVar32 = vsubps_avx(auVar200,auVar30);
        auVar34 = vsubps_avx(_local_360,auVar41);
        auVar30 = vsubps_avx(auVar299,auVar266);
        auVar31 = vsubps_avx(auVar335,auVar311);
        auVar42._4_4_ = auVar311._4_4_ * auVar30._4_4_;
        auVar42._0_4_ = auVar311._0_4_ * auVar30._0_4_;
        auVar42._8_4_ = auVar311._8_4_ * auVar30._8_4_;
        auVar42._12_4_ = auVar311._12_4_ * auVar30._12_4_;
        auVar42._16_4_ = auVar311._16_4_ * auVar30._16_4_;
        auVar42._20_4_ = auVar311._20_4_ * auVar30._20_4_;
        auVar42._24_4_ = auVar311._24_4_ * auVar30._24_4_;
        auVar42._28_4_ = auVar276._28_4_;
        auVar43._4_4_ = auVar266._4_4_ * auVar31._4_4_;
        auVar43._0_4_ = auVar266._0_4_ * auVar31._0_4_;
        auVar43._8_4_ = auVar266._8_4_ * auVar31._8_4_;
        auVar43._12_4_ = auVar266._12_4_ * auVar31._12_4_;
        auVar43._16_4_ = auVar266._16_4_ * auVar31._16_4_;
        auVar43._20_4_ = auVar266._20_4_ * auVar31._20_4_;
        auVar43._24_4_ = auVar266._24_4_ * auVar31._24_4_;
        auVar43._28_4_ = fStack_344;
        auVar201 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar35._4_4_ * auVar31._4_4_;
        auVar44._0_4_ = auVar35._0_4_ * auVar31._0_4_;
        auVar44._8_4_ = auVar35._8_4_ * auVar31._8_4_;
        auVar44._12_4_ = auVar35._12_4_ * auVar31._12_4_;
        auVar44._16_4_ = auVar35._16_4_ * auVar31._16_4_;
        auVar44._20_4_ = auVar35._20_4_ * auVar31._20_4_;
        auVar44._24_4_ = auVar35._24_4_ * auVar31._24_4_;
        auVar44._28_4_ = auVar31._28_4_;
        auVar276 = vsubps_avx(auVar288,auVar35);
        auVar45._4_4_ = auVar311._4_4_ * auVar276._4_4_;
        auVar45._0_4_ = auVar311._0_4_ * auVar276._0_4_;
        auVar45._8_4_ = auVar311._8_4_ * auVar276._8_4_;
        auVar45._12_4_ = auVar311._12_4_ * auVar276._12_4_;
        auVar45._16_4_ = auVar311._16_4_ * auVar276._16_4_;
        auVar45._20_4_ = auVar311._20_4_ * auVar276._20_4_;
        auVar45._24_4_ = auVar311._24_4_ * auVar276._24_4_;
        auVar45._28_4_ = auVar200._28_4_;
        auVar200 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar276._4_4_ * auVar266._4_4_;
        auVar46._0_4_ = auVar276._0_4_ * auVar266._0_4_;
        auVar46._8_4_ = auVar276._8_4_ * auVar266._8_4_;
        auVar46._12_4_ = auVar276._12_4_ * auVar266._12_4_;
        auVar46._16_4_ = auVar276._16_4_ * auVar266._16_4_;
        auVar46._20_4_ = auVar276._20_4_ * auVar266._20_4_;
        auVar46._24_4_ = auVar276._24_4_ * auVar266._24_4_;
        auVar46._28_4_ = auVar31._28_4_;
        auVar47._4_4_ = auVar35._4_4_ * auVar30._4_4_;
        auVar47._0_4_ = auVar35._0_4_ * auVar30._0_4_;
        auVar47._8_4_ = auVar35._8_4_ * auVar30._8_4_;
        auVar47._12_4_ = auVar35._12_4_ * auVar30._12_4_;
        auVar47._16_4_ = auVar35._16_4_ * auVar30._16_4_;
        auVar47._20_4_ = auVar35._20_4_ * auVar30._20_4_;
        auVar47._24_4_ = auVar35._24_4_ * auVar30._24_4_;
        auVar47._28_4_ = auVar30._28_4_;
        auVar30 = vsubps_avx(auVar47,auVar46);
        auVar141._0_4_ = auVar201._0_4_ * 0.0 + auVar30._0_4_ + auVar200._0_4_ * 0.0;
        auVar141._4_4_ = auVar201._4_4_ * 0.0 + auVar30._4_4_ + auVar200._4_4_ * 0.0;
        auVar141._8_4_ = auVar201._8_4_ * 0.0 + auVar30._8_4_ + auVar200._8_4_ * 0.0;
        auVar141._12_4_ = auVar201._12_4_ * 0.0 + auVar30._12_4_ + auVar200._12_4_ * 0.0;
        auVar141._16_4_ = auVar201._16_4_ * 0.0 + auVar30._16_4_ + auVar200._16_4_ * 0.0;
        auVar141._20_4_ = auVar201._20_4_ * 0.0 + auVar30._20_4_ + auVar200._20_4_ * 0.0;
        auVar141._24_4_ = auVar201._24_4_ * 0.0 + auVar30._24_4_ + auVar200._24_4_ * 0.0;
        auVar141._28_4_ = auVar30._28_4_ + auVar30._28_4_ + auVar200._28_4_;
        auVar201 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
        _local_520 = vblendvps_avx(auVar143,_local_560,auVar201);
        _local_540 = vblendvps_avx(auVar32,_local_460,auVar201);
        auVar143 = vblendvps_avx(auVar34,auVar248,auVar201);
        auVar32 = vblendvps_avx(auVar35,auVar288,auVar201);
        auVar30 = vblendvps_avx(auVar266,auVar299,auVar201);
        auVar31 = vblendvps_avx(auVar311,auVar335,auVar201);
        auVar35 = vblendvps_avx(auVar288,auVar35,auVar201);
        auVar266 = vblendvps_avx(auVar299,auVar266,auVar201);
        _local_500 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        _auStack_4f0 = auVar286._16_16_;
        auVar200 = vblendvps_avx(auVar335,auVar311,auVar201);
        auVar35 = vsubps_avx(auVar35,_local_520);
        auVar276 = vsubps_avx(auVar266,_local_540);
        auVar200 = vsubps_avx(auVar200,auVar143);
        auVar286 = vsubps_avx(_local_540,auVar30);
        fVar258 = auVar276._0_4_;
        fVar192 = auVar143._0_4_;
        fVar318 = auVar276._4_4_;
        fVar195 = auVar143._4_4_;
        auVar48._4_4_ = fVar195 * fVar318;
        auVar48._0_4_ = fVar192 * fVar258;
        fVar173 = auVar276._8_4_;
        fVar207 = auVar143._8_4_;
        auVar48._8_4_ = fVar207 * fVar173;
        fVar172 = auVar276._12_4_;
        fVar210 = auVar143._12_4_;
        auVar48._12_4_ = fVar210 * fVar172;
        fVar309 = auVar276._16_4_;
        fVar213 = auVar143._16_4_;
        auVar48._16_4_ = fVar213 * fVar309;
        fVar255 = auVar276._20_4_;
        fVar214 = auVar143._20_4_;
        auVar48._20_4_ = fVar214 * fVar255;
        fVar150 = auVar276._24_4_;
        fVar215 = auVar143._24_4_;
        auVar48._24_4_ = fVar215 * fVar150;
        auVar48._28_4_ = auVar266._28_4_;
        fVar317 = local_540._0_4_;
        fVar155 = auVar200._0_4_;
        fVar191 = local_540._4_4_;
        fVar157 = auVar200._4_4_;
        auVar49._4_4_ = fVar157 * fVar191;
        auVar49._0_4_ = fVar155 * fVar317;
        fVar211 = local_540._8_4_;
        fVar170 = auVar200._8_4_;
        auVar49._8_4_ = fVar170 * fVar211;
        fVar306 = local_540._12_4_;
        fVar171 = auVar200._12_4_;
        auVar49._12_4_ = fVar171 * fVar306;
        fVar308 = local_540._16_4_;
        fVar174 = auVar200._16_4_;
        auVar49._16_4_ = fVar174 * fVar308;
        fVar282 = local_540._20_4_;
        fVar176 = auVar200._20_4_;
        auVar49._20_4_ = fVar176 * fVar282;
        fVar151 = local_540._24_4_;
        fVar257 = auVar200._24_4_;
        uVar11 = auVar34._28_4_;
        auVar49._24_4_ = fVar257 * fVar151;
        auVar49._28_4_ = uVar11;
        auVar266 = vsubps_avx(auVar49,auVar48);
        fVar209 = local_520._0_4_;
        fVar208 = local_520._4_4_;
        auVar50._4_4_ = fVar157 * fVar208;
        auVar50._0_4_ = fVar155 * fVar209;
        fVar269 = local_520._8_4_;
        auVar50._8_4_ = fVar170 * fVar269;
        fVar305 = local_520._12_4_;
        auVar50._12_4_ = fVar171 * fVar305;
        fVar252 = local_520._16_4_;
        auVar50._16_4_ = fVar174 * fVar252;
        fVar216 = local_520._20_4_;
        auVar50._20_4_ = fVar176 * fVar216;
        fVar178 = local_520._24_4_;
        auVar50._24_4_ = fVar257 * fVar178;
        auVar50._28_4_ = uVar11;
        fVar227 = auVar35._0_4_;
        fVar268 = auVar35._4_4_;
        auVar51._4_4_ = fVar195 * fVar268;
        auVar51._0_4_ = fVar192 * fVar227;
        fVar175 = auVar35._8_4_;
        auVar51._8_4_ = fVar207 * fVar175;
        fVar307 = auVar35._12_4_;
        auVar51._12_4_ = fVar210 * fVar307;
        fVar253 = auVar35._16_4_;
        auVar51._16_4_ = fVar213 * fVar253;
        fVar284 = auVar35._20_4_;
        auVar51._20_4_ = fVar214 * fVar284;
        fVar193 = auVar35._24_4_;
        auVar51._24_4_ = fVar215 * fVar193;
        auVar51._28_4_ = auVar335._28_4_;
        auVar311 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = fVar191 * fVar268;
        auVar52._0_4_ = fVar317 * fVar227;
        auVar52._8_4_ = fVar211 * fVar175;
        auVar52._12_4_ = fVar306 * fVar307;
        auVar52._16_4_ = fVar308 * fVar253;
        auVar52._20_4_ = fVar282 * fVar284;
        auVar52._24_4_ = fVar151 * fVar193;
        auVar52._28_4_ = uVar11;
        auVar343._0_4_ = fVar209 * fVar258;
        auVar343._4_4_ = fVar208 * fVar318;
        auVar343._8_4_ = fVar269 * fVar173;
        auVar343._12_4_ = fVar305 * fVar172;
        auVar343._16_4_ = fVar252 * fVar309;
        auVar343._20_4_ = fVar216 * fVar255;
        auVar343._24_4_ = fVar178 * fVar150;
        auVar343._28_4_ = 0;
        auVar34 = vsubps_avx(auVar343,auVar52);
        auVar33 = vsubps_avx(auVar143,auVar31);
        fVar242 = auVar34._28_4_ + auVar311._28_4_;
        auVar163._0_4_ = auVar34._0_4_ + auVar311._0_4_ * 0.0 + auVar266._0_4_ * 0.0;
        auVar163._4_4_ = auVar34._4_4_ + auVar311._4_4_ * 0.0 + auVar266._4_4_ * 0.0;
        auVar163._8_4_ = auVar34._8_4_ + auVar311._8_4_ * 0.0 + auVar266._8_4_ * 0.0;
        auVar163._12_4_ = auVar34._12_4_ + auVar311._12_4_ * 0.0 + auVar266._12_4_ * 0.0;
        auVar163._16_4_ = auVar34._16_4_ + auVar311._16_4_ * 0.0 + auVar266._16_4_ * 0.0;
        auVar163._20_4_ = auVar34._20_4_ + auVar311._20_4_ * 0.0 + auVar266._20_4_ * 0.0;
        auVar163._24_4_ = auVar34._24_4_ + auVar311._24_4_ * 0.0 + auVar266._24_4_ * 0.0;
        auVar163._28_4_ = fVar242 + auVar266._28_4_;
        fVar156 = auVar286._0_4_;
        fVar231 = auVar286._4_4_;
        auVar53._4_4_ = fVar231 * auVar31._4_4_;
        auVar53._0_4_ = fVar156 * auVar31._0_4_;
        fVar230 = auVar286._8_4_;
        auVar53._8_4_ = fVar230 * auVar31._8_4_;
        fVar256 = auVar286._12_4_;
        auVar53._12_4_ = fVar256 * auVar31._12_4_;
        fVar152 = auVar286._16_4_;
        auVar53._16_4_ = fVar152 * auVar31._16_4_;
        fVar153 = auVar286._20_4_;
        auVar53._20_4_ = fVar153 * auVar31._20_4_;
        fVar154 = auVar286._24_4_;
        auVar53._24_4_ = fVar154 * auVar31._24_4_;
        auVar53._28_4_ = fVar242;
        fVar242 = auVar33._0_4_;
        fVar319 = auVar33._4_4_;
        auVar54._4_4_ = auVar30._4_4_ * fVar319;
        auVar54._0_4_ = auVar30._0_4_ * fVar242;
        fVar320 = auVar33._8_4_;
        auVar54._8_4_ = auVar30._8_4_ * fVar320;
        fVar177 = auVar33._12_4_;
        auVar54._12_4_ = auVar30._12_4_ * fVar177;
        fVar254 = auVar33._16_4_;
        auVar54._16_4_ = auVar30._16_4_ * fVar254;
        fVar130 = auVar33._20_4_;
        auVar54._20_4_ = auVar30._20_4_ * fVar130;
        fVar296 = auVar33._24_4_;
        auVar54._24_4_ = auVar30._24_4_ * fVar296;
        auVar54._28_4_ = auVar34._28_4_;
        auVar286 = vsubps_avx(auVar54,auVar53);
        auVar311 = vsubps_avx(_local_520,auVar32);
        fVar292 = auVar311._0_4_;
        fVar293 = auVar311._4_4_;
        auVar55._4_4_ = fVar293 * auVar31._4_4_;
        auVar55._0_4_ = fVar292 * auVar31._0_4_;
        fVar294 = auVar311._8_4_;
        auVar55._8_4_ = fVar294 * auVar31._8_4_;
        fVar295 = auVar311._12_4_;
        auVar55._12_4_ = fVar295 * auVar31._12_4_;
        fVar303 = auVar311._16_4_;
        auVar55._16_4_ = fVar303 * auVar31._16_4_;
        fVar304 = auVar311._20_4_;
        auVar55._20_4_ = fVar304 * auVar31._20_4_;
        fVar322 = auVar311._24_4_;
        auVar55._24_4_ = fVar322 * auVar31._24_4_;
        auVar55._28_4_ = auVar31._28_4_;
        auVar56._4_4_ = auVar32._4_4_ * fVar319;
        auVar56._0_4_ = auVar32._0_4_ * fVar242;
        auVar56._8_4_ = auVar32._8_4_ * fVar320;
        auVar56._12_4_ = auVar32._12_4_ * fVar177;
        auVar56._16_4_ = auVar32._16_4_ * fVar254;
        auVar56._20_4_ = auVar32._20_4_ * fVar130;
        auVar56._24_4_ = auVar32._24_4_ * fVar296;
        auVar56._28_4_ = auVar266._28_4_;
        auVar266 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar30._4_4_ * fVar293;
        auVar57._0_4_ = auVar30._0_4_ * fVar292;
        auVar57._8_4_ = auVar30._8_4_ * fVar294;
        auVar57._12_4_ = auVar30._12_4_ * fVar295;
        auVar57._16_4_ = auVar30._16_4_ * fVar303;
        auVar57._20_4_ = auVar30._20_4_ * fVar304;
        auVar57._24_4_ = auVar30._24_4_ * fVar322;
        auVar57._28_4_ = auVar31._28_4_;
        auVar58._4_4_ = auVar32._4_4_ * fVar231;
        auVar58._0_4_ = auVar32._0_4_ * fVar156;
        auVar58._8_4_ = auVar32._8_4_ * fVar230;
        auVar58._12_4_ = auVar32._12_4_ * fVar256;
        auVar58._16_4_ = auVar32._16_4_ * fVar152;
        auVar58._20_4_ = auVar32._20_4_ * fVar153;
        auVar58._24_4_ = auVar32._24_4_ * fVar154;
        auVar58._28_4_ = auVar32._28_4_;
        auVar32 = vsubps_avx(auVar58,auVar57);
        auVar224._0_4_ = auVar286._0_4_ * 0.0 + auVar32._0_4_ + auVar266._0_4_ * 0.0;
        auVar224._4_4_ = auVar286._4_4_ * 0.0 + auVar32._4_4_ + auVar266._4_4_ * 0.0;
        auVar224._8_4_ = auVar286._8_4_ * 0.0 + auVar32._8_4_ + auVar266._8_4_ * 0.0;
        auVar224._12_4_ = auVar286._12_4_ * 0.0 + auVar32._12_4_ + auVar266._12_4_ * 0.0;
        auVar224._16_4_ = auVar286._16_4_ * 0.0 + auVar32._16_4_ + auVar266._16_4_ * 0.0;
        auVar224._20_4_ = auVar286._20_4_ * 0.0 + auVar32._20_4_ + auVar266._20_4_ * 0.0;
        auVar224._24_4_ = auVar286._24_4_ * 0.0 + auVar32._24_4_ + auVar266._24_4_ * 0.0;
        auVar224._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar266._28_4_;
        auVar32 = vmaxps_avx(auVar163,auVar224);
        auVar32 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,2);
        auVar236 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
        auVar236 = vpand_avx(auVar236,_local_500);
        auVar186 = vpmovsxwd_avx(auVar236);
        auVar222 = vpunpckhwd_avx(auVar236,auVar236);
        auVar202._16_16_ = auVar222;
        auVar202._0_16_ = auVar186;
        if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar202 >> 0x7f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar222 >> 0x3f,0) == '\0') &&
            (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar222[0xf]) {
LAB_00f73863:
          auVar205 = ZEXT3264(auVar202);
          auVar169 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar149 = ZEXT3264(local_4e0);
        }
        else {
          auVar59._4_4_ = fVar319 * fVar318;
          auVar59._0_4_ = fVar242 * fVar258;
          auVar59._8_4_ = fVar320 * fVar173;
          auVar59._12_4_ = fVar177 * fVar172;
          auVar59._16_4_ = fVar254 * fVar309;
          auVar59._20_4_ = fVar130 * fVar255;
          auVar59._24_4_ = fVar296 * fVar150;
          auVar59._28_4_ = auVar222._12_4_;
          auVar312._0_4_ = fVar156 * fVar155;
          auVar312._4_4_ = fVar231 * fVar157;
          auVar312._8_4_ = fVar230 * fVar170;
          auVar312._12_4_ = fVar256 * fVar171;
          auVar312._16_4_ = fVar152 * fVar174;
          auVar312._20_4_ = fVar153 * fVar176;
          auVar312._24_4_ = fVar154 * fVar257;
          auVar312._28_4_ = 0;
          auVar32 = vsubps_avx(auVar312,auVar59);
          auVar60._4_4_ = fVar293 * fVar157;
          auVar60._0_4_ = fVar292 * fVar155;
          auVar60._8_4_ = fVar294 * fVar170;
          auVar60._12_4_ = fVar295 * fVar171;
          auVar60._16_4_ = fVar303 * fVar174;
          auVar60._20_4_ = fVar304 * fVar176;
          auVar60._24_4_ = fVar322 * fVar257;
          auVar60._28_4_ = auVar200._28_4_;
          auVar61._4_4_ = fVar319 * fVar268;
          auVar61._0_4_ = fVar242 * fVar227;
          auVar61._8_4_ = fVar320 * fVar175;
          auVar61._12_4_ = fVar177 * fVar307;
          auVar61._16_4_ = fVar254 * fVar253;
          auVar61._20_4_ = fVar130 * fVar284;
          auVar61._24_4_ = fVar296 * fVar193;
          auVar61._28_4_ = auVar33._28_4_;
          auVar31 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar231 * fVar268;
          auVar62._0_4_ = fVar156 * fVar227;
          auVar62._8_4_ = fVar230 * fVar175;
          auVar62._12_4_ = fVar256 * fVar307;
          auVar62._16_4_ = fVar152 * fVar253;
          auVar62._20_4_ = fVar153 * fVar284;
          auVar62._24_4_ = fVar154 * fVar193;
          auVar62._28_4_ = auVar163._28_4_;
          auVar63._4_4_ = fVar293 * fVar318;
          auVar63._0_4_ = fVar292 * fVar258;
          auVar63._8_4_ = fVar294 * fVar173;
          auVar63._12_4_ = fVar295 * fVar172;
          auVar63._16_4_ = fVar303 * fVar309;
          auVar63._20_4_ = fVar304 * fVar255;
          auVar63._24_4_ = fVar322 * fVar150;
          auVar63._28_4_ = auVar276._28_4_;
          auVar266 = vsubps_avx(auVar63,auVar62);
          auVar265._0_4_ = auVar32._0_4_ * 0.0 + auVar266._0_4_ + auVar31._0_4_ * 0.0;
          auVar265._4_4_ = auVar32._4_4_ * 0.0 + auVar266._4_4_ + auVar31._4_4_ * 0.0;
          auVar265._8_4_ = auVar32._8_4_ * 0.0 + auVar266._8_4_ + auVar31._8_4_ * 0.0;
          auVar265._12_4_ = auVar32._12_4_ * 0.0 + auVar266._12_4_ + auVar31._12_4_ * 0.0;
          auVar265._16_4_ = auVar32._16_4_ * 0.0 + auVar266._16_4_ + auVar31._16_4_ * 0.0;
          auVar265._20_4_ = auVar32._20_4_ * 0.0 + auVar266._20_4_ + auVar31._20_4_ * 0.0;
          auVar265._24_4_ = auVar32._24_4_ * 0.0 + auVar266._24_4_ + auVar31._24_4_ * 0.0;
          auVar265._28_4_ = auVar276._28_4_ + auVar266._28_4_ + auVar163._28_4_;
          auVar30 = vrcpps_avx(auVar265);
          fVar227 = auVar30._0_4_;
          fVar242 = auVar30._4_4_;
          auVar64._4_4_ = auVar265._4_4_ * fVar242;
          auVar64._0_4_ = auVar265._0_4_ * fVar227;
          fVar318 = auVar30._8_4_;
          auVar64._8_4_ = auVar265._8_4_ * fVar318;
          fVar268 = auVar30._12_4_;
          auVar64._12_4_ = auVar265._12_4_ * fVar268;
          fVar319 = auVar30._16_4_;
          auVar64._16_4_ = auVar265._16_4_ * fVar319;
          fVar173 = auVar30._20_4_;
          auVar64._20_4_ = auVar265._20_4_ * fVar173;
          fVar175 = auVar30._24_4_;
          auVar64._24_4_ = auVar265._24_4_ * fVar175;
          auVar64._28_4_ = auVar33._28_4_;
          auVar313._8_4_ = 0x3f800000;
          auVar313._0_8_ = 0x3f8000003f800000;
          auVar313._12_4_ = 0x3f800000;
          auVar313._16_4_ = 0x3f800000;
          auVar313._20_4_ = 0x3f800000;
          auVar313._24_4_ = 0x3f800000;
          auVar313._28_4_ = 0x3f800000;
          auVar200 = vsubps_avx(auVar313,auVar64);
          fVar227 = auVar200._0_4_ * fVar227 + fVar227;
          fVar242 = auVar200._4_4_ * fVar242 + fVar242;
          fVar318 = auVar200._8_4_ * fVar318 + fVar318;
          fVar268 = auVar200._12_4_ * fVar268 + fVar268;
          fVar319 = auVar200._16_4_ * fVar319 + fVar319;
          fVar173 = auVar200._20_4_ * fVar173 + fVar173;
          fVar175 = auVar200._24_4_ * fVar175 + fVar175;
          auVar65._4_4_ =
               (auVar32._4_4_ * fVar208 + auVar31._4_4_ * fVar191 + auVar266._4_4_ * fVar195) *
               fVar242;
          auVar65._0_4_ =
               (auVar32._0_4_ * fVar209 + auVar31._0_4_ * fVar317 + auVar266._0_4_ * fVar192) *
               fVar227;
          auVar65._8_4_ =
               (auVar32._8_4_ * fVar269 + auVar31._8_4_ * fVar211 + auVar266._8_4_ * fVar207) *
               fVar318;
          auVar65._12_4_ =
               (auVar32._12_4_ * fVar305 + auVar31._12_4_ * fVar306 + auVar266._12_4_ * fVar210) *
               fVar268;
          auVar65._16_4_ =
               (auVar32._16_4_ * fVar252 + auVar31._16_4_ * fVar308 + auVar266._16_4_ * fVar213) *
               fVar319;
          auVar65._20_4_ =
               (auVar32._20_4_ * fVar216 + auVar31._20_4_ * fVar282 + auVar266._20_4_ * fVar214) *
               fVar173;
          auVar65._24_4_ =
               (auVar32._24_4_ * fVar178 + auVar31._24_4_ * fVar151 + auVar266._24_4_ * fVar215) *
               fVar175;
          auVar65._28_4_ = auVar35._28_4_ + auVar143._28_4_;
          auVar186 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar142._16_16_ = auVar186;
          auVar142._0_16_ = auVar186;
          auVar143 = vcmpps_avx(auVar142,auVar65,2);
          fVar258 = (ray->super_RayK<1>).tfar;
          auVar203._4_4_ = fVar258;
          auVar203._0_4_ = fVar258;
          auVar203._8_4_ = fVar258;
          auVar203._12_4_ = fVar258;
          auVar203._16_4_ = fVar258;
          auVar203._20_4_ = fVar258;
          auVar203._24_4_ = fVar258;
          auVar203._28_4_ = fVar258;
          auVar32 = vcmpps_avx(auVar65,auVar203,2);
          auVar143 = vandps_avx(auVar32,auVar143);
          auVar186 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
          auVar236 = vpand_avx(auVar236,auVar186);
          auVar186 = vpmovsxwd_avx(auVar236);
          auVar222 = vpshufd_avx(auVar236,0xee);
          auVar222 = vpmovsxwd_avx(auVar222);
          auVar202._16_16_ = auVar222;
          auVar202._0_16_ = auVar186;
          if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar202 >> 0x7f,0) == '\0') &&
                (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar222 >> 0x3f,0) == '\0') &&
              (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar222[0xf]) goto LAB_00f73863;
          auVar143 = vcmpps_avx(ZEXT832(0) << 0x20,auVar265,4);
          auVar186 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
          auVar236 = vpand_avx(auVar236,auVar186);
          auVar186 = vpmovsxwd_avx(auVar236);
          auVar205 = ZEXT1664(auVar186);
          auVar236 = vpunpckhwd_avx(auVar236,auVar236);
          auVar249._16_16_ = auVar236;
          auVar249._0_16_ = auVar186;
          auVar169 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                        CONCAT816(local_4c0[1]._16_8_,
                                                  CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))))
          ;
          auVar149 = ZEXT3264(local_4e0);
          if ((((((((auVar249 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar249 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar249 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar249 >> 0x7f,0) != '\0') ||
                (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar236 >> 0x3f,0) != '\0') ||
              (auVar249 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar236[0xf] < '\0') {
            auVar66._4_4_ = auVar163._4_4_ * fVar242;
            auVar66._0_4_ = auVar163._0_4_ * fVar227;
            auVar66._8_4_ = auVar163._8_4_ * fVar318;
            auVar66._12_4_ = auVar163._12_4_ * fVar268;
            auVar66._16_4_ = auVar163._16_4_ * fVar319;
            auVar66._20_4_ = auVar163._20_4_ * fVar173;
            auVar66._24_4_ = auVar163._24_4_ * fVar175;
            auVar66._28_4_ = SUB84(local_4c0[1]._24_8_,4);
            auVar67._4_4_ = auVar224._4_4_ * fVar242;
            auVar67._0_4_ = auVar224._0_4_ * fVar227;
            auVar67._8_4_ = auVar224._8_4_ * fVar318;
            auVar67._12_4_ = auVar224._12_4_ * fVar268;
            auVar67._16_4_ = auVar224._16_4_ * fVar319;
            auVar67._20_4_ = auVar224._20_4_ * fVar173;
            auVar67._24_4_ = auVar224._24_4_ * fVar175;
            auVar67._28_4_ = auVar200._28_4_ + auVar30._28_4_;
            auVar225._8_4_ = 0x3f800000;
            auVar225._0_8_ = 0x3f8000003f800000;
            auVar225._12_4_ = 0x3f800000;
            auVar225._16_4_ = 0x3f800000;
            auVar225._20_4_ = 0x3f800000;
            auVar225._24_4_ = 0x3f800000;
            auVar225._28_4_ = 0x3f800000;
            auVar143 = vsubps_avx(auVar225,auVar66);
            auVar205 = ZEXT3264(auVar143);
            auVar143 = vblendvps_avx(auVar143,auVar66,auVar201);
            auVar149 = ZEXT3264(auVar143);
            auVar143 = vsubps_avx(auVar225,auVar67);
            _local_380 = vblendvps_avx(auVar143,auVar67,auVar201);
            auVar169 = ZEXT3264(auVar249);
            local_480 = auVar65;
          }
        }
        auVar301 = ZEXT3264(auVar298);
        auVar266 = auVar149._0_32_;
        auVar143 = auVar169._0_32_;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar143 >> 0x7f,0) != '\0') ||
              (auVar169 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar143 >> 0xbf,0) != '\0') ||
            (auVar169 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar169[0x1f] < '\0') {
          auVar32 = vsubps_avx(local_580,_local_7c0);
          local_7c0._0_4_ = (float)local_7c0._0_4_ + auVar32._0_4_ * auVar149._0_4_;
          local_7c0._4_4_ = (float)local_7c0._4_4_ + auVar32._4_4_ * auVar149._4_4_;
          fStack_7b8 = fStack_7b8 + auVar32._8_4_ * auVar149._8_4_;
          fStack_7b4 = fStack_7b4 + auVar32._12_4_ * auVar149._12_4_;
          fStack_7b0 = fStack_7b0 + auVar32._16_4_ * auVar149._16_4_;
          fStack_7ac = fStack_7ac + auVar32._20_4_ * auVar149._20_4_;
          fStack_7a8 = fStack_7a8 + auVar32._24_4_ * auVar149._24_4_;
          fStack_7a4 = fStack_7a4 + auVar32._28_4_;
          fVar258 = local_778->depth_scale;
          auVar68._4_4_ = ((float)local_7c0._4_4_ + (float)local_7c0._4_4_) * fVar258;
          auVar68._0_4_ = ((float)local_7c0._0_4_ + (float)local_7c0._0_4_) * fVar258;
          auVar68._8_4_ = (fStack_7b8 + fStack_7b8) * fVar258;
          auVar68._12_4_ = (fStack_7b4 + fStack_7b4) * fVar258;
          auVar68._16_4_ = (fStack_7b0 + fStack_7b0) * fVar258;
          auVar68._20_4_ = (fStack_7ac + fStack_7ac) * fVar258;
          auVar68._24_4_ = (fStack_7a8 + fStack_7a8) * fVar258;
          auVar68._28_4_ = fStack_7a4 + fStack_7a4;
          auVar32 = vcmpps_avx(local_480,auVar68,6);
          auVar30 = auVar143 & auVar32;
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            auVar205 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_380._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
            local_380._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
            fStack_378 = fStack_378 + fStack_378 + -1.0;
            fStack_374 = fStack_374 + fStack_374 + -1.0;
            uStack_370._0_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
            uStack_370._4_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
            uStack_368._0_4_ = (float)uStack_368 + (float)uStack_368 + -1.0;
            uStack_368._4_4_ = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
            local_280 = auVar266;
            auVar30 = _local_380;
            local_260._4_4_ = local_380._4_4_;
            local_260._0_4_ = local_380._0_4_;
            fStack_258 = fStack_378;
            fStack_254 = fStack_374;
            fStack_250 = (float)uStack_370;
            fStack_24c = uStack_370._4_4_;
            fStack_248 = (float)uStack_368;
            fStack_244 = uStack_368._4_4_;
            local_240 = local_480;
            local_220 = 0;
            local_21c = uVar15;
            uStack_788 = auVar275._8_8_;
            local_210 = auVar275._0_8_;
            uStack_208 = uStack_788;
            uStack_6f8 = auVar334._8_8_;
            local_200 = auVar334._0_8_;
            uStack_1f8 = uStack_6f8;
            local_1f0 = local_710;
            uStack_1e8 = uStack_708;
            uStack_6e8 = auVar342._8_8_;
            local_1e0._8_8_ = uStack_6e8;
            local_1e0._0_8_ = auVar342._0_8_;
            _local_380 = auVar30;
            if ((pGVar129->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar143 = vandps_avx(auVar32,auVar143);
              local_4c0[0] = auVar143;
              auVar183._0_4_ = 1.0 / local_3e0;
              auVar183._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar236 = vshufps_avx(auVar183,auVar183,0);
              local_1a0[0] = auVar236._0_4_ * (auVar149._0_4_ + 0.0);
              local_1a0[1] = auVar236._4_4_ * (auVar149._4_4_ + 1.0);
              local_1a0[2] = auVar236._8_4_ * (auVar149._8_4_ + 2.0);
              local_1a0[3] = auVar236._12_4_ * (auVar149._12_4_ + 3.0);
              fStack_190 = auVar236._0_4_ * (auVar149._16_4_ + 4.0);
              fStack_18c = auVar236._4_4_ * (auVar149._20_4_ + 5.0);
              fStack_188 = auVar236._8_4_ * (auVar149._24_4_ + 6.0);
              fStack_184 = auVar149._28_4_ + 7.0;
              uStack_368 = auVar30._24_8_;
              local_180._16_8_ = uStack_370;
              local_180._0_16_ = _local_380;
              local_180._24_8_ = uStack_368;
              local_160 = local_480;
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar164,local_480,auVar143);
              auVar30 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar30 = vminps_avx(auVar32,auVar30);
              auVar31 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar31 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar32 = vcmpps_avx(auVar32,auVar30,0);
              auVar30 = auVar143 & auVar32;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar143 = vandps_avx(auVar32,auVar143);
              }
              uVar122 = vmovmskps_avx(auVar143);
              uVar20 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar124 = (ulong)uVar20;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar129->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                _local_7c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_4e0 = auVar266;
                _local_2e0 = auVar148;
                do {
                  local_664 = local_1a0[uVar124];
                  local_660 = *(undefined4 *)(local_180 + uVar124 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar124 * 4);
                  local_770.context = context->user;
                  fVar243 = 1.0 - local_664;
                  fVar258 = local_664 * fVar243 + local_664 * fVar243;
                  auVar236 = ZEXT416((uint)(local_664 * local_664 * 3.0));
                  auVar236 = vshufps_avx(auVar236,auVar236,0);
                  auVar186 = ZEXT416((uint)((fVar258 - local_664 * local_664) * 3.0));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  auVar222 = ZEXT416((uint)((fVar243 * fVar243 - fVar258) * 3.0));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar198 = ZEXT416((uint)(fVar243 * fVar243 * -3.0));
                  auVar198 = vshufps_avx(auVar198,auVar198,0);
                  auVar189._0_4_ =
                       auVar198._0_4_ * (float)local_790._0_4_ +
                       auVar222._0_4_ * (float)local_700._0_4_ +
                       auVar236._0_4_ * (float)local_6f0._0_4_ +
                       auVar186._0_4_ * (float)local_710._0_4_;
                  auVar189._4_4_ =
                       auVar198._4_4_ * (float)local_790._4_4_ +
                       auVar222._4_4_ * (float)local_700._4_4_ +
                       auVar236._4_4_ * (float)local_6f0._4_4_ +
                       auVar186._4_4_ * (float)local_710._4_4_;
                  auVar189._8_4_ =
                       auVar198._8_4_ * (float)uStack_788 +
                       auVar222._8_4_ * (float)uStack_6f8 +
                       auVar236._8_4_ * (float)uStack_6e8 + auVar186._8_4_ * (float)uStack_708;
                  auVar189._12_4_ =
                       auVar198._12_4_ * uStack_788._4_4_ +
                       auVar222._12_4_ * uStack_6f8._4_4_ +
                       auVar236._12_4_ * uStack_6e8._4_4_ + auVar186._12_4_ * uStack_708._4_4_;
                  local_670 = vmovlps_avx(auVar189);
                  local_668 = vextractps_avx(auVar189,2);
                  local_65c = (int)local_7c8;
                  local_658 = (int)local_7d0;
                  local_654 = (local_770.context)->instID[0];
                  local_650 = (local_770.context)->instPrimID[0];
                  local_7d4 = -1;
                  local_770.valid = &local_7d4;
                  local_770.geometryUserPtr = pGVar129->userPtr;
                  local_770.ray = (RTCRayN *)ray;
                  local_770.hit = (RTCHitN *)&local_670;
                  local_770.N = 1;
                  if (pGVar129->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f73a70:
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar129->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var19)(&local_770);
                      auVar301 = ZEXT3264(_local_640);
                      auVar149 = ZEXT3264(local_4e0);
                      fVar321 = (float)local_740._0_4_;
                      fVar326 = (float)local_740._4_4_;
                      fVar328 = fStack_738;
                      fVar330 = fStack_734;
                      fVar206 = fStack_730;
                      fVar212 = fStack_72c;
                      fVar217 = fStack_728;
                      fVar228 = fStack_724;
                      fVar271 = (float)local_6c0._0_4_;
                      fVar280 = (float)local_6c0._4_4_;
                      fVar281 = fStack_6b8;
                      fVar283 = fStack_6b4;
                      fVar229 = fStack_6b0;
                      fVar232 = fStack_6ac;
                      fVar238 = fStack_6a8;
                      fVar240 = fStack_6a4;
                      if (*local_770.valid == 0) goto LAB_00f73b32;
                    }
                    (((Vec3f *)((long)local_770.ray + 0x30))->field_0).components[0] =
                         *(float *)local_770.hit;
                    (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_770.hit + 4);
                    (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_770.hit + 8);
                    *(float *)((long)local_770.ray + 0x3c) = *(float *)(local_770.hit + 0xc);
                    *(float *)((long)local_770.ray + 0x40) = *(float *)(local_770.hit + 0x10);
                    *(float *)((long)local_770.ray + 0x44) = *(float *)(local_770.hit + 0x14);
                    *(float *)((long)local_770.ray + 0x48) = *(float *)(local_770.hit + 0x18);
                    *(float *)((long)local_770.ray + 0x4c) = *(float *)(local_770.hit + 0x1c);
                    *(float *)((long)local_770.ray + 0x50) = *(float *)(local_770.hit + 0x20);
                  }
                  else {
                    (*pGVar129->intersectionFilterN)(&local_770);
                    auVar301 = ZEXT3264(_local_640);
                    auVar149 = ZEXT3264(local_4e0);
                    fVar321 = (float)local_740._0_4_;
                    fVar326 = (float)local_740._4_4_;
                    fVar328 = fStack_738;
                    fVar330 = fStack_734;
                    fVar206 = fStack_730;
                    fVar212 = fStack_72c;
                    fVar217 = fStack_728;
                    fVar228 = fStack_724;
                    fVar271 = (float)local_6c0._0_4_;
                    fVar280 = (float)local_6c0._4_4_;
                    fVar281 = fStack_6b8;
                    fVar283 = fStack_6b4;
                    fVar229 = fStack_6b0;
                    fVar232 = fStack_6ac;
                    fVar238 = fStack_6a8;
                    fVar240 = fStack_6a4;
                    if (*local_770.valid != 0) goto LAB_00f73a70;
LAB_00f73b32:
                    (ray->super_RayK<1>).tfar = (float)local_7c0._0_4_;
                  }
                  auVar298 = auVar301._0_32_;
                  *(undefined4 *)(local_4c0[0] + uVar124 * 4) = 0;
                  auVar30 = local_4c0[0];
                  _local_7c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  auVar205 = ZEXT3264(_local_7c0);
                  fVar258 = (ray->super_RayK<1>).tfar;
                  auVar148._4_4_ = fVar258;
                  auVar148._0_4_ = fVar258;
                  auVar148._8_4_ = fVar258;
                  auVar148._12_4_ = fVar258;
                  auVar148._16_4_ = fVar258;
                  auVar148._20_4_ = fVar258;
                  auVar148._24_4_ = fVar258;
                  auVar148._28_4_ = fVar258;
                  auVar32 = vcmpps_avx(local_480,auVar148,2);
                  auVar143 = vandps_avx(auVar32,local_4c0[0]);
                  local_4c0[0] = auVar143;
                  auVar30 = auVar30 & auVar32;
                  prim = local_780;
                  auVar266 = auVar149._0_32_;
                  fVar233 = (float)local_6a0._0_4_;
                  fVar239 = (float)local_6a0._4_4_;
                  fVar241 = fStack_698;
                  fVar131 = fStack_694;
                  fVar243 = fStack_690;
                  fVar251 = fStack_68c;
                  fVar194 = fStack_688;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar30 >> 0x7f,0) == '\0') &&
                        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar30 >> 0xbf,0) == '\0') &&
                      (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar30[0x1f]) goto LAB_00f728e3;
                  auVar168._8_4_ = 0x7f800000;
                  auVar168._0_8_ = 0x7f8000007f800000;
                  auVar168._12_4_ = 0x7f800000;
                  auVar168._16_4_ = 0x7f800000;
                  auVar168._20_4_ = 0x7f800000;
                  auVar168._24_4_ = 0x7f800000;
                  auVar168._28_4_ = 0x7f800000;
                  auVar32 = vblendvps_avx(auVar168,local_480,auVar143);
                  auVar30 = vshufps_avx(auVar32,auVar32,0xb1);
                  auVar30 = vminps_avx(auVar32,auVar30);
                  auVar31 = vshufpd_avx(auVar30,auVar30,5);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar32 = vcmpps_avx(auVar32,auVar30,0);
                  auVar30 = auVar143 & auVar32;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar30 >> 0x7f,0) != '\0') ||
                        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar30 >> 0xbf,0) != '\0') ||
                      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar30[0x1f] < '\0') {
                    auVar143 = vandps_avx(auVar32,auVar143);
                  }
                  uVar123 = vmovmskps_avx(auVar143);
                  uVar125 = 0;
                  if (uVar123 != 0) {
                    for (; (uVar123 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                    }
                  }
                  uVar124 = (ulong)uVar125;
                } while( true );
              }
              fVar258 = local_1a0[uVar124];
              fVar317 = *(float *)(local_180 + uVar124 * 4);
              fVar227 = 1.0 - fVar258;
              fVar209 = fVar258 * fVar227 + fVar258 * fVar227;
              auVar236 = ZEXT416((uint)(fVar258 * fVar258 * 3.0));
              auVar236 = vshufps_avx(auVar236,auVar236,0);
              auVar186 = ZEXT416((uint)((fVar209 - fVar258 * fVar258) * 3.0));
              auVar186 = vshufps_avx(auVar186,auVar186,0);
              auVar222 = ZEXT416((uint)((fVar227 * fVar227 - fVar209) * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar198 = ZEXT416((uint)(fVar227 * fVar227 * -3.0));
              auVar198 = vshufps_avx(auVar198,auVar198,0);
              auVar184._0_4_ =
                   auVar198._0_4_ * fVar270 +
                   auVar222._0_4_ * fVar332 +
                   auVar236._0_4_ * fVar340 + auVar186._0_4_ * (float)local_710._0_4_;
              auVar184._4_4_ =
                   auVar198._4_4_ * fVar279 +
                   auVar222._4_4_ * fVar336 +
                   auVar236._4_4_ * fVar345 + auVar186._4_4_ * (float)local_710._4_4_;
              auVar184._8_4_ =
                   auVar198._8_4_ * auVar275._8_4_ +
                   auVar222._8_4_ * auVar334._8_4_ +
                   auVar236._8_4_ * auVar342._8_4_ + auVar186._8_4_ * (float)uStack_708;
              auVar184._12_4_ =
                   auVar198._12_4_ * auVar275._12_4_ +
                   auVar222._12_4_ * auVar334._12_4_ +
                   auVar236._12_4_ * auVar342._12_4_ + auVar186._12_4_ * uStack_708._4_4_;
              auVar205 = ZEXT464((uint)*(float *)(local_160 + uVar124 * 4));
              (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar124 * 4);
              uVar12 = vmovlps_avx(auVar184);
              *(undefined8 *)&(ray->Ng).field_0 = uVar12;
              fVar209 = (float)vextractps_avx(auVar184,2);
              (ray->Ng).field_0.field_0.z = fVar209;
              ray->u = fVar258;
              ray->v = fVar317;
              ray->primID = uVar123;
              ray->geomID = uVar125;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_780;
            }
          }
        }
      }
LAB_00f728e3:
      local_4e0 = auVar266;
      auVar169 = ZEXT1664(local_6e0._0_16_);
      if (8 < (int)uVar15) {
        _local_640 = auVar298;
        _local_460 = vpshufd_avx(ZEXT416(uVar15),0);
        auVar236 = vshufps_avx(local_6e0._0_16_,local_6e0._0_16_,0);
        local_340._16_16_ = auVar236;
        local_340._0_16_ = auVar236;
        auVar236 = vpermilps_avx(local_3c0._0_16_,0xff);
        register0x00001210 = auVar236;
        _local_360 = auVar236;
        auVar137._0_4_ = 1.0 / local_3e0;
        auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar236 = vshufps_avx(auVar137,auVar137,0);
        register0x00001210 = auVar236;
        _local_e0 = auVar236;
        auVar149 = ZEXT3264(_local_e0);
        lVar128 = 8;
        fVar258 = (float)local_600._0_4_;
        fVar317 = (float)local_600._4_4_;
        fVar209 = fStack_5f8;
        fVar227 = fStack_5f4;
        fVar242 = fStack_5f0;
        fVar318 = fStack_5ec;
        fVar191 = fStack_5e8;
        fVar208 = fStack_5e4;
        fVar268 = (float)local_5c0._0_4_;
        fVar319 = (float)local_5c0._4_4_;
        fVar173 = fStack_5b8;
        fVar211 = fStack_5b4;
        fVar269 = fStack_5b0;
        fVar175 = fStack_5ac;
        fVar320 = fStack_5a8;
LAB_00f729c9:
        pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar128 * 4 + lVar21);
        fVar172 = *(float *)*pauVar9;
        fVar306 = *(float *)(*pauVar9 + 4);
        fVar305 = *(float *)(*pauVar9 + 8);
        fVar307 = *(float *)(*pauVar9 + 0xc);
        fVar177 = *(float *)(*pauVar9 + 0x10);
        fVar309 = *(float *)(*pauVar9 + 0x14);
        fVar308 = *(float *)(*pauVar9 + 0x18);
        auVar118 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21aa768 + lVar128 * 4);
        fVar252 = *(float *)*pauVar9;
        fVar253 = *(float *)(*pauVar9 + 4);
        fVar254 = *(float *)(*pauVar9 + 8);
        fVar255 = *(float *)(*pauVar9 + 0xc);
        fVar282 = *(float *)(*pauVar9 + 0x10);
        fVar216 = *(float *)(*pauVar9 + 0x14);
        fVar284 = *(float *)(*pauVar9 + 0x18);
        auVar117 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21aabec + lVar128 * 4);
        fVar130 = *(float *)*pauVar9;
        fVar150 = *(float *)(*pauVar9 + 4);
        fVar151 = *(float *)(*pauVar9 + 8);
        fVar178 = *(float *)(*pauVar9 + 0xc);
        fVar193 = *(float *)(*pauVar9 + 0x10);
        fVar296 = *(float *)(*pauVar9 + 0x14);
        fVar192 = *(float *)(*pauVar9 + 0x18);
        auVar116 = *pauVar9;
        pfVar1 = (float *)(lVar21 + 0x21ab070 + lVar128 * 4);
        fVar195 = *pfVar1;
        fVar207 = pfVar1[1];
        fVar210 = pfVar1[2];
        fVar213 = pfVar1[3];
        fVar214 = pfVar1[4];
        fVar215 = pfVar1[5];
        fVar156 = pfVar1[6];
        fVar231 = auVar205._28_4_;
        fStack_7a4 = fVar231 + fVar231 + auVar149._28_4_;
        fVar230 = fVar231 + fVar231 + pfVar1[7];
        auVar289._0_4_ =
             (float)local_420._0_4_ * fVar172 +
             fVar321 * fVar252 + fVar268 * fVar130 + (float)local_440._0_4_ * fVar195;
        auVar289._4_4_ =
             (float)local_420._4_4_ * fVar306 +
             fVar326 * fVar253 + fVar319 * fVar150 + (float)local_440._4_4_ * fVar207;
        auVar289._8_4_ =
             fStack_418 * fVar305 + fVar328 * fVar254 + fVar173 * fVar151 + fStack_438 * fVar210;
        auVar289._12_4_ =
             fStack_414 * fVar307 + fVar330 * fVar255 + fVar211 * fVar178 + fStack_434 * fVar213;
        auVar289._16_4_ =
             fStack_410 * fVar177 + fVar206 * fVar282 + fVar269 * fVar193 + fStack_430 * fVar214;
        auVar289._20_4_ =
             fStack_40c * fVar309 + fVar212 * fVar216 + fVar175 * fVar296 + fStack_42c * fVar215;
        auVar289._24_4_ =
             fStack_408 * fVar308 + fVar217 * fVar284 + fVar320 * fVar192 + fStack_428 * fVar156;
        auVar289._28_4_ = fVar231 + pfVar1[7] + fStack_7a4;
        local_6e0._0_4_ =
             (float)local_320._0_4_ * fVar172 +
             fVar233 * fVar252 + fVar271 * fVar130 + fVar258 * fVar195;
        local_6e0._4_4_ =
             (float)local_320._4_4_ * fVar306 +
             fVar239 * fVar253 + fVar280 * fVar150 + fVar317 * fVar207;
        local_6e0._8_4_ =
             fStack_318 * fVar305 + fVar241 * fVar254 + fVar281 * fVar151 + fVar209 * fVar210;
        local_6e0._12_4_ =
             fStack_314 * fVar307 + fVar131 * fVar255 + fVar283 * fVar178 + fVar227 * fVar213;
        local_6e0._16_4_ =
             fStack_310 * fVar177 + fVar243 * fVar282 + fVar229 * fVar193 + fVar242 * fVar214;
        local_6e0._20_4_ =
             fStack_30c * fVar309 + fVar251 * fVar216 + fVar232 * fVar296 + fVar318 * fVar215;
        local_6e0._24_4_ =
             fStack_308 * fVar308 + fVar194 * fVar284 + fVar238 * fVar192 + fVar191 * fVar156;
        local_6e0._28_4_ = fStack_7a4 + fVar231 + fVar231 + auVar169._28_4_;
        local_7c0._0_4_ =
             fVar172 * (float)local_120._0_4_ +
             (float)local_a0._0_4_ * fVar252 +
             fVar130 * (float)local_100._0_4_ + (float)local_80._0_4_ * fVar195;
        local_7c0._4_4_ =
             fVar306 * (float)local_120._4_4_ +
             (float)local_a0._4_4_ * fVar253 +
             fVar150 * (float)local_100._4_4_ + (float)local_80._4_4_ * fVar207;
        fStack_7b8 = fVar305 * fStack_118 +
                     fStack_98 * fVar254 + fVar151 * fStack_f8 + fStack_78 * fVar210;
        fStack_7b4 = fVar307 * fStack_114 +
                     fStack_94 * fVar255 + fVar178 * fStack_f4 + fStack_74 * fVar213;
        fStack_7b0 = fVar177 * fStack_110 +
                     fStack_90 * fVar282 + fVar193 * fStack_f0 + fStack_70 * fVar214;
        fStack_7ac = fVar309 * fStack_10c +
                     fStack_8c * fVar216 + fVar296 * fStack_ec + fStack_6c * fVar215;
        fStack_7a8 = fVar308 * fStack_108 +
                     fStack_88 * fVar284 + fVar192 * fStack_e8 + fStack_68 * fVar156;
        fStack_7a4 = fStack_7a4 + fVar230;
        pauVar9 = (undefined1 (*) [28])(bezier_basis1 + lVar128 * 4 + lVar21);
        fVar268 = *(float *)*pauVar9;
        fVar319 = *(float *)(*pauVar9 + 4);
        fVar173 = *(float *)(*pauVar9 + 8);
        fVar211 = *(float *)(*pauVar9 + 0xc);
        fVar269 = *(float *)(*pauVar9 + 0x10);
        fVar175 = *(float *)(*pauVar9 + 0x14);
        fVar320 = *(float *)(*pauVar9 + 0x18);
        auVar120 = *pauVar9;
        pfVar1 = (float *)(lVar21 + 0x21acb88 + lVar128 * 4);
        fVar172 = *pfVar1;
        fVar306 = pfVar1[1];
        fVar305 = pfVar1[2];
        fVar307 = pfVar1[3];
        fVar177 = pfVar1[4];
        fVar309 = pfVar1[5];
        fVar308 = pfVar1[6];
        auVar143 = *(undefined1 (*) [32])(lVar21 + 0x21ad00c + lVar128 * 4);
        pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21ad490 + lVar128 * 4);
        fVar252 = *(float *)*pauVar9;
        fVar253 = *(float *)(*pauVar9 + 4);
        fVar254 = *(float *)(*pauVar9 + 8);
        fVar255 = *(float *)(*pauVar9 + 0xc);
        fVar282 = *(float *)(*pauVar9 + 0x10);
        fVar216 = *(float *)(*pauVar9 + 0x14);
        fVar284 = *(float *)(*pauVar9 + 0x18);
        auVar119 = *pauVar9;
        auVar149 = ZEXT3264(auVar143);
        fVar130 = auVar143._0_4_;
        fVar150 = auVar143._4_4_;
        fVar151 = auVar143._8_4_;
        fVar178 = auVar143._12_4_;
        fVar193 = auVar143._16_4_;
        fVar296 = auVar143._20_4_;
        fVar192 = auVar143._24_4_;
        fVar256 = fVar208 + fStack_64;
        fVar231 = fVar208 + fVar208 + fVar230;
        auVar314._0_4_ =
             (float)local_420._0_4_ * fVar268 +
             fVar321 * fVar172 + fVar130 * (float)local_5c0._0_4_ + (float)local_440._0_4_ * fVar252
        ;
        auVar314._4_4_ =
             (float)local_420._4_4_ * fVar319 +
             fVar326 * fVar306 + fVar150 * (float)local_5c0._4_4_ + (float)local_440._4_4_ * fVar253
        ;
        auVar314._8_4_ =
             fStack_418 * fVar173 + fVar328 * fVar305 + fVar151 * fStack_5b8 + fStack_438 * fVar254;
        auVar314._12_4_ =
             fStack_414 * fVar211 + fVar330 * fVar307 + fVar178 * fStack_5b4 + fStack_434 * fVar255;
        auVar314._16_4_ =
             fStack_410 * fVar269 + fVar206 * fVar177 + fVar193 * fStack_5b0 + fStack_430 * fVar282;
        auVar314._20_4_ =
             fStack_40c * fVar175 + fVar212 * fVar309 + fVar296 * fStack_5ac + fStack_42c * fVar216;
        auVar314._24_4_ =
             fStack_408 * fVar320 + fVar217 * fVar308 + fVar192 * fStack_5a8 + fStack_428 * fVar284;
        auVar314._28_4_ = fVar256 + fVar231;
        local_3c0._0_4_ =
             fVar268 * (float)local_320._0_4_ +
             fVar233 * fVar172 + fVar271 * fVar130 + fVar258 * fVar252;
        local_3c0._4_4_ =
             fVar319 * (float)local_320._4_4_ +
             fVar239 * fVar306 + fVar280 * fVar150 + fVar317 * fVar253;
        local_3c0._8_4_ =
             fVar173 * fStack_318 + fVar241 * fVar305 + fVar281 * fVar151 + fVar209 * fVar254;
        local_3c0._12_4_ =
             fVar211 * fStack_314 + fVar131 * fVar307 + fVar283 * fVar178 + fVar227 * fVar255;
        local_3c0._16_4_ =
             fVar269 * fStack_310 + fVar243 * fVar177 + fVar229 * fVar193 + fVar242 * fVar282;
        local_3c0._20_4_ =
             fVar175 * fStack_30c + fVar251 * fVar309 + fVar232 * fVar296 + fVar318 * fVar216;
        local_3c0._24_4_ =
             fVar320 * fStack_308 + fVar194 * fVar308 + fVar238 * fVar192 + fVar191 * fVar284;
        local_3c0._28_4_ = fVar231 + fVar208 + fVar208 + fVar228;
        auVar267._0_4_ =
             (float)local_a0._0_4_ * fVar172 +
             fVar130 * (float)local_100._0_4_ + (float)local_80._0_4_ * fVar252 +
             fVar268 * (float)local_120._0_4_;
        auVar267._4_4_ =
             (float)local_a0._4_4_ * fVar306 +
             fVar150 * (float)local_100._4_4_ + (float)local_80._4_4_ * fVar253 +
             fVar319 * (float)local_120._4_4_;
        auVar267._8_4_ =
             fStack_98 * fVar305 + fVar151 * fStack_f8 + fStack_78 * fVar254 + fVar173 * fStack_118;
        auVar267._12_4_ =
             fStack_94 * fVar307 + fVar178 * fStack_f4 + fStack_74 * fVar255 + fVar211 * fStack_114;
        auVar267._16_4_ =
             fStack_90 * fVar177 + fVar193 * fStack_f0 + fStack_70 * fVar282 + fVar269 * fStack_110;
        auVar267._20_4_ =
             fStack_8c * fVar309 + fVar296 * fStack_ec + fStack_6c * fVar216 + fVar175 * fStack_10c;
        auVar267._24_4_ =
             fStack_88 * fVar308 + fVar192 * fStack_e8 + fStack_68 * fVar284 + fVar320 * fStack_108;
        auVar267._28_4_ = fVar208 + fVar256 + fVar231;
        auVar30 = vsubps_avx(auVar314,auVar289);
        auVar31 = vsubps_avx(local_3c0,local_6e0);
        fVar212 = auVar30._0_4_;
        fVar217 = auVar30._4_4_;
        auVar69._4_4_ = fVar217 * local_6e0._4_4_;
        auVar69._0_4_ = fVar212 * local_6e0._0_4_;
        fVar227 = auVar30._8_4_;
        auVar69._8_4_ = fVar227 * local_6e0._8_4_;
        fVar228 = auVar30._12_4_;
        auVar69._12_4_ = fVar228 * local_6e0._12_4_;
        fVar242 = auVar30._16_4_;
        auVar69._16_4_ = fVar242 * local_6e0._16_4_;
        fVar318 = auVar30._20_4_;
        auVar69._20_4_ = fVar318 * local_6e0._20_4_;
        fVar191 = auVar30._24_4_;
        auVar69._24_4_ = fVar191 * local_6e0._24_4_;
        auVar69._28_4_ = fVar231;
        fVar258 = auVar31._0_4_;
        fVar243 = auVar31._4_4_;
        auVar70._4_4_ = auVar289._4_4_ * fVar243;
        auVar70._0_4_ = auVar289._0_4_ * fVar258;
        fVar251 = auVar31._8_4_;
        auVar70._8_4_ = auVar289._8_4_ * fVar251;
        fVar317 = auVar31._12_4_;
        auVar70._12_4_ = auVar289._12_4_ * fVar317;
        fVar194 = auVar31._16_4_;
        auVar70._16_4_ = auVar289._16_4_ * fVar194;
        fVar206 = auVar31._20_4_;
        auVar70._20_4_ = auVar289._20_4_ * fVar206;
        fVar209 = auVar31._24_4_;
        auVar70._24_4_ = auVar289._24_4_ * fVar209;
        auVar70._28_4_ = local_3c0._28_4_;
        auVar35 = vsubps_avx(auVar69,auVar70);
        auVar169 = ZEXT3264(_local_7c0);
        auVar32 = vmaxps_avx(_local_7c0,auVar267);
        auVar71._4_4_ = auVar32._4_4_ * auVar32._4_4_ * (fVar217 * fVar217 + fVar243 * fVar243);
        auVar71._0_4_ = auVar32._0_4_ * auVar32._0_4_ * (fVar212 * fVar212 + fVar258 * fVar258);
        auVar71._8_4_ = auVar32._8_4_ * auVar32._8_4_ * (fVar227 * fVar227 + fVar251 * fVar251);
        auVar71._12_4_ = auVar32._12_4_ * auVar32._12_4_ * (fVar228 * fVar228 + fVar317 * fVar317);
        auVar71._16_4_ = auVar32._16_4_ * auVar32._16_4_ * (fVar242 * fVar242 + fVar194 * fVar194);
        auVar71._20_4_ = auVar32._20_4_ * auVar32._20_4_ * (fVar318 * fVar318 + fVar206 * fVar206);
        auVar71._24_4_ = auVar32._24_4_ * auVar32._24_4_ * (fVar191 * fVar191 + fVar209 * fVar209);
        auVar71._28_4_ = fVar256 + local_3c0._28_4_;
        auVar72._4_4_ = auVar35._4_4_ * auVar35._4_4_;
        auVar72._0_4_ = auVar35._0_4_ * auVar35._0_4_;
        auVar72._8_4_ = auVar35._8_4_ * auVar35._8_4_;
        auVar72._12_4_ = auVar35._12_4_ * auVar35._12_4_;
        auVar72._16_4_ = auVar35._16_4_ * auVar35._16_4_;
        auVar72._20_4_ = auVar35._20_4_ * auVar35._20_4_;
        auVar72._24_4_ = auVar35._24_4_ * auVar35._24_4_;
        auVar72._28_4_ = auVar35._28_4_;
        auVar32 = vcmpps_avx(auVar72,auVar71,2);
        local_220 = (uint)lVar128;
        auVar186 = vpshufd_avx(ZEXT416(local_220),0);
        auVar236 = vpor_avx(auVar186,_DAT_01f7fcf0);
        auVar186 = vpor_avx(auVar186,_DAT_01fafea0);
        auVar236 = vpcmpgtd_avx(_local_460,auVar236);
        auVar186 = vpcmpgtd_avx(_local_460,auVar186);
        register0x000012d0 = auVar186;
        _local_2e0 = auVar236;
        auVar205 = ZEXT3264(_local_2e0);
        auVar35 = _local_2e0 & auVar32;
        fVar258 = (float)local_600._0_4_;
        fVar317 = (float)local_600._4_4_;
        fVar209 = fStack_5f8;
        fVar227 = fStack_5f4;
        fVar242 = fStack_5f0;
        fVar318 = fStack_5ec;
        fVar191 = fStack_5e8;
        fVar208 = fStack_5e4;
        fVar268 = (float)local_5c0._0_4_;
        fVar319 = (float)local_5c0._4_4_;
        fVar173 = fStack_5b8;
        fVar211 = fStack_5b4;
        fVar269 = fStack_5b0;
        fVar175 = fStack_5ac;
        fVar320 = fStack_5a8;
        fVar321 = (float)local_740._0_4_;
        fVar326 = (float)local_740._4_4_;
        fVar328 = fStack_738;
        fVar330 = fStack_734;
        fVar206 = fStack_730;
        fVar212 = fStack_72c;
        fVar217 = fStack_728;
        fVar228 = fStack_724;
        if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0x7f,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0xbf,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar35[0x1f] < '\0') {
          local_5a0._0_4_ = auVar120._0_4_;
          local_5a0._4_4_ = auVar120._4_4_;
          fStack_598 = auVar120._8_4_;
          fStack_594 = auVar120._12_4_;
          fStack_590 = auVar120._16_4_;
          fStack_58c = auVar120._20_4_;
          fStack_588 = auVar120._24_4_;
          fVar243 = (float)local_640._0_4_ * (float)local_5a0._0_4_;
          fVar251 = (float)local_640._4_4_ * (float)local_5a0._4_4_;
          fVar194 = fStack_638 * fStack_598;
          fVar252 = fStack_634 * fStack_594;
          fVar253 = fStack_630 * fStack_590;
          fVar254 = fStack_62c * fStack_58c;
          fVar255 = fStack_628 * fStack_588;
          _local_5a0 = auVar267;
          local_560._0_4_ = auVar119._0_4_;
          local_560._4_4_ = auVar119._4_4_;
          fStack_558 = auVar119._8_4_;
          fStack_554 = auVar119._12_4_;
          fStack_550 = auVar119._16_4_;
          fStack_54c = auVar119._20_4_;
          fStack_548 = auVar119._24_4_;
          local_560._0_4_ =
               fVar243 + fVar172 * (float)local_3a0._0_4_ +
                         (float)local_2c0._0_4_ * fVar130 +
                         (float)local_5e0._0_4_ * (float)local_560._0_4_;
          local_560._4_4_ =
               fVar251 + fVar306 * (float)local_3a0._4_4_ +
                         (float)local_2c0._4_4_ * fVar150 +
                         (float)local_5e0._4_4_ * (float)local_560._4_4_;
          fStack_558 = fVar194 + fVar305 * fStack_398 +
                                 fStack_2b8 * fVar151 + fStack_5d8 * fStack_558;
          fStack_554 = fVar252 + fVar307 * fStack_394 +
                                 fStack_2b4 * fVar178 + fStack_5d4 * fStack_554;
          fStack_550 = fVar253 + fVar177 * fStack_390 +
                                 fStack_2b0 * fVar193 + fStack_5d0 * fStack_550;
          fStack_54c = fVar254 + fVar309 * fStack_38c +
                                 fStack_2ac * fVar296 + fStack_5cc * fStack_54c;
          fStack_548 = fVar255 + fVar308 * fStack_388 +
                                 fStack_2a8 * fVar192 + fStack_5c8 * fStack_548;
          fStack_544 = auVar289._28_4_ + auVar143._28_4_ + fStack_624 + 0.0;
          local_520._0_4_ = auVar117._0_4_;
          local_520._4_4_ = auVar117._4_4_;
          fStack_518 = auVar117._8_4_;
          fStack_514 = auVar117._12_4_;
          fStack_510 = auVar117._16_4_;
          fStack_50c = auVar117._20_4_;
          fStack_508 = auVar117._24_4_;
          fVar131 = (float)local_3a0._0_4_ * (float)local_520._0_4_;
          fVar231 = (float)local_3a0._4_4_ * (float)local_520._4_4_;
          fVar230 = fStack_398 * fStack_518;
          fVar256 = fStack_394 * fStack_514;
          fVar152 = fStack_390 * fStack_510;
          fVar153 = fStack_38c * fStack_50c;
          fVar154 = fStack_388 * fStack_508;
          local_540._0_4_ = auVar116._0_4_;
          local_540._4_4_ = auVar116._4_4_;
          fStack_538 = auVar116._8_4_;
          fStack_534 = auVar116._12_4_;
          fStack_530 = auVar116._16_4_;
          fStack_52c = auVar116._20_4_;
          fStack_528 = auVar116._24_4_;
          fVar157 = (float)local_2c0._0_4_ * (float)local_540._0_4_;
          fVar170 = (float)local_2c0._4_4_ * (float)local_540._4_4_;
          fVar171 = fStack_2b8 * fStack_538;
          fVar270 = fStack_2b4 * fStack_534;
          fVar279 = fStack_2b0 * fStack_530;
          fVar174 = fStack_2ac * fStack_52c;
          fVar176 = fStack_2a8 * fStack_528;
          pfVar2 = (float *)(lVar21 + 0x21abdfc + lVar128 * 4);
          fVar243 = *pfVar2;
          fVar251 = pfVar2[1];
          fVar194 = pfVar2[2];
          fVar172 = pfVar2[3];
          fVar306 = pfVar2[4];
          fVar305 = pfVar2[5];
          fVar307 = pfVar2[6];
          pfVar3 = (float *)(lVar21 + 0x21ac280 + lVar128 * 4);
          fVar177 = *pfVar3;
          fVar309 = pfVar3[1];
          fVar308 = pfVar3[2];
          fVar252 = pfVar3[3];
          fVar253 = pfVar3[4];
          fVar254 = pfVar3[5];
          fVar255 = pfVar3[6];
          _local_540 = auVar314;
          pfVar4 = (float *)(lVar21 + 0x21ab978 + lVar128 * 4);
          fVar282 = *pfVar4;
          fVar216 = pfVar4[1];
          fVar284 = pfVar4[2];
          fVar130 = pfVar4[3];
          fVar150 = pfVar4[4];
          fVar151 = pfVar4[5];
          fVar178 = pfVar4[6];
          fVar155 = pfVar2[7] + pfVar3[7];
          fStack_3c4 = pfVar3[7] + fVar240 + 0.0;
          fVar257 = fVar240 + pfVar1[7] + fVar240 + 0.0;
          pfVar1 = (float *)(lVar21 + 0x21ab4f4 + lVar128 * 4);
          fVar240 = *pfVar1;
          fVar193 = pfVar1[1];
          fVar296 = pfVar1[2];
          fVar192 = pfVar1[3];
          fVar233 = pfVar1[4];
          fVar239 = pfVar1[5];
          fVar241 = pfVar1[6];
          local_300 = fVar240 * (float)local_420._0_4_ +
                      fVar282 * (float)local_740._0_4_ +
                      (float)local_5c0._0_4_ * fVar243 + (float)local_440._0_4_ * fVar177;
          fStack_2fc = fVar193 * (float)local_420._4_4_ +
                       fVar216 * (float)local_740._4_4_ +
                       (float)local_5c0._4_4_ * fVar251 + (float)local_440._4_4_ * fVar309;
          fStack_2f8 = fVar296 * fStack_418 +
                       fVar284 * fStack_738 + fStack_5b8 * fVar194 + fStack_438 * fVar308;
          fStack_2f4 = fVar192 * fStack_414 +
                       fVar130 * fStack_734 + fStack_5b4 * fVar172 + fStack_434 * fVar252;
          fStack_2f0 = fVar233 * fStack_410 +
                       fVar150 * fStack_730 + fStack_5b0 * fVar306 + fStack_430 * fVar253;
          fStack_2ec = fVar239 * fStack_40c +
                       fVar151 * fStack_72c + fStack_5ac * fVar305 + fStack_42c * fVar254;
          fStack_2e8 = fVar241 * fStack_408 +
                       fVar178 * fStack_728 + fStack_5a8 * fVar307 + fStack_428 * fVar255;
          fStack_2e4 = fVar155 + fStack_3c4;
          local_3e0 = fVar240 * (float)local_320._0_4_ +
                      fVar271 * fVar243 + (float)local_600._0_4_ * fVar177 +
                      (float)local_6a0._0_4_ * fVar282;
          fStack_3dc = fVar193 * (float)local_320._4_4_ +
                       fVar280 * fVar251 + (float)local_600._4_4_ * fVar309 +
                       (float)local_6a0._4_4_ * fVar216;
          fStack_3d8 = fVar296 * fStack_318 +
                       fVar281 * fVar194 + fStack_5f8 * fVar308 + fStack_698 * fVar284;
          fStack_3d4 = fVar192 * fStack_314 +
                       fVar283 * fVar172 + fStack_5f4 * fVar252 + fStack_694 * fVar130;
          fStack_3d0 = fVar233 * fStack_310 +
                       fVar229 * fVar306 + fStack_5f0 * fVar253 + fStack_690 * fVar150;
          fStack_3cc = fVar239 * fStack_30c +
                       fVar232 * fVar305 + fStack_5ec * fVar254 + fStack_68c * fVar151;
          fStack_3c8 = fVar241 * fStack_308 +
                       fVar238 * fVar307 + fStack_5e8 * fVar255 + fStack_688 * fVar178;
          fStack_3c4 = fStack_3c4 + fVar257;
          auVar324._0_4_ =
               fVar282 * (float)local_3a0._0_4_ +
               (float)local_2c0._0_4_ * fVar243 + (float)local_5e0._0_4_ * fVar177 +
               fVar240 * (float)local_640._0_4_;
          auVar324._4_4_ =
               fVar216 * (float)local_3a0._4_4_ +
               (float)local_2c0._4_4_ * fVar251 + (float)local_5e0._4_4_ * fVar309 +
               fVar193 * (float)local_640._4_4_;
          auVar324._8_4_ =
               fVar284 * fStack_398 + fStack_2b8 * fVar194 + fStack_5d8 * fVar308 +
               fVar296 * fStack_638;
          auVar324._12_4_ =
               fVar130 * fStack_394 + fStack_2b4 * fVar172 + fStack_5d4 * fVar252 +
               fVar192 * fStack_634;
          auVar324._16_4_ =
               fVar150 * fStack_390 + fStack_2b0 * fVar306 + fStack_5d0 * fVar253 +
               fVar233 * fStack_630;
          auVar324._20_4_ =
               fVar151 * fStack_38c + fStack_2ac * fVar305 + fStack_5cc * fVar254 +
               fVar239 * fStack_62c;
          auVar324._24_4_ =
               fVar178 * fStack_388 + fStack_2a8 * fVar307 + fStack_5c8 * fVar255 +
               fVar241 * fStack_628;
          auVar324._28_4_ = pfVar4[7] + fVar155 + fVar257;
          pfVar1 = (float *)(lVar21 + 0x21ae21c + lVar128 * 4);
          fVar243 = *pfVar1;
          fVar251 = pfVar1[1];
          fVar194 = pfVar1[2];
          fVar240 = pfVar1[3];
          fVar172 = pfVar1[4];
          fVar306 = pfVar1[5];
          fVar305 = pfVar1[6];
          pfVar2 = (float *)(lVar21 + 0x21ae6a0 + lVar128 * 4);
          fVar307 = *pfVar2;
          fVar177 = pfVar2[1];
          fVar309 = pfVar2[2];
          fVar308 = pfVar2[3];
          fVar252 = pfVar2[4];
          fVar253 = pfVar2[5];
          fVar254 = pfVar2[6];
          _local_520 = auVar32;
          pfVar3 = (float *)(lVar21 + 0x21add98 + lVar128 * 4);
          fVar255 = *pfVar3;
          fVar282 = pfVar3[1];
          fVar216 = pfVar3[2];
          fVar284 = pfVar3[3];
          fVar130 = pfVar3[4];
          fVar150 = pfVar3[5];
          fVar151 = pfVar3[6];
          pfVar4 = (float *)(lVar21 + 0x21ad914 + lVar128 * 4);
          fVar178 = *pfVar4;
          fVar193 = pfVar4[1];
          fVar296 = pfVar4[2];
          fVar192 = pfVar4[3];
          fVar233 = pfVar4[4];
          fVar239 = pfVar4[5];
          fVar241 = pfVar4[6];
          auVar290._0_4_ =
               fVar178 * (float)local_420._0_4_ +
               fVar255 * (float)local_740._0_4_ +
               (float)local_5c0._0_4_ * fVar243 + (float)local_440._0_4_ * fVar307;
          auVar290._4_4_ =
               fVar193 * (float)local_420._4_4_ +
               fVar282 * (float)local_740._4_4_ +
               (float)local_5c0._4_4_ * fVar251 + (float)local_440._4_4_ * fVar177;
          auVar290._8_4_ =
               fVar296 * fStack_418 +
               fVar216 * fStack_738 + fStack_5b8 * fVar194 + fStack_438 * fVar309;
          auVar290._12_4_ =
               fVar192 * fStack_414 +
               fVar284 * fStack_734 + fStack_5b4 * fVar240 + fStack_434 * fVar308;
          auVar290._16_4_ =
               fVar233 * fStack_410 +
               fVar130 * fStack_730 + fStack_5b0 * fVar172 + fStack_430 * fVar252;
          auVar290._20_4_ =
               fVar239 * fStack_40c +
               fVar150 * fStack_72c + fStack_5ac * fVar306 + fStack_42c * fVar253;
          auVar290._24_4_ =
               fVar241 * fStack_408 +
               fVar151 * fStack_728 + fStack_5a8 * fVar305 + fStack_428 * fVar254;
          auVar290._28_4_ = fStack_5e4 + fStack_5e4 + fStack_424 + fStack_3c4;
          auVar315._0_4_ =
               fVar178 * (float)local_320._0_4_ +
               (float)local_6a0._0_4_ * fVar255 +
               fVar271 * fVar243 + (float)local_600._0_4_ * fVar307;
          auVar315._4_4_ =
               fVar193 * (float)local_320._4_4_ +
               (float)local_6a0._4_4_ * fVar282 +
               fVar280 * fVar251 + (float)local_600._4_4_ * fVar177;
          auVar315._8_4_ =
               fVar296 * fStack_318 +
               fStack_698 * fVar216 + fVar281 * fVar194 + fStack_5f8 * fVar309;
          auVar315._12_4_ =
               fVar192 * fStack_314 +
               fStack_694 * fVar284 + fVar283 * fVar240 + fStack_5f4 * fVar308;
          auVar315._16_4_ =
               fVar233 * fStack_310 +
               fStack_690 * fVar130 + fVar229 * fVar172 + fStack_5f0 * fVar252;
          auVar315._20_4_ =
               fVar239 * fStack_30c +
               fStack_68c * fVar150 + fVar232 * fVar306 + fStack_5ec * fVar253;
          auVar315._24_4_ =
               fVar241 * fStack_308 +
               fStack_688 * fVar151 + fVar238 * fVar305 + fStack_5e8 * fVar254;
          auVar315._28_4_ = fStack_5e4 + fStack_5e4 + fStack_5a4 + fStack_5e4;
          auVar237._8_4_ = 0x7fffffff;
          auVar237._0_8_ = 0x7fffffff7fffffff;
          auVar237._12_4_ = 0x7fffffff;
          auVar237._16_4_ = 0x7fffffff;
          auVar237._20_4_ = 0x7fffffff;
          auVar237._24_4_ = 0x7fffffff;
          auVar237._28_4_ = 0x7fffffff;
          auVar115._4_4_ = fStack_2fc;
          auVar115._0_4_ = local_300;
          auVar115._8_4_ = fStack_2f8;
          auVar115._12_4_ = fStack_2f4;
          auVar115._16_4_ = fStack_2f0;
          auVar115._20_4_ = fStack_2ec;
          auVar115._24_4_ = fStack_2e8;
          auVar115._28_4_ = fStack_2e4;
          auVar143 = vandps_avx(auVar115,auVar237);
          auVar114._4_4_ = fStack_3dc;
          auVar114._0_4_ = local_3e0;
          auVar114._8_4_ = fStack_3d8;
          auVar114._12_4_ = fStack_3d4;
          auVar114._16_4_ = fStack_3d0;
          auVar114._20_4_ = fStack_3cc;
          auVar114._24_4_ = fStack_3c8;
          auVar114._28_4_ = fStack_3c4;
          auVar35 = vandps_avx(auVar114,auVar237);
          auVar35 = vmaxps_avx(auVar143,auVar35);
          auVar143 = vandps_avx(auVar324,auVar237);
          auVar35 = vmaxps_avx(auVar35,auVar143);
          auVar35 = vcmpps_avx(auVar35,local_340,1);
          auVar266 = vblendvps_avx(auVar115,auVar30,auVar35);
          auVar144._0_4_ =
               fVar178 * (float)local_640._0_4_ +
               fVar255 * (float)local_3a0._0_4_ +
               fVar307 * (float)local_5e0._0_4_ + (float)local_2c0._0_4_ * fVar243;
          auVar144._4_4_ =
               fVar193 * (float)local_640._4_4_ +
               fVar282 * (float)local_3a0._4_4_ +
               fVar177 * (float)local_5e0._4_4_ + (float)local_2c0._4_4_ * fVar251;
          auVar144._8_4_ =
               fVar296 * fStack_638 +
               fVar216 * fStack_398 + fVar309 * fStack_5d8 + fStack_2b8 * fVar194;
          auVar144._12_4_ =
               fVar192 * fStack_634 +
               fVar284 * fStack_394 + fVar308 * fStack_5d4 + fStack_2b4 * fVar240;
          auVar144._16_4_ =
               fVar233 * fStack_630 +
               fVar130 * fStack_390 + fVar252 * fStack_5d0 + fStack_2b0 * fVar172;
          auVar144._20_4_ =
               fVar239 * fStack_62c +
               fVar150 * fStack_38c + fVar253 * fStack_5cc + fStack_2ac * fVar306;
          auVar144._24_4_ =
               fVar241 * fStack_628 +
               fVar151 * fStack_388 + fVar254 * fStack_5c8 + fStack_2a8 * fVar305;
          auVar144._28_4_ = auVar143._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar148 = vblendvps_avx(auVar114,auVar31,auVar35);
          auVar143 = vandps_avx(auVar290,auVar237);
          auVar35 = vandps_avx(auVar315,auVar237);
          auVar200 = vmaxps_avx(auVar143,auVar35);
          auVar143 = vandps_avx(auVar144,auVar237);
          auVar143 = vmaxps_avx(auVar200,auVar143);
          local_500._0_4_ = auVar118._0_4_;
          local_500._4_4_ = auVar118._4_4_;
          fStack_4f8 = auVar118._8_4_;
          fStack_4f4 = auVar118._12_4_;
          auStack_4f0._0_4_ = auVar118._16_4_;
          auStack_4f0._4_4_ = auVar118._20_4_;
          fStack_4e8 = auVar118._24_4_;
          auVar35 = vcmpps_avx(auVar143,local_340,1);
          auVar143 = vblendvps_avx(auVar290,auVar30,auVar35);
          auVar145._0_4_ =
               (float)local_640._0_4_ * (float)local_500._0_4_ +
               fVar131 + fVar157 + (float)local_5e0._0_4_ * fVar195;
          auVar145._4_4_ =
               (float)local_640._4_4_ * (float)local_500._4_4_ +
               fVar231 + fVar170 + (float)local_5e0._4_4_ * fVar207;
          auVar145._8_4_ = fStack_638 * fStack_4f8 + fVar230 + fVar171 + fStack_5d8 * fVar210;
          auVar145._12_4_ = fStack_634 * fStack_4f4 + fVar256 + fVar270 + fStack_5d4 * fVar213;
          auVar145._16_4_ =
               fStack_630 * (float)auStack_4f0._0_4_ + fVar152 + fVar279 + fStack_5d0 * fVar214;
          auVar145._20_4_ =
               fStack_62c * (float)auStack_4f0._4_4_ + fVar153 + fVar174 + fStack_5cc * fVar215;
          auVar145._24_4_ = fStack_628 * fStack_4e8 + fVar154 + fVar176 + fStack_5c8 * fVar156;
          auVar145._28_4_ = auVar200._28_4_ + fStack_544 + fStack_624 + 0.0;
          auVar35 = vblendvps_avx(auVar315,auVar31,auVar35);
          fVar239 = auVar266._0_4_;
          fVar241 = auVar266._4_4_;
          fVar131 = auVar266._8_4_;
          fVar271 = auVar266._12_4_;
          fVar280 = auVar266._16_4_;
          fVar281 = auVar266._20_4_;
          fVar283 = auVar266._24_4_;
          fVar156 = auVar266._28_4_;
          fVar252 = auVar143._0_4_;
          fVar254 = auVar143._4_4_;
          fVar282 = auVar143._8_4_;
          fVar284 = auVar143._12_4_;
          fVar150 = auVar143._16_4_;
          fVar178 = auVar143._20_4_;
          fVar296 = auVar143._24_4_;
          fVar243 = auVar148._0_4_;
          fVar194 = auVar148._4_4_;
          fVar232 = auVar148._8_4_;
          fVar240 = auVar148._12_4_;
          fVar306 = auVar148._16_4_;
          fVar307 = auVar148._20_4_;
          fVar309 = auVar148._24_4_;
          auVar300._0_4_ = fVar243 * fVar243 + fVar239 * fVar239;
          auVar300._4_4_ = fVar194 * fVar194 + fVar241 * fVar241;
          auVar300._8_4_ = fVar232 * fVar232 + fVar131 * fVar131;
          auVar300._12_4_ = fVar240 * fVar240 + fVar271 * fVar271;
          auVar300._16_4_ = fVar306 * fVar306 + fVar280 * fVar280;
          auVar300._20_4_ = fVar307 * fVar307 + fVar281 * fVar281;
          auVar300._24_4_ = fVar309 * fVar309 + fVar283 * fVar283;
          auVar300._28_4_ = auVar30._28_4_ + auVar31._28_4_;
          auVar30 = vrsqrtps_avx(auVar300);
          fVar251 = auVar30._0_4_;
          fVar229 = auVar30._4_4_;
          auVar73._4_4_ = fVar229 * 1.5;
          auVar73._0_4_ = fVar251 * 1.5;
          fVar238 = auVar30._8_4_;
          auVar73._8_4_ = fVar238 * 1.5;
          fVar172 = auVar30._12_4_;
          auVar73._12_4_ = fVar172 * 1.5;
          fVar305 = auVar30._16_4_;
          auVar73._16_4_ = fVar305 * 1.5;
          fVar177 = auVar30._20_4_;
          auVar73._20_4_ = fVar177 * 1.5;
          fVar308 = auVar30._24_4_;
          auVar73._24_4_ = fVar308 * 1.5;
          auVar73._28_4_ = auVar315._28_4_;
          auVar74._4_4_ = fVar229 * fVar229 * fVar229 * auVar300._4_4_ * 0.5;
          auVar74._0_4_ = fVar251 * fVar251 * fVar251 * auVar300._0_4_ * 0.5;
          auVar74._8_4_ = fVar238 * fVar238 * fVar238 * auVar300._8_4_ * 0.5;
          auVar74._12_4_ = fVar172 * fVar172 * fVar172 * auVar300._12_4_ * 0.5;
          auVar74._16_4_ = fVar305 * fVar305 * fVar305 * auVar300._16_4_ * 0.5;
          auVar74._20_4_ = fVar177 * fVar177 * fVar177 * auVar300._20_4_ * 0.5;
          auVar74._24_4_ = fVar308 * fVar308 * fVar308 * auVar300._24_4_ * 0.5;
          auVar74._28_4_ = auVar300._28_4_;
          auVar31 = vsubps_avx(auVar73,auVar74);
          fVar195 = auVar31._0_4_;
          fVar207 = auVar31._4_4_;
          fVar210 = auVar31._8_4_;
          fVar213 = auVar31._12_4_;
          fVar214 = auVar31._16_4_;
          fVar215 = auVar31._20_4_;
          fVar233 = auVar31._24_4_;
          fVar251 = auVar35._0_4_;
          fVar229 = auVar35._4_4_;
          fVar238 = auVar35._8_4_;
          fVar172 = auVar35._12_4_;
          fVar305 = auVar35._16_4_;
          fVar177 = auVar35._20_4_;
          fVar308 = auVar35._24_4_;
          auVar277._0_4_ = fVar251 * fVar251 + fVar252 * fVar252;
          auVar277._4_4_ = fVar229 * fVar229 + fVar254 * fVar254;
          auVar277._8_4_ = fVar238 * fVar238 + fVar282 * fVar282;
          auVar277._12_4_ = fVar172 * fVar172 + fVar284 * fVar284;
          auVar277._16_4_ = fVar305 * fVar305 + fVar150 * fVar150;
          auVar277._20_4_ = fVar177 * fVar177 + fVar178 * fVar178;
          auVar277._24_4_ = fVar308 * fVar308 + fVar296 * fVar296;
          auVar277._28_4_ = auVar30._28_4_ + auVar143._28_4_;
          auVar143 = vrsqrtps_avx(auVar277);
          fVar253 = auVar143._0_4_;
          fVar255 = auVar143._4_4_;
          auVar75._4_4_ = fVar255 * 1.5;
          auVar75._0_4_ = fVar253 * 1.5;
          fVar216 = auVar143._8_4_;
          auVar75._8_4_ = fVar216 * 1.5;
          fVar130 = auVar143._12_4_;
          auVar75._12_4_ = fVar130 * 1.5;
          fVar151 = auVar143._16_4_;
          auVar75._16_4_ = fVar151 * 1.5;
          fVar193 = auVar143._20_4_;
          auVar75._20_4_ = fVar193 * 1.5;
          fVar192 = auVar143._24_4_;
          auVar75._24_4_ = fVar192 * 1.5;
          auVar75._28_4_ = auVar315._28_4_;
          auVar76._4_4_ = fVar255 * fVar255 * fVar255 * auVar277._4_4_ * 0.5;
          auVar76._0_4_ = fVar253 * fVar253 * fVar253 * auVar277._0_4_ * 0.5;
          auVar76._8_4_ = fVar216 * fVar216 * fVar216 * auVar277._8_4_ * 0.5;
          auVar76._12_4_ = fVar130 * fVar130 * fVar130 * auVar277._12_4_ * 0.5;
          auVar76._16_4_ = fVar151 * fVar151 * fVar151 * auVar277._16_4_ * 0.5;
          auVar76._20_4_ = fVar193 * fVar193 * fVar193 * auVar277._20_4_ * 0.5;
          auVar76._24_4_ = fVar192 * fVar192 * fVar192 * auVar277._24_4_ * 0.5;
          auVar76._28_4_ = auVar277._28_4_;
          auVar30 = vsubps_avx(auVar75,auVar76);
          fVar253 = auVar30._0_4_;
          fVar255 = auVar30._4_4_;
          fVar216 = auVar30._8_4_;
          fVar130 = auVar30._12_4_;
          fVar151 = auVar30._16_4_;
          fVar193 = auVar30._20_4_;
          fVar192 = auVar30._24_4_;
          fVar243 = (float)local_7c0._0_4_ * fVar195 * fVar243;
          fVar194 = (float)local_7c0._4_4_ * fVar207 * fVar194;
          auVar77._4_4_ = fVar194;
          auVar77._0_4_ = fVar243;
          fVar232 = fStack_7b8 * fVar210 * fVar232;
          auVar77._8_4_ = fVar232;
          fVar240 = fStack_7b4 * fVar213 * fVar240;
          auVar77._12_4_ = fVar240;
          fVar306 = fStack_7b0 * fVar214 * fVar306;
          auVar77._16_4_ = fVar306;
          fVar307 = fStack_7ac * fVar215 * fVar307;
          auVar77._20_4_ = fVar307;
          fVar309 = fStack_7a8 * fVar233 * fVar309;
          auVar77._24_4_ = fVar309;
          auVar77._28_4_ = auVar143._28_4_;
          local_500._4_4_ = fVar194 + auVar289._4_4_;
          local_500._0_4_ = fVar243 + auVar289._0_4_;
          fStack_4f8 = fVar232 + auVar289._8_4_;
          fStack_4f4 = fVar240 + auVar289._12_4_;
          auStack_4f0._0_4_ = fVar306 + auVar289._16_4_;
          auStack_4f0._4_4_ = fVar307 + auVar289._20_4_;
          fStack_4e8 = fVar309 + auVar289._24_4_;
          fStack_4e4 = auVar143._28_4_ + auVar289._28_4_;
          local_620 = (float)local_7c0._0_4_ * fVar195 * -fVar239;
          fStack_61c = (float)local_7c0._4_4_ * fVar207 * -fVar241;
          auVar78._4_4_ = fStack_61c;
          auVar78._0_4_ = local_620;
          fStack_618 = fStack_7b8 * fVar210 * -fVar131;
          auVar78._8_4_ = fStack_618;
          fStack_614 = fStack_7b4 * fVar213 * -fVar271;
          auVar78._12_4_ = fStack_614;
          fStack_610 = fStack_7b0 * fVar214 * -fVar280;
          auVar78._16_4_ = fStack_610;
          fStack_60c = fStack_7ac * fVar215 * -fVar281;
          auVar78._20_4_ = fStack_60c;
          fStack_608 = fStack_7a8 * fVar233 * -fVar283;
          auVar78._24_4_ = fStack_608;
          auVar78._28_4_ = -fVar156;
          local_620 = local_6e0._0_4_ + local_620;
          fStack_61c = local_6e0._4_4_ + fStack_61c;
          fStack_618 = local_6e0._8_4_ + fStack_618;
          fStack_614 = local_6e0._12_4_ + fStack_614;
          fStack_610 = local_6e0._16_4_ + fStack_610;
          fStack_60c = local_6e0._20_4_ + fStack_60c;
          fStack_608 = local_6e0._24_4_ + fStack_608;
          fStack_604 = local_6e0._28_4_ + -fVar156;
          fVar243 = fVar195 * 0.0 * (float)local_7c0._0_4_;
          fVar194 = fVar207 * 0.0 * (float)local_7c0._4_4_;
          auVar79._4_4_ = fVar194;
          auVar79._0_4_ = fVar243;
          fVar232 = fVar210 * 0.0 * fStack_7b8;
          auVar79._8_4_ = fVar232;
          fVar240 = fVar213 * 0.0 * fStack_7b4;
          auVar79._12_4_ = fVar240;
          fVar306 = fVar214 * 0.0 * fStack_7b0;
          auVar79._16_4_ = fVar306;
          fVar307 = fVar215 * 0.0 * fStack_7ac;
          auVar79._20_4_ = fVar307;
          fVar309 = fVar233 * 0.0 * fStack_7a8;
          auVar79._24_4_ = fVar309;
          auVar79._28_4_ = fVar156;
          auVar200 = vsubps_avx(auVar289,auVar77);
          auVar344._0_4_ = fVar243 + auVar145._0_4_;
          auVar344._4_4_ = fVar194 + auVar145._4_4_;
          auVar344._8_4_ = fVar232 + auVar145._8_4_;
          auVar344._12_4_ = fVar240 + auVar145._12_4_;
          auVar344._16_4_ = fVar306 + auVar145._16_4_;
          auVar344._20_4_ = fVar307 + auVar145._20_4_;
          auVar344._24_4_ = fVar309 + auVar145._24_4_;
          auVar344._28_4_ = fVar156 + auVar145._28_4_;
          fVar243 = auVar267._0_4_ * fVar253 * fVar251;
          fVar251 = auVar267._4_4_ * fVar255 * fVar229;
          auVar80._4_4_ = fVar251;
          auVar80._0_4_ = fVar243;
          fVar194 = auVar267._8_4_ * fVar216 * fVar238;
          auVar80._8_4_ = fVar194;
          fVar229 = auVar267._12_4_ * fVar130 * fVar172;
          auVar80._12_4_ = fVar229;
          fVar232 = auVar267._16_4_ * fVar151 * fVar305;
          auVar80._16_4_ = fVar232;
          fVar238 = auVar267._20_4_ * fVar193 * fVar177;
          auVar80._20_4_ = fVar238;
          fVar240 = auVar267._24_4_ * fVar192 * fVar308;
          auVar80._24_4_ = fVar240;
          auVar80._28_4_ = fStack_7a4;
          auVar298 = vsubps_avx(local_6e0,auVar78);
          auVar325._0_4_ = auVar314._0_4_ + fVar243;
          auVar325._4_4_ = auVar314._4_4_ + fVar251;
          auVar325._8_4_ = auVar314._8_4_ + fVar194;
          auVar325._12_4_ = auVar314._12_4_ + fVar229;
          auVar325._16_4_ = auVar314._16_4_ + fVar232;
          auVar325._20_4_ = auVar314._20_4_ + fVar238;
          auVar325._24_4_ = auVar314._24_4_ + fVar240;
          auVar325._28_4_ = auVar314._28_4_ + fStack_7a4;
          fVar243 = fVar253 * -fVar252 * auVar267._0_4_;
          fVar251 = fVar255 * -fVar254 * auVar267._4_4_;
          auVar81._4_4_ = fVar251;
          auVar81._0_4_ = fVar243;
          fVar194 = fVar216 * -fVar282 * auVar267._8_4_;
          auVar81._8_4_ = fVar194;
          fVar229 = fVar130 * -fVar284 * auVar267._12_4_;
          auVar81._12_4_ = fVar229;
          fVar232 = fVar151 * -fVar150 * auVar267._16_4_;
          auVar81._16_4_ = fVar232;
          fVar238 = fVar193 * -fVar178 * auVar267._20_4_;
          auVar81._20_4_ = fVar238;
          fVar240 = fVar192 * -fVar296 * auVar267._24_4_;
          auVar81._24_4_ = fVar240;
          auVar81._28_4_ = auVar289._28_4_;
          auVar311 = vsubps_avx(auVar145,auVar79);
          auVar226._0_4_ = local_3c0._0_4_ + fVar243;
          auVar226._4_4_ = local_3c0._4_4_ + fVar251;
          auVar226._8_4_ = local_3c0._8_4_ + fVar194;
          auVar226._12_4_ = local_3c0._12_4_ + fVar229;
          auVar226._16_4_ = local_3c0._16_4_ + fVar232;
          auVar226._20_4_ = local_3c0._20_4_ + fVar238;
          auVar226._24_4_ = local_3c0._24_4_ + fVar240;
          auVar226._28_4_ = local_3c0._28_4_ + auVar289._28_4_;
          fVar243 = fVar253 * 0.0 * auVar267._0_4_;
          fVar251 = fVar255 * 0.0 * auVar267._4_4_;
          auVar82._4_4_ = fVar251;
          auVar82._0_4_ = fVar243;
          fVar194 = fVar216 * 0.0 * auVar267._8_4_;
          auVar82._8_4_ = fVar194;
          fVar229 = fVar130 * 0.0 * auVar267._12_4_;
          auVar82._12_4_ = fVar229;
          fVar232 = fVar151 * 0.0 * auVar267._16_4_;
          auVar82._16_4_ = fVar232;
          fVar238 = fVar193 * 0.0 * auVar267._20_4_;
          auVar82._20_4_ = fVar238;
          fVar240 = fVar192 * 0.0 * auVar267._24_4_;
          auVar82._24_4_ = fVar240;
          auVar82._28_4_ = auVar145._28_4_;
          auVar143 = vsubps_avx(auVar314,auVar80);
          auVar291._0_4_ = (float)local_560._0_4_ + fVar243;
          auVar291._4_4_ = (float)local_560._4_4_ + fVar251;
          auVar291._8_4_ = fStack_558 + fVar194;
          auVar291._12_4_ = fStack_554 + fVar229;
          auVar291._16_4_ = fStack_550 + fVar232;
          auVar291._20_4_ = fStack_54c + fVar238;
          auVar291._24_4_ = fStack_548 + fVar240;
          auVar291._28_4_ = fStack_544 + auVar145._28_4_;
          auVar31 = vsubps_avx(local_3c0,auVar81);
          auVar35 = vsubps_avx(_local_560,auVar82);
          auVar266 = vsubps_avx(auVar226,auVar298);
          auVar148 = vsubps_avx(auVar291,auVar311);
          auVar83._4_4_ = auVar311._4_4_ * auVar266._4_4_;
          auVar83._0_4_ = auVar311._0_4_ * auVar266._0_4_;
          auVar83._8_4_ = auVar311._8_4_ * auVar266._8_4_;
          auVar83._12_4_ = auVar311._12_4_ * auVar266._12_4_;
          auVar83._16_4_ = auVar311._16_4_ * auVar266._16_4_;
          auVar83._20_4_ = auVar311._20_4_ * auVar266._20_4_;
          auVar83._24_4_ = auVar311._24_4_ * auVar266._24_4_;
          auVar83._28_4_ = auVar315._28_4_;
          auVar84._4_4_ = auVar298._4_4_ * auVar148._4_4_;
          auVar84._0_4_ = auVar298._0_4_ * auVar148._0_4_;
          auVar84._8_4_ = auVar298._8_4_ * auVar148._8_4_;
          auVar84._12_4_ = auVar298._12_4_ * auVar148._12_4_;
          auVar84._16_4_ = auVar298._16_4_ * auVar148._16_4_;
          auVar84._20_4_ = auVar298._20_4_ * auVar148._20_4_;
          auVar84._24_4_ = auVar298._24_4_ * auVar148._24_4_;
          auVar84._28_4_ = local_3c0._28_4_;
          auVar201 = vsubps_avx(auVar84,auVar83);
          auVar85._4_4_ = auVar200._4_4_ * auVar148._4_4_;
          auVar85._0_4_ = auVar200._0_4_ * auVar148._0_4_;
          auVar85._8_4_ = auVar200._8_4_ * auVar148._8_4_;
          auVar85._12_4_ = auVar200._12_4_ * auVar148._12_4_;
          auVar85._16_4_ = auVar200._16_4_ * auVar148._16_4_;
          auVar85._20_4_ = auVar200._20_4_ * auVar148._20_4_;
          auVar85._24_4_ = auVar200._24_4_ * auVar148._24_4_;
          auVar85._28_4_ = auVar148._28_4_;
          auVar148 = vsubps_avx(auVar325,auVar200);
          auVar86._4_4_ = auVar311._4_4_ * auVar148._4_4_;
          auVar86._0_4_ = auVar311._0_4_ * auVar148._0_4_;
          auVar86._8_4_ = auVar311._8_4_ * auVar148._8_4_;
          auVar86._12_4_ = auVar311._12_4_ * auVar148._12_4_;
          auVar86._16_4_ = auVar311._16_4_ * auVar148._16_4_;
          auVar86._20_4_ = auVar311._20_4_ * auVar148._20_4_;
          auVar86._24_4_ = auVar311._24_4_ * auVar148._24_4_;
          auVar86._28_4_ = auVar30._28_4_;
          auVar276 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = auVar298._4_4_ * auVar148._4_4_;
          auVar87._0_4_ = auVar298._0_4_ * auVar148._0_4_;
          auVar87._8_4_ = auVar298._8_4_ * auVar148._8_4_;
          auVar87._12_4_ = auVar298._12_4_ * auVar148._12_4_;
          auVar87._16_4_ = auVar298._16_4_ * auVar148._16_4_;
          auVar87._20_4_ = auVar298._20_4_ * auVar148._20_4_;
          auVar87._24_4_ = auVar298._24_4_ * auVar148._24_4_;
          auVar87._28_4_ = auVar30._28_4_;
          auVar88._4_4_ = auVar200._4_4_ * auVar266._4_4_;
          auVar88._0_4_ = auVar200._0_4_ * auVar266._0_4_;
          auVar88._8_4_ = auVar200._8_4_ * auVar266._8_4_;
          auVar88._12_4_ = auVar200._12_4_ * auVar266._12_4_;
          auVar88._16_4_ = auVar200._16_4_ * auVar266._16_4_;
          auVar88._20_4_ = auVar200._20_4_ * auVar266._20_4_;
          auVar88._24_4_ = auVar200._24_4_ * auVar266._24_4_;
          auVar88._28_4_ = auVar266._28_4_;
          auVar30 = vsubps_avx(auVar88,auVar87);
          auVar165._0_4_ = auVar201._0_4_ * 0.0 + auVar30._0_4_ + auVar276._0_4_ * 0.0;
          auVar165._4_4_ = auVar201._4_4_ * 0.0 + auVar30._4_4_ + auVar276._4_4_ * 0.0;
          auVar165._8_4_ = auVar201._8_4_ * 0.0 + auVar30._8_4_ + auVar276._8_4_ * 0.0;
          auVar165._12_4_ = auVar201._12_4_ * 0.0 + auVar30._12_4_ + auVar276._12_4_ * 0.0;
          auVar165._16_4_ = auVar201._16_4_ * 0.0 + auVar30._16_4_ + auVar276._16_4_ * 0.0;
          auVar165._20_4_ = auVar201._20_4_ * 0.0 + auVar30._20_4_ + auVar276._20_4_ * 0.0;
          auVar165._24_4_ = auVar201._24_4_ * 0.0 + auVar30._24_4_ + auVar276._24_4_ * 0.0;
          auVar165._28_4_ = auVar201._28_4_ + auVar30._28_4_ + auVar276._28_4_;
          auVar286 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,2);
          auVar143 = vblendvps_avx(auVar143,_local_500,auVar286);
          auVar113._4_4_ = fStack_61c;
          auVar113._0_4_ = local_620;
          auVar113._8_4_ = fStack_618;
          auVar113._12_4_ = fStack_614;
          auVar113._16_4_ = fStack_610;
          auVar113._20_4_ = fStack_60c;
          auVar113._24_4_ = fStack_608;
          auVar113._28_4_ = fStack_604;
          auVar30 = vblendvps_avx(auVar31,auVar113,auVar286);
          auVar31 = vblendvps_avx(auVar35,auVar344,auVar286);
          auVar35 = vblendvps_avx(auVar200,auVar325,auVar286);
          auVar266 = vblendvps_avx(auVar298,auVar226,auVar286);
          auVar148 = vblendvps_avx(auVar311,auVar291,auVar286);
          auVar200 = vblendvps_avx(auVar325,auVar200,auVar286);
          auVar201 = vblendvps_avx(auVar226,auVar298,auVar286);
          auVar276 = vblendvps_avx(auVar291,auVar311,auVar286);
          local_6e0 = vandps_avx(auVar32,_local_2e0);
          auVar32 = vsubps_avx(auVar200,auVar143);
          auVar200 = vsubps_avx(auVar201,auVar30);
          auVar276 = vsubps_avx(auVar276,auVar31);
          auVar34 = vsubps_avx(auVar30,auVar266);
          fVar243 = auVar200._0_4_;
          fVar155 = auVar31._0_4_;
          fVar172 = auVar200._4_4_;
          fVar157 = auVar31._4_4_;
          auVar89._4_4_ = fVar157 * fVar172;
          auVar89._0_4_ = fVar155 * fVar243;
          fVar252 = auVar200._8_4_;
          fVar170 = auVar31._8_4_;
          auVar89._8_4_ = fVar170 * fVar252;
          fVar130 = auVar200._12_4_;
          fVar171 = auVar31._12_4_;
          auVar89._12_4_ = fVar171 * fVar130;
          fVar195 = auVar200._16_4_;
          fVar270 = auVar31._16_4_;
          auVar89._16_4_ = fVar270 * fVar195;
          fVar239 = auVar200._20_4_;
          fVar279 = auVar31._20_4_;
          auVar89._20_4_ = fVar279 * fVar239;
          fVar156 = auVar200._24_4_;
          fVar174 = auVar31._24_4_;
          auVar89._24_4_ = fVar174 * fVar156;
          auVar89._28_4_ = auVar201._28_4_;
          fVar251 = auVar30._0_4_;
          fVar176 = auVar276._0_4_;
          fVar306 = auVar30._4_4_;
          fVar257 = auVar276._4_4_;
          auVar90._4_4_ = fVar257 * fVar306;
          auVar90._0_4_ = fVar176 * fVar251;
          fVar253 = auVar30._8_4_;
          fVar292 = auVar276._8_4_;
          auVar90._8_4_ = fVar292 * fVar253;
          fVar150 = auVar30._12_4_;
          fVar293 = auVar276._12_4_;
          auVar90._12_4_ = fVar293 * fVar150;
          fVar207 = auVar30._16_4_;
          fVar294 = auVar276._16_4_;
          auVar90._16_4_ = fVar294 * fVar207;
          fVar241 = auVar30._20_4_;
          fVar295 = auVar276._20_4_;
          auVar90._20_4_ = fVar295 * fVar241;
          fVar231 = auVar30._24_4_;
          fVar332 = auVar276._24_4_;
          uVar11 = auVar298._28_4_;
          auVar90._24_4_ = fVar332 * fVar231;
          auVar90._28_4_ = uVar11;
          auVar201 = vsubps_avx(auVar90,auVar89);
          fVar194 = auVar143._0_4_;
          fVar305 = auVar143._4_4_;
          auVar91._4_4_ = fVar257 * fVar305;
          auVar91._0_4_ = fVar176 * fVar194;
          fVar254 = auVar143._8_4_;
          auVar91._8_4_ = fVar292 * fVar254;
          fVar151 = auVar143._12_4_;
          auVar91._12_4_ = fVar293 * fVar151;
          fVar210 = auVar143._16_4_;
          auVar91._16_4_ = fVar294 * fVar210;
          fVar131 = auVar143._20_4_;
          auVar91._20_4_ = fVar295 * fVar131;
          fVar230 = auVar143._24_4_;
          auVar91._24_4_ = fVar332 * fVar230;
          auVar91._28_4_ = uVar11;
          fVar229 = auVar32._0_4_;
          fVar307 = auVar32._4_4_;
          auVar92._4_4_ = fVar157 * fVar307;
          auVar92._0_4_ = fVar155 * fVar229;
          fVar255 = auVar32._8_4_;
          auVar92._8_4_ = fVar170 * fVar255;
          fVar178 = auVar32._12_4_;
          auVar92._12_4_ = fVar171 * fVar178;
          fVar213 = auVar32._16_4_;
          auVar92._16_4_ = fVar270 * fVar213;
          fVar271 = auVar32._20_4_;
          auVar92._20_4_ = fVar279 * fVar271;
          fVar256 = auVar32._24_4_;
          auVar92._24_4_ = fVar174 * fVar256;
          auVar92._28_4_ = auVar325._28_4_;
          auVar298 = vsubps_avx(auVar92,auVar91);
          auVar93._4_4_ = fVar306 * fVar307;
          auVar93._0_4_ = fVar251 * fVar229;
          auVar93._8_4_ = fVar253 * fVar255;
          auVar93._12_4_ = fVar150 * fVar178;
          auVar93._16_4_ = fVar207 * fVar213;
          auVar93._20_4_ = fVar241 * fVar271;
          auVar93._24_4_ = fVar231 * fVar256;
          auVar93._28_4_ = uVar11;
          auVar94._4_4_ = fVar305 * fVar172;
          auVar94._0_4_ = fVar194 * fVar243;
          auVar94._8_4_ = fVar254 * fVar252;
          auVar94._12_4_ = fVar151 * fVar130;
          auVar94._16_4_ = fVar210 * fVar195;
          auVar94._20_4_ = fVar131 * fVar239;
          auVar94._24_4_ = fVar230 * fVar156;
          auVar94._28_4_ = auVar311._28_4_;
          auVar311 = vsubps_avx(auVar94,auVar93);
          auVar31 = vsubps_avx(auVar31,auVar148);
          fVar238 = auVar311._28_4_ + auVar298._28_4_;
          local_580._0_4_ = auVar311._0_4_ + auVar298._0_4_ * 0.0 + auVar201._0_4_ * 0.0;
          local_580._4_4_ = auVar311._4_4_ + auVar298._4_4_ * 0.0 + auVar201._4_4_ * 0.0;
          local_580._8_4_ = auVar311._8_4_ + auVar298._8_4_ * 0.0 + auVar201._8_4_ * 0.0;
          local_580._12_4_ = auVar311._12_4_ + auVar298._12_4_ * 0.0 + auVar201._12_4_ * 0.0;
          local_580._16_4_ = auVar311._16_4_ + auVar298._16_4_ * 0.0 + auVar201._16_4_ * 0.0;
          local_580._20_4_ = auVar311._20_4_ + auVar298._20_4_ * 0.0 + auVar201._20_4_ * 0.0;
          local_580._24_4_ = auVar311._24_4_ + auVar298._24_4_ * 0.0 + auVar201._24_4_ * 0.0;
          local_580._28_4_ = fVar238 + auVar201._28_4_;
          fVar232 = auVar34._0_4_;
          fVar177 = auVar34._4_4_;
          auVar95._4_4_ = auVar148._4_4_ * fVar177;
          auVar95._0_4_ = auVar148._0_4_ * fVar232;
          fVar282 = auVar34._8_4_;
          auVar95._8_4_ = auVar148._8_4_ * fVar282;
          fVar193 = auVar34._12_4_;
          auVar95._12_4_ = auVar148._12_4_ * fVar193;
          fVar214 = auVar34._16_4_;
          auVar95._16_4_ = auVar148._16_4_ * fVar214;
          fVar280 = auVar34._20_4_;
          auVar95._20_4_ = auVar148._20_4_ * fVar280;
          fVar152 = auVar34._24_4_;
          auVar95._24_4_ = auVar148._24_4_ * fVar152;
          auVar95._28_4_ = fVar238;
          fVar238 = auVar31._0_4_;
          fVar309 = auVar31._4_4_;
          auVar96._4_4_ = auVar266._4_4_ * fVar309;
          auVar96._0_4_ = auVar266._0_4_ * fVar238;
          fVar216 = auVar31._8_4_;
          auVar96._8_4_ = auVar266._8_4_ * fVar216;
          fVar296 = auVar31._12_4_;
          auVar96._12_4_ = auVar266._12_4_ * fVar296;
          fVar215 = auVar31._16_4_;
          auVar96._16_4_ = auVar266._16_4_ * fVar215;
          fVar281 = auVar31._20_4_;
          auVar96._20_4_ = auVar266._20_4_ * fVar281;
          fVar153 = auVar31._24_4_;
          auVar96._24_4_ = auVar266._24_4_ * fVar153;
          auVar96._28_4_ = auVar311._28_4_;
          auVar298 = vsubps_avx(auVar96,auVar95);
          auVar143 = vsubps_avx(auVar143,auVar35);
          fVar240 = auVar143._0_4_;
          fVar308 = auVar143._4_4_;
          auVar97._4_4_ = auVar148._4_4_ * fVar308;
          auVar97._0_4_ = auVar148._0_4_ * fVar240;
          fVar284 = auVar143._8_4_;
          auVar97._8_4_ = auVar148._8_4_ * fVar284;
          fVar192 = auVar143._12_4_;
          auVar97._12_4_ = auVar148._12_4_ * fVar192;
          fVar233 = auVar143._16_4_;
          auVar97._16_4_ = auVar148._16_4_ * fVar233;
          fVar283 = auVar143._20_4_;
          auVar97._20_4_ = auVar148._20_4_ * fVar283;
          fVar154 = auVar143._24_4_;
          auVar97._24_4_ = auVar148._24_4_ * fVar154;
          auVar97._28_4_ = auVar148._28_4_;
          auVar98._4_4_ = fVar309 * auVar35._4_4_;
          auVar98._0_4_ = fVar238 * auVar35._0_4_;
          auVar98._8_4_ = fVar216 * auVar35._8_4_;
          auVar98._12_4_ = fVar296 * auVar35._12_4_;
          auVar98._16_4_ = fVar215 * auVar35._16_4_;
          auVar98._20_4_ = fVar281 * auVar35._20_4_;
          auVar98._24_4_ = fVar153 * auVar35._24_4_;
          auVar98._28_4_ = auVar201._28_4_;
          auVar143 = vsubps_avx(auVar97,auVar98);
          auVar99._4_4_ = auVar266._4_4_ * fVar308;
          auVar99._0_4_ = auVar266._0_4_ * fVar240;
          auVar99._8_4_ = auVar266._8_4_ * fVar284;
          auVar99._12_4_ = auVar266._12_4_ * fVar192;
          auVar99._16_4_ = auVar266._16_4_ * fVar233;
          auVar99._20_4_ = auVar266._20_4_ * fVar283;
          auVar99._24_4_ = auVar266._24_4_ * fVar154;
          auVar99._28_4_ = auVar266._28_4_;
          auVar100._4_4_ = fVar177 * auVar35._4_4_;
          auVar100._0_4_ = fVar232 * auVar35._0_4_;
          auVar100._8_4_ = fVar282 * auVar35._8_4_;
          auVar100._12_4_ = fVar193 * auVar35._12_4_;
          auVar100._16_4_ = fVar214 * auVar35._16_4_;
          auVar100._20_4_ = fVar280 * auVar35._20_4_;
          auVar100._24_4_ = fVar152 * auVar35._24_4_;
          auVar100._28_4_ = auVar35._28_4_;
          auVar35 = vsubps_avx(auVar100,auVar99);
          auVar146._0_4_ = auVar298._0_4_ * 0.0 + auVar35._0_4_ + auVar143._0_4_ * 0.0;
          auVar146._4_4_ = auVar298._4_4_ * 0.0 + auVar35._4_4_ + auVar143._4_4_ * 0.0;
          auVar146._8_4_ = auVar298._8_4_ * 0.0 + auVar35._8_4_ + auVar143._8_4_ * 0.0;
          auVar146._12_4_ = auVar298._12_4_ * 0.0 + auVar35._12_4_ + auVar143._12_4_ * 0.0;
          auVar146._16_4_ = auVar298._16_4_ * 0.0 + auVar35._16_4_ + auVar143._16_4_ * 0.0;
          auVar146._20_4_ = auVar298._20_4_ * 0.0 + auVar35._20_4_ + auVar143._20_4_ * 0.0;
          auVar146._24_4_ = auVar298._24_4_ * 0.0 + auVar35._24_4_ + auVar143._24_4_ * 0.0;
          auVar146._28_4_ = auVar143._28_4_ + auVar35._28_4_ + auVar143._28_4_;
          auVar149 = ZEXT3264(auVar146);
          auVar143 = vmaxps_avx(local_580,auVar146);
          auVar143 = vcmpps_avx(auVar143,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar35 = local_6e0 & auVar143;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0x7f,0) == '\0') &&
                (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar35 >> 0xbf,0) == '\0') &&
              (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar35[0x1f]) {
LAB_00f73536:
            auVar205 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                          CONCAT816(local_4c0[1]._16_8_,
                                                    CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))
                                         ));
          }
          else {
            auVar35 = vandps_avx(auVar143,local_6e0);
            auVar101._4_4_ = fVar309 * fVar172;
            auVar101._0_4_ = fVar238 * fVar243;
            auVar101._8_4_ = fVar216 * fVar252;
            auVar101._12_4_ = fVar296 * fVar130;
            auVar101._16_4_ = fVar215 * fVar195;
            auVar101._20_4_ = fVar281 * fVar239;
            auVar101._24_4_ = fVar153 * fVar156;
            auVar101._28_4_ = local_6e0._28_4_;
            auVar102._4_4_ = fVar177 * fVar257;
            auVar102._0_4_ = fVar232 * fVar176;
            auVar102._8_4_ = fVar282 * fVar292;
            auVar102._12_4_ = fVar193 * fVar293;
            auVar102._16_4_ = fVar214 * fVar294;
            auVar102._20_4_ = fVar280 * fVar295;
            auVar102._24_4_ = fVar152 * fVar332;
            auVar102._28_4_ = auVar143._28_4_;
            auVar266 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = fVar308 * fVar257;
            auVar103._0_4_ = fVar240 * fVar176;
            auVar103._8_4_ = fVar284 * fVar292;
            auVar103._12_4_ = fVar192 * fVar293;
            auVar103._16_4_ = fVar233 * fVar294;
            auVar103._20_4_ = fVar283 * fVar295;
            auVar103._24_4_ = fVar154 * fVar332;
            auVar103._28_4_ = auVar276._28_4_;
            auVar104._4_4_ = fVar309 * fVar307;
            auVar104._0_4_ = fVar238 * fVar229;
            auVar104._8_4_ = fVar216 * fVar255;
            auVar104._12_4_ = fVar296 * fVar178;
            auVar104._16_4_ = fVar215 * fVar213;
            auVar104._20_4_ = fVar281 * fVar271;
            auVar104._24_4_ = fVar153 * fVar256;
            auVar104._28_4_ = auVar31._28_4_;
            auVar148 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = fVar177 * fVar307;
            auVar105._0_4_ = fVar232 * fVar229;
            auVar105._8_4_ = fVar282 * fVar255;
            auVar105._12_4_ = fVar193 * fVar178;
            auVar105._16_4_ = fVar214 * fVar213;
            auVar105._20_4_ = fVar280 * fVar271;
            auVar105._24_4_ = fVar152 * fVar256;
            auVar105._28_4_ = auVar32._28_4_;
            auVar106._4_4_ = fVar308 * fVar172;
            auVar106._0_4_ = fVar240 * fVar243;
            auVar106._8_4_ = fVar284 * fVar252;
            auVar106._12_4_ = fVar192 * fVar130;
            auVar106._16_4_ = fVar233 * fVar195;
            auVar106._20_4_ = fVar283 * fVar239;
            auVar106._24_4_ = fVar154 * fVar156;
            auVar106._28_4_ = auVar200._28_4_;
            auVar200 = vsubps_avx(auVar106,auVar105);
            auVar278._0_4_ = auVar266._0_4_ * 0.0 + auVar200._0_4_ + auVar148._0_4_ * 0.0;
            auVar278._4_4_ = auVar266._4_4_ * 0.0 + auVar200._4_4_ + auVar148._4_4_ * 0.0;
            auVar278._8_4_ = auVar266._8_4_ * 0.0 + auVar200._8_4_ + auVar148._8_4_ * 0.0;
            auVar278._12_4_ = auVar266._12_4_ * 0.0 + auVar200._12_4_ + auVar148._12_4_ * 0.0;
            auVar278._16_4_ = auVar266._16_4_ * 0.0 + auVar200._16_4_ + auVar148._16_4_ * 0.0;
            auVar278._20_4_ = auVar266._20_4_ * 0.0 + auVar200._20_4_ + auVar148._20_4_ * 0.0;
            auVar278._24_4_ = auVar266._24_4_ * 0.0 + auVar200._24_4_ + auVar148._24_4_ * 0.0;
            auVar278._28_4_ = auVar34._28_4_ + auVar200._28_4_ + auVar32._28_4_;
            auVar143 = vrcpps_avx(auVar278);
            fVar229 = auVar143._0_4_;
            fVar232 = auVar143._4_4_;
            auVar107._4_4_ = auVar278._4_4_ * fVar232;
            auVar107._0_4_ = auVar278._0_4_ * fVar229;
            fVar238 = auVar143._8_4_;
            auVar107._8_4_ = auVar278._8_4_ * fVar238;
            fVar240 = auVar143._12_4_;
            auVar107._12_4_ = auVar278._12_4_ * fVar240;
            fVar172 = auVar143._16_4_;
            auVar107._16_4_ = auVar278._16_4_ * fVar172;
            fVar307 = auVar143._20_4_;
            auVar107._20_4_ = auVar278._20_4_ * fVar307;
            fVar177 = auVar143._24_4_;
            auVar107._24_4_ = auVar278._24_4_ * fVar177;
            auVar107._28_4_ = auVar31._28_4_;
            auVar316._8_4_ = 0x3f800000;
            auVar316._0_8_ = 0x3f8000003f800000;
            auVar316._12_4_ = 0x3f800000;
            auVar316._16_4_ = 0x3f800000;
            auVar316._20_4_ = 0x3f800000;
            auVar316._24_4_ = 0x3f800000;
            auVar316._28_4_ = 0x3f800000;
            auVar143 = vsubps_avx(auVar316,auVar107);
            fVar229 = auVar143._0_4_ * fVar229 + fVar229;
            fVar232 = auVar143._4_4_ * fVar232 + fVar232;
            fVar238 = auVar143._8_4_ * fVar238 + fVar238;
            fVar240 = auVar143._12_4_ * fVar240 + fVar240;
            fVar172 = auVar143._16_4_ * fVar172 + fVar172;
            fVar307 = auVar143._20_4_ * fVar307 + fVar307;
            fVar177 = auVar143._24_4_ * fVar177 + fVar177;
            auVar108._4_4_ =
                 (fVar305 * auVar266._4_4_ + auVar148._4_4_ * fVar306 + fVar157 * auVar200._4_4_) *
                 fVar232;
            auVar108._0_4_ =
                 (fVar194 * auVar266._0_4_ + auVar148._0_4_ * fVar251 + fVar155 * auVar200._0_4_) *
                 fVar229;
            auVar108._8_4_ =
                 (fVar254 * auVar266._8_4_ + auVar148._8_4_ * fVar253 + fVar170 * auVar200._8_4_) *
                 fVar238;
            auVar108._12_4_ =
                 (fVar151 * auVar266._12_4_ + auVar148._12_4_ * fVar150 + fVar171 * auVar200._12_4_)
                 * fVar240;
            auVar108._16_4_ =
                 (fVar210 * auVar266._16_4_ + auVar148._16_4_ * fVar207 + fVar270 * auVar200._16_4_)
                 * fVar172;
            auVar108._20_4_ =
                 (fVar131 * auVar266._20_4_ + auVar148._20_4_ * fVar241 + fVar279 * auVar200._20_4_)
                 * fVar307;
            auVar108._24_4_ =
                 (fVar230 * auVar266._24_4_ + auVar148._24_4_ * fVar231 + fVar174 * auVar200._24_4_)
                 * fVar177;
            auVar108._28_4_ = auVar30._28_4_ + auVar200._28_4_;
            fVar243 = (ray->super_RayK<1>).tfar;
            auVar204._4_4_ = fVar243;
            auVar204._0_4_ = fVar243;
            auVar204._8_4_ = fVar243;
            auVar204._12_4_ = fVar243;
            auVar204._16_4_ = fVar243;
            auVar204._20_4_ = fVar243;
            auVar204._24_4_ = fVar243;
            auVar204._28_4_ = fVar243;
            auVar32 = vcmpps_avx(_local_360,auVar108,2);
            auVar143 = vcmpps_avx(auVar108,auVar204,2);
            auVar143 = vandps_avx(auVar32,auVar143);
            auVar30 = auVar35 & auVar143;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) goto LAB_00f73536;
            auVar143 = vandps_avx(auVar35,auVar143);
            auVar30 = vcmpps_avx(auVar278,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar31 = auVar143 & auVar30;
            auVar205 = ZEXT3264(CONCAT824(local_4c0[1]._24_8_,
                                          CONCAT816(local_4c0[1]._16_8_,
                                                    CONCAT88(local_4c0[1]._8_8_,local_4c0[1]._0_8_))
                                         ));
            if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0x7f,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0xbf,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar31[0x1f] < '\0') {
              auVar143 = vandps_avx(auVar30,auVar143);
              auVar205 = ZEXT3264(auVar143);
              auVar109._4_4_ = fVar232 * local_580._4_4_;
              auVar109._0_4_ = fVar229 * local_580._0_4_;
              auVar109._8_4_ = fVar238 * local_580._8_4_;
              auVar109._12_4_ = fVar240 * local_580._12_4_;
              auVar109._16_4_ = fVar172 * local_580._16_4_;
              auVar109._20_4_ = fVar307 * local_580._20_4_;
              auVar109._24_4_ = fVar177 * local_580._24_4_;
              auVar109._28_4_ = auVar32._28_4_;
              auVar110._4_4_ = auVar146._4_4_ * fVar232;
              auVar110._0_4_ = auVar146._0_4_ * fVar229;
              auVar110._8_4_ = auVar146._8_4_ * fVar238;
              auVar110._12_4_ = auVar146._12_4_ * fVar240;
              auVar110._16_4_ = auVar146._16_4_ * fVar172;
              auVar110._20_4_ = auVar146._20_4_ * fVar307;
              auVar110._24_4_ = auVar146._24_4_ * fVar177;
              auVar110._28_4_ = auVar146._28_4_;
              auVar250._8_4_ = 0x3f800000;
              auVar250._0_8_ = 0x3f8000003f800000;
              auVar250._12_4_ = 0x3f800000;
              auVar250._16_4_ = 0x3f800000;
              auVar250._20_4_ = 0x3f800000;
              auVar250._24_4_ = 0x3f800000;
              auVar250._28_4_ = 0x3f800000;
              auVar143 = vsubps_avx(auVar250,auVar109);
              _local_c0 = vblendvps_avx(auVar143,auVar109,auVar286);
              auVar143 = vsubps_avx(auVar250,auVar110);
              _local_140 = vblendvps_avx(auVar143,auVar110,auVar286);
              auVar149 = ZEXT3264(_local_140);
              local_400 = auVar108;
            }
          }
          auVar143 = auVar205._0_32_;
          auVar169 = ZEXT3264(_local_7c0);
          if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar143 >> 0x7f,0) != '\0') ||
                (auVar205 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar143 >> 0xbf,0) != '\0') ||
              (auVar205 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar205[0x1f] < '\0') {
            auVar32 = vsubps_avx(auVar267,_local_7c0);
            local_7c0._0_4_ = (float)local_7c0._0_4_ + auVar32._0_4_ * (float)local_c0._0_4_;
            local_7c0._4_4_ = (float)local_7c0._4_4_ + auVar32._4_4_ * (float)local_c0._4_4_;
            fStack_7b8 = fStack_7b8 + auVar32._8_4_ * fStack_b8;
            fStack_7b4 = fStack_7b4 + auVar32._12_4_ * fStack_b4;
            fStack_7b0 = fStack_7b0 + auVar32._16_4_ * fStack_b0;
            fStack_7ac = fStack_7ac + auVar32._20_4_ * fStack_ac;
            fStack_7a8 = fStack_7a8 + auVar32._24_4_ * fStack_a8;
            fStack_7a4 = fStack_7a4 + auVar32._28_4_;
            fVar243 = local_778->depth_scale;
            auVar169 = ZEXT3264(CONCAT428(fVar243,CONCAT424(fVar243,CONCAT420(fVar243,CONCAT416(
                                                  fVar243,CONCAT412(fVar243,CONCAT48(fVar243,
                                                  CONCAT44(fVar243,fVar243))))))));
            auVar111._4_4_ = ((float)local_7c0._4_4_ + (float)local_7c0._4_4_) * fVar243;
            auVar111._0_4_ = ((float)local_7c0._0_4_ + (float)local_7c0._0_4_) * fVar243;
            auVar111._8_4_ = (fStack_7b8 + fStack_7b8) * fVar243;
            auVar111._12_4_ = (fStack_7b4 + fStack_7b4) * fVar243;
            auVar111._16_4_ = (fStack_7b0 + fStack_7b0) * fVar243;
            auVar111._20_4_ = (fStack_7ac + fStack_7ac) * fVar243;
            auVar111._24_4_ = (fStack_7a8 + fStack_7a8) * fVar243;
            auVar111._28_4_ = fStack_7a4 + fStack_7a4;
            auVar32 = vcmpps_avx(local_400,auVar111,6);
            auVar149 = ZEXT3264(auVar32);
            auVar30 = auVar143 & auVar32;
            fVar271 = (float)local_6c0._0_4_;
            fVar280 = (float)local_6c0._4_4_;
            fVar281 = fStack_6b8;
            fVar283 = fStack_6b4;
            fVar229 = fStack_6b0;
            fVar232 = fStack_6ac;
            fVar238 = fStack_6a8;
            fVar240 = fStack_6a4;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) goto LAB_00f732b0;
            local_260._0_4_ = (float)local_140._0_4_ + (float)local_140._0_4_ + -1.0;
            local_260._4_4_ = (float)local_140._4_4_ + (float)local_140._4_4_ + -1.0;
            fStack_258 = fStack_138 + fStack_138 + -1.0;
            fStack_254 = fStack_134 + fStack_134 + -1.0;
            fStack_250 = fStack_130 + fStack_130 + -1.0;
            fStack_24c = fStack_12c + fStack_12c + -1.0;
            fStack_248 = fStack_128 + fStack_128 + -1.0;
            fStack_244 = fStack_124 + fStack_124 + -1.0;
            local_280 = _local_c0;
            local_240 = local_400;
            local_21c = uVar15;
            local_210 = local_790;
            uStack_208 = uStack_788;
            local_200 = local_700;
            uStack_1f8 = uStack_6f8;
            local_1f0 = local_710;
            uStack_1e8 = uStack_708;
            auVar169 = ZEXT1664(_local_6f0);
            local_1e0 = _local_6f0;
            pGVar129 = (context->scene->geometries).items[local_7d0].ptr;
            _local_140 = _local_260;
            if ((pGVar129->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar143 = vandps_avx(auVar32,auVar143);
              local_4c0[0] = auVar143;
              auVar185._0_4_ = (float)(int)local_220;
              auVar185._4_8_ = SUB128(ZEXT812(0),4);
              auVar185._12_4_ = 0;
              auVar236 = vshufps_avx(auVar185,auVar185,0);
              local_1a0[0] = (auVar236._0_4_ + (float)local_c0._0_4_ + 0.0) * (float)local_e0._0_4_;
              local_1a0[1] = (auVar236._4_4_ + (float)local_c0._4_4_ + 1.0) * (float)local_e0._4_4_;
              local_1a0[2] = (auVar236._8_4_ + fStack_b8 + 2.0) * fStack_d8;
              local_1a0[3] = (auVar236._12_4_ + fStack_b4 + 3.0) * fStack_d4;
              fStack_190 = (auVar236._0_4_ + fStack_b0 + 4.0) * fStack_d0;
              fStack_18c = (auVar236._4_4_ + fStack_ac + 5.0) * fStack_cc;
              fStack_188 = (auVar236._8_4_ + fStack_a8 + 6.0) * fStack_c8;
              fStack_184 = auVar236._12_4_ + fStack_a4 + 7.0;
              local_180 = _local_260;
              local_160 = local_400;
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar166,local_400,auVar143);
              auVar30 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar30 = vminps_avx(auVar32,auVar30);
              auVar31 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar31 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar32 = vcmpps_avx(auVar32,auVar30,0);
              auVar30 = auVar143 & auVar32;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar143 = vandps_avx(auVar32,auVar143);
              }
              uVar123 = vmovmskps_avx(auVar143);
              uVar125 = 0;
              if (uVar123 != 0) {
                for (; (uVar123 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                }
              }
              uVar124 = (ulong)uVar125;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar129->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                _local_7c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_6e0._0_8_ = pGVar129;
                do {
                  local_664 = local_1a0[uVar124];
                  local_660 = *(undefined4 *)(local_180 + uVar124 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar124 * 4);
                  local_770.context = context->user;
                  fVar243 = 1.0 - local_664;
                  fVar258 = local_664 * fVar243 + local_664 * fVar243;
                  auVar236 = ZEXT416((uint)(local_664 * local_664 * 3.0));
                  auVar236 = vshufps_avx(auVar236,auVar236,0);
                  auVar186 = ZEXT416((uint)((fVar258 - local_664 * local_664) * 3.0));
                  auVar186 = vshufps_avx(auVar186,auVar186,0);
                  auVar222 = ZEXT416((uint)((fVar243 * fVar243 - fVar258) * 3.0));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar198 = ZEXT416((uint)(fVar243 * fVar243 * -3.0));
                  auVar198 = vshufps_avx(auVar198,auVar198,0);
                  auVar199._0_4_ = auVar198._0_4_ * (float)local_790._0_4_;
                  auVar199._4_4_ = auVar198._4_4_ * (float)local_790._4_4_;
                  auVar199._8_4_ = auVar198._8_4_ * (float)uStack_788;
                  auVar199._12_4_ = auVar198._12_4_ * uStack_788._4_4_;
                  auVar205 = ZEXT1664(auVar199);
                  auVar188._0_4_ =
                       auVar199._0_4_ +
                       auVar222._0_4_ * (float)local_700._0_4_ +
                       auVar236._0_4_ * (float)local_6f0._0_4_ +
                       auVar186._0_4_ * (float)local_710._0_4_;
                  auVar188._4_4_ =
                       auVar199._4_4_ +
                       auVar222._4_4_ * (float)local_700._4_4_ +
                       auVar236._4_4_ * (float)local_6f0._4_4_ +
                       auVar186._4_4_ * (float)local_710._4_4_;
                  auVar188._8_4_ =
                       auVar199._8_4_ +
                       auVar222._8_4_ * (float)uStack_6f8 +
                       auVar236._8_4_ * (float)uStack_6e8 + auVar186._8_4_ * (float)uStack_708;
                  auVar188._12_4_ =
                       auVar199._12_4_ +
                       auVar222._12_4_ * uStack_6f8._4_4_ +
                       auVar236._12_4_ * uStack_6e8._4_4_ + auVar186._12_4_ * uStack_708._4_4_;
                  local_670 = vmovlps_avx(auVar188);
                  local_668 = vextractps_avx(auVar188,2);
                  local_65c = (int)local_7c8;
                  local_658 = (int)local_7d0;
                  local_654 = (local_770.context)->instID[0];
                  local_650 = (local_770.context)->instPrimID[0];
                  local_7d4 = -1;
                  local_770.valid = &local_7d4;
                  local_770.geometryUserPtr = pGVar129->userPtr;
                  local_770.ray = (RTCRayN *)ray;
                  local_770.hit = (RTCHitN *)&local_670;
                  local_770.N = 1;
                  if (pGVar129->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f736f5:
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar129->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar205 = ZEXT1664(auVar205._0_16_);
                      (*p_Var19)(&local_770);
                      pGVar129 = (Geometry *)local_6e0._0_8_;
                      if (*local_770.valid == 0) goto LAB_00f73795;
                    }
                    (((Vec3f *)((long)local_770.ray + 0x30))->field_0).components[0] =
                         *(float *)local_770.hit;
                    (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_770.hit + 4);
                    (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_770.hit + 8);
                    *(float *)((long)local_770.ray + 0x3c) = *(float *)(local_770.hit + 0xc);
                    *(float *)((long)local_770.ray + 0x40) = *(float *)(local_770.hit + 0x10);
                    *(float *)((long)local_770.ray + 0x44) = *(float *)(local_770.hit + 0x14);
                    *(float *)((long)local_770.ray + 0x48) = *(float *)(local_770.hit + 0x18);
                    *(float *)((long)local_770.ray + 0x4c) = *(float *)(local_770.hit + 0x1c);
                    *(float *)((long)local_770.ray + 0x50) = *(float *)(local_770.hit + 0x20);
                  }
                  else {
                    auVar205 = ZEXT1664(auVar199);
                    (*pGVar129->intersectionFilterN)(&local_770);
                    pGVar129 = (Geometry *)local_6e0._0_8_;
                    if (*local_770.valid != 0) goto LAB_00f736f5;
LAB_00f73795:
                    (ray->super_RayK<1>).tfar = (float)local_7c0._0_4_;
                    pGVar129 = (Geometry *)local_6e0._0_8_;
                  }
                  *(undefined4 *)(local_4c0[0] + uVar124 * 4) = 0;
                  auVar30 = local_4c0[0];
                  fVar258 = (ray->super_RayK<1>).tfar;
                  auVar147._4_4_ = fVar258;
                  auVar147._0_4_ = fVar258;
                  auVar147._8_4_ = fVar258;
                  auVar147._12_4_ = fVar258;
                  auVar147._16_4_ = fVar258;
                  auVar147._20_4_ = fVar258;
                  auVar147._24_4_ = fVar258;
                  auVar147._28_4_ = fVar258;
                  auVar32 = vcmpps_avx(local_400,auVar147,2);
                  auVar169 = ZEXT3264(auVar32);
                  auVar143 = vandps_avx(auVar32,local_4c0[0]);
                  auVar149 = ZEXT3264(auVar143);
                  local_4c0[0] = auVar143;
                  auVar30 = auVar30 & auVar32;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar30 >> 0x7f,0) == '\0') &&
                        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar30 >> 0xbf,0) == '\0') &&
                      (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar30[0x1f]) goto LAB_00f73837;
                  auVar167._8_4_ = 0x7f800000;
                  auVar167._0_8_ = 0x7f8000007f800000;
                  auVar167._12_4_ = 0x7f800000;
                  auVar167._16_4_ = 0x7f800000;
                  auVar167._20_4_ = 0x7f800000;
                  auVar167._24_4_ = 0x7f800000;
                  auVar167._28_4_ = 0x7f800000;
                  auVar32 = vblendvps_avx(auVar167,local_400,auVar143);
                  auVar30 = vshufps_avx(auVar32,auVar32,0xb1);
                  auVar30 = vminps_avx(auVar32,auVar30);
                  auVar31 = vshufpd_avx(auVar30,auVar30,5);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar32 = vcmpps_avx(auVar32,auVar30,0);
                  auVar30 = auVar143 & auVar32;
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar30 >> 0x7f,0) != '\0') ||
                        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar30 >> 0xbf,0) != '\0') ||
                      (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar30[0x1f] < '\0') {
                    auVar143 = vandps_avx(auVar32,auVar143);
                  }
                  _local_7c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar123 = vmovmskps_avx(auVar143);
                  uVar125 = 0;
                  if (uVar123 != 0) {
                    for (; (uVar123 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                    }
                  }
                  uVar124 = (ulong)uVar125;
                } while( true );
              }
              fVar258 = local_1a0[uVar124];
              auVar149 = ZEXT464((uint)fVar258);
              fVar243 = *(float *)(local_180 + uVar124 * 4);
              auVar169 = ZEXT464((uint)fVar243);
              fVar317 = 1.0 - fVar258;
              fVar251 = fVar258 * fVar317 + fVar258 * fVar317;
              auVar236 = ZEXT416((uint)(fVar258 * fVar258 * 3.0));
              auVar236 = vshufps_avx(auVar236,auVar236,0);
              auVar186 = ZEXT416((uint)((fVar251 - fVar258 * fVar258) * 3.0));
              auVar186 = vshufps_avx(auVar186,auVar186,0);
              auVar222 = ZEXT416((uint)((fVar317 * fVar317 - fVar251) * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar198 = ZEXT416((uint)(fVar317 * fVar317 * -3.0));
              auVar198 = vshufps_avx(auVar198,auVar198,0);
              auVar187._0_4_ =
                   auVar198._0_4_ * (float)local_790._0_4_ +
                   auVar222._0_4_ * (float)local_700._0_4_ +
                   auVar236._0_4_ * (float)local_6f0._0_4_ + auVar186._0_4_ * (float)local_710._0_4_
              ;
              auVar187._4_4_ =
                   auVar198._4_4_ * (float)local_790._4_4_ +
                   auVar222._4_4_ * (float)local_700._4_4_ +
                   auVar236._4_4_ * (float)local_6f0._4_4_ + auVar186._4_4_ * (float)local_710._4_4_
              ;
              auVar187._8_4_ =
                   auVar198._8_4_ * (float)uStack_788 +
                   auVar222._8_4_ * (float)uStack_6f8 +
                   auVar236._8_4_ * (float)uStack_6e8 + auVar186._8_4_ * (float)uStack_708;
              auVar187._12_4_ =
                   auVar198._12_4_ * uStack_788._4_4_ +
                   auVar222._12_4_ * uStack_6f8._4_4_ +
                   auVar236._12_4_ * uStack_6e8._4_4_ + auVar186._12_4_ * uStack_708._4_4_;
              auVar205 = ZEXT464((uint)*(float *)(local_160 + uVar124 * 4));
              (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar124 * 4);
              uVar12 = vmovlps_avx(auVar187);
              *(undefined8 *)&(ray->Ng).field_0 = uVar12;
              fVar251 = (float)vextractps_avx(auVar187,2);
              (ray->Ng).field_0.field_0.z = fVar251;
              ray->u = fVar258;
              ray->v = fVar243;
              ray->primID = (uint)local_7c8;
              ray->geomID = (uint)local_7d0;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_780;
            }
          }
          goto LAB_00f7325d;
        }
        goto LAB_00f732b0;
      }
LAB_00f72904:
      fVar258 = (ray->super_RayK<1>).tfar;
      auVar136._4_4_ = fVar258;
      auVar136._0_4_ = fVar258;
      auVar136._8_4_ = fVar258;
      auVar136._12_4_ = fVar258;
      auVar236 = vcmpps_avx(local_290,auVar136,2);
      uVar125 = vmovmskps_avx(auVar236);
      uVar121 = uVar121 & uVar121 + 0xf & uVar125;
    } while (uVar121 != 0);
  }
  return;
LAB_00f73837:
  prim = local_780;
LAB_00f7325d:
  fVar258 = (float)local_600._0_4_;
  fVar317 = (float)local_600._4_4_;
  fVar209 = fStack_5f8;
  fVar227 = fStack_5f4;
  fVar242 = fStack_5f0;
  fVar318 = fStack_5ec;
  fVar191 = fStack_5e8;
  fVar208 = fStack_5e4;
  fVar268 = (float)local_5c0._0_4_;
  fVar319 = (float)local_5c0._4_4_;
  fVar173 = fStack_5b8;
  fVar211 = fStack_5b4;
  fVar269 = fStack_5b0;
  fVar175 = fStack_5ac;
  fVar320 = fStack_5a8;
  fVar321 = (float)local_740._0_4_;
  fVar326 = (float)local_740._4_4_;
  fVar328 = fStack_738;
  fVar330 = fStack_734;
  fVar206 = fStack_730;
  fVar212 = fStack_72c;
  fVar217 = fStack_728;
  fVar228 = fStack_724;
  fVar271 = (float)local_6c0._0_4_;
  fVar280 = (float)local_6c0._4_4_;
  fVar281 = fStack_6b8;
  fVar283 = fStack_6b4;
  fVar229 = fStack_6b0;
  fVar232 = fStack_6ac;
  fVar238 = fStack_6a8;
  fVar240 = fStack_6a4;
LAB_00f732b0:
  lVar128 = lVar128 + 8;
  fVar233 = (float)local_6a0._0_4_;
  fVar239 = (float)local_6a0._4_4_;
  fVar241 = fStack_698;
  fVar131 = fStack_694;
  fVar243 = fStack_690;
  fVar251 = fStack_68c;
  fVar194 = fStack_688;
  if ((int)uVar15 <= (int)lVar128) goto LAB_00f72904;
  goto LAB_00f729c9;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }